

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  bool bVar81;
  bool bVar82;
  bool bVar83;
  bool bVar84;
  bool bVar85;
  bool bVar86;
  bool bVar87;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  uint uVar95;
  ulong uVar96;
  ulong uVar97;
  uint uVar98;
  long lVar99;
  ulong uVar100;
  bool bVar101;
  float fVar102;
  float fVar128;
  float fVar130;
  __m128 a;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar137;
  float fVar174;
  float fVar175;
  undefined1 auVar138 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar139 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar176;
  undefined1 auVar140 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar177;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar212;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [28];
  float fVar210;
  float fVar211;
  float fVar213;
  float fVar214;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar215;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar216;
  float fVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar231;
  float fVar233;
  float fVar235;
  float fVar237;
  float fVar239;
  float fVar241;
  undefined1 auVar226 [32];
  float fVar232;
  float fVar234;
  float fVar236;
  float fVar238;
  float fVar240;
  float fVar242;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar230 [32];
  float fVar243;
  float fVar263;
  float fVar264;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar249 [32];
  float fVar265;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar269;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar270;
  undefined1 auVar273 [16];
  float fVar283;
  float fVar284;
  float fVar290;
  float fVar294;
  float fVar298;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar291;
  float fVar292;
  float fVar295;
  float fVar296;
  float fVar299;
  float fVar300;
  float fVar302;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar285;
  float fVar289;
  float fVar293;
  float fVar297;
  float fVar301;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [64];
  float fVar303;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [64];
  float fVar319;
  float fVar320;
  float fVar329;
  float fVar331;
  float fVar335;
  float fVar337;
  float fVar339;
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  float fVar330;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar336;
  float fVar338;
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar349;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  float fVar350;
  float fVar351;
  undefined1 auVar347 [32];
  undefined1 auVar348 [64];
  undefined1 auVar352 [16];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [64];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar356;
  float fVar363;
  float fVar364;
  float fVar366;
  float fVar367;
  float fVar368;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  float fVar365;
  float fVar369;
  undefined1 auVar361 [32];
  undefined1 auVar362 [64];
  float fVar370;
  float fVar371;
  float fVar376;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float in_register_0000151c;
  undefined1 auVar372 [32];
  float fVar383;
  undefined1 auVar373 [32];
  float fVar377;
  undefined1 auVar374 [32];
  undefined1 auVar375 [64];
  float fVar384;
  float fVar385;
  undefined1 auVar386 [16];
  float fVar389;
  float fVar391;
  float fVar395;
  float fVar397;
  float fVar399;
  undefined1 auVar387 [32];
  float fVar390;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar396;
  float fVar398;
  float fVar400;
  undefined1 auVar388 [32];
  undefined1 auVar401 [16];
  float in_register_0000159c;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  float in_register_000015dc;
  undefined1 auVar406 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_acc;
  ulong local_ac8;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  ulong local_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [16];
  undefined8 local_8f0;
  float local_8e8;
  float local_8e4;
  undefined4 local_8e0;
  uint local_8dc;
  uint local_8d8;
  uint local_8d4;
  uint local_8d0;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  Primitive *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar12 = prim[1];
  uVar100 = (ulong)(byte)PVar12;
  lVar99 = uVar100 * 5;
  fVar196 = *(float *)(prim + uVar100 * 0x19 + 0x12);
  auVar179 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar100 * 0x19 + 6));
  auVar244._0_4_ = fVar196 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar244._4_4_ = fVar196 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar244._8_4_ = fVar196 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar244._12_4_ = fVar196 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 4 + 6)));
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 4 + 10)));
  auVar138._0_4_ = fVar196 * auVar179._0_4_;
  auVar138._4_4_ = fVar196 * auVar179._4_4_;
  auVar138._8_4_ = fVar196 * auVar179._8_4_;
  auVar138._12_4_ = fVar196 * auVar179._12_4_;
  auVar121._16_16_ = auVar107;
  auVar121._0_16_ = auVar144;
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar99 + 10)));
  auVar188._16_16_ = auVar107;
  auVar188._0_16_ = auVar144;
  auVar157 = vcvtdq2ps_avx(auVar188);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 6 + 6)));
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 6 + 10)));
  auVar203._16_16_ = auVar107;
  auVar203._0_16_ = auVar144;
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0xb + 6)));
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0xb + 10)));
  auVar16 = vcvtdq2ps_avx(auVar203);
  auVar204._16_16_ = auVar107;
  auVar204._0_16_ = auVar144;
  auVar17 = vcvtdq2ps_avx(auVar204);
  uVar96 = (ulong)((uint)(byte)PVar12 * 0xc);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + 6)));
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + 10)));
  auVar274._16_16_ = auVar107;
  auVar274._0_16_ = auVar144;
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + uVar100 + 6)));
  auVar158 = vcvtdq2ps_avx(auVar274);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + uVar100 + 10)));
  auVar304._16_16_ = auVar107;
  auVar304._0_16_ = auVar144;
  lVar15 = uVar100 * 9;
  uVar96 = (ulong)(uint)((int)lVar15 * 2);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + 6)));
  auVar160 = vcvtdq2ps_avx(auVar304);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + 10)));
  auVar305._16_16_ = auVar107;
  auVar305._0_16_ = auVar144;
  auVar325 = vcvtdq2ps_avx(auVar305);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + uVar100 + 6)));
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + uVar100 + 10)));
  auVar345._16_16_ = auVar107;
  auVar345._0_16_ = auVar144;
  uVar96 = (ulong)(uint)((int)lVar99 << 2);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + 6)));
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + 10)));
  auVar18 = vcvtdq2ps_avx(auVar345);
  auVar353._16_16_ = auVar107;
  auVar353._0_16_ = auVar144;
  auVar19 = vcvtdq2ps_avx(auVar353);
  auVar144 = vshufps_avx(auVar244,auVar244,0);
  auVar107 = vshufps_avx(auVar244,auVar244,0x55);
  auVar179 = vshufps_avx(auVar244,auVar244,0xaa);
  fVar196 = auVar179._0_4_;
  fVar210 = auVar179._4_4_;
  fVar211 = auVar179._8_4_;
  fVar212 = auVar179._12_4_;
  fVar213 = auVar107._0_4_;
  fVar214 = auVar107._4_4_;
  fVar215 = auVar107._8_4_;
  fVar216 = auVar107._12_4_;
  fVar231 = auVar144._0_4_;
  fVar233 = auVar144._4_4_;
  fVar235 = auVar144._8_4_;
  fVar237 = auVar144._12_4_;
  auVar372._0_4_ = fVar231 * auVar121._0_4_ + fVar213 * auVar157._0_4_ + fVar196 * auVar16._0_4_;
  auVar372._4_4_ = fVar233 * auVar121._4_4_ + fVar214 * auVar157._4_4_ + fVar210 * auVar16._4_4_;
  auVar372._8_4_ = fVar235 * auVar121._8_4_ + fVar215 * auVar157._8_4_ + fVar211 * auVar16._8_4_;
  auVar372._12_4_ = fVar237 * auVar121._12_4_ + fVar216 * auVar157._12_4_ + fVar212 * auVar16._12_4_
  ;
  auVar372._16_4_ = fVar231 * auVar121._16_4_ + fVar213 * auVar157._16_4_ + fVar196 * auVar16._16_4_
  ;
  auVar372._20_4_ = fVar233 * auVar121._20_4_ + fVar214 * auVar157._20_4_ + fVar210 * auVar16._20_4_
  ;
  auVar372._24_4_ = fVar235 * auVar121._24_4_ + fVar215 * auVar157._24_4_ + fVar211 * auVar16._24_4_
  ;
  auVar372._28_4_ = fVar216 + in_register_000015dc + in_register_0000151c;
  auVar359._0_4_ = fVar231 * auVar17._0_4_ + fVar213 * auVar158._0_4_ + auVar160._0_4_ * fVar196;
  auVar359._4_4_ = fVar233 * auVar17._4_4_ + fVar214 * auVar158._4_4_ + auVar160._4_4_ * fVar210;
  auVar359._8_4_ = fVar235 * auVar17._8_4_ + fVar215 * auVar158._8_4_ + auVar160._8_4_ * fVar211;
  auVar359._12_4_ = fVar237 * auVar17._12_4_ + fVar216 * auVar158._12_4_ + auVar160._12_4_ * fVar212
  ;
  auVar359._16_4_ = fVar231 * auVar17._16_4_ + fVar213 * auVar158._16_4_ + auVar160._16_4_ * fVar196
  ;
  auVar359._20_4_ = fVar233 * auVar17._20_4_ + fVar214 * auVar158._20_4_ + auVar160._20_4_ * fVar210
  ;
  auVar359._24_4_ = fVar235 * auVar17._24_4_ + fVar215 * auVar158._24_4_ + auVar160._24_4_ * fVar211
  ;
  auVar359._28_4_ = fVar216 + in_register_000015dc + in_register_0000159c;
  auVar249._0_4_ = fVar231 * auVar325._0_4_ + fVar213 * auVar18._0_4_ + auVar19._0_4_ * fVar196;
  auVar249._4_4_ = fVar233 * auVar325._4_4_ + fVar214 * auVar18._4_4_ + auVar19._4_4_ * fVar210;
  auVar249._8_4_ = fVar235 * auVar325._8_4_ + fVar215 * auVar18._8_4_ + auVar19._8_4_ * fVar211;
  auVar249._12_4_ = fVar237 * auVar325._12_4_ + fVar216 * auVar18._12_4_ + auVar19._12_4_ * fVar212;
  auVar249._16_4_ = fVar231 * auVar325._16_4_ + fVar213 * auVar18._16_4_ + auVar19._16_4_ * fVar196;
  auVar249._20_4_ = fVar233 * auVar325._20_4_ + fVar214 * auVar18._20_4_ + auVar19._20_4_ * fVar210;
  auVar249._24_4_ = fVar235 * auVar325._24_4_ + fVar215 * auVar18._24_4_ + auVar19._24_4_ * fVar211;
  auVar249._28_4_ = fVar237 + fVar216 + fVar212;
  auVar144 = vshufps_avx(auVar138,auVar138,0);
  auVar107 = vshufps_avx(auVar138,auVar138,0x55);
  auVar179 = vshufps_avx(auVar138,auVar138,0xaa);
  fVar210 = auVar179._0_4_;
  fVar211 = auVar179._4_4_;
  fVar212 = auVar179._8_4_;
  fVar213 = auVar179._12_4_;
  fVar233 = auVar107._0_4_;
  fVar235 = auVar107._4_4_;
  fVar237 = auVar107._8_4_;
  fVar239 = auVar107._12_4_;
  fVar214 = auVar144._0_4_;
  fVar215 = auVar144._4_4_;
  fVar216 = auVar144._8_4_;
  fVar231 = auVar144._12_4_;
  fVar196 = auVar121._28_4_;
  auVar275._0_4_ = fVar214 * auVar121._0_4_ + fVar233 * auVar157._0_4_ + fVar210 * auVar16._0_4_;
  auVar275._4_4_ = fVar215 * auVar121._4_4_ + fVar235 * auVar157._4_4_ + fVar211 * auVar16._4_4_;
  auVar275._8_4_ = fVar216 * auVar121._8_4_ + fVar237 * auVar157._8_4_ + fVar212 * auVar16._8_4_;
  auVar275._12_4_ = fVar231 * auVar121._12_4_ + fVar239 * auVar157._12_4_ + fVar213 * auVar16._12_4_
  ;
  auVar275._16_4_ = fVar214 * auVar121._16_4_ + fVar233 * auVar157._16_4_ + fVar210 * auVar16._16_4_
  ;
  auVar275._20_4_ = fVar215 * auVar121._20_4_ + fVar235 * auVar157._20_4_ + fVar211 * auVar16._20_4_
  ;
  auVar275._24_4_ = fVar216 * auVar121._24_4_ + fVar237 * auVar157._24_4_ + fVar212 * auVar16._24_4_
  ;
  auVar275._28_4_ = fVar196 + auVar157._28_4_ + auVar16._28_4_;
  auVar152._0_4_ = fVar214 * auVar17._0_4_ + auVar160._0_4_ * fVar210 + fVar233 * auVar158._0_4_;
  auVar152._4_4_ = fVar215 * auVar17._4_4_ + auVar160._4_4_ * fVar211 + fVar235 * auVar158._4_4_;
  auVar152._8_4_ = fVar216 * auVar17._8_4_ + auVar160._8_4_ * fVar212 + fVar237 * auVar158._8_4_;
  auVar152._12_4_ = fVar231 * auVar17._12_4_ + auVar160._12_4_ * fVar213 + fVar239 * auVar158._12_4_
  ;
  auVar152._16_4_ = fVar214 * auVar17._16_4_ + auVar160._16_4_ * fVar210 + fVar233 * auVar158._16_4_
  ;
  auVar152._20_4_ = fVar215 * auVar17._20_4_ + auVar160._20_4_ * fVar211 + fVar235 * auVar158._20_4_
  ;
  auVar152._24_4_ = fVar216 * auVar17._24_4_ + auVar160._24_4_ * fVar212 + fVar237 * auVar158._24_4_
  ;
  auVar152._28_4_ = fVar196 + auVar160._28_4_ + auVar16._28_4_;
  auVar306._8_4_ = 0x7fffffff;
  auVar306._0_8_ = 0x7fffffff7fffffff;
  auVar306._12_4_ = 0x7fffffff;
  auVar306._16_4_ = 0x7fffffff;
  auVar306._20_4_ = 0x7fffffff;
  auVar306._24_4_ = 0x7fffffff;
  auVar306._28_4_ = 0x7fffffff;
  auVar346._8_4_ = 0x219392ef;
  auVar346._0_8_ = 0x219392ef219392ef;
  auVar346._12_4_ = 0x219392ef;
  auVar346._16_4_ = 0x219392ef;
  auVar346._20_4_ = 0x219392ef;
  auVar346._24_4_ = 0x219392ef;
  auVar346._28_4_ = 0x219392ef;
  auVar121 = vandps_avx(auVar372,auVar306);
  auVar121 = vcmpps_avx(auVar121,auVar346,1);
  auVar157 = vblendvps_avx(auVar372,auVar346,auVar121);
  auVar121 = vandps_avx(auVar359,auVar306);
  auVar121 = vcmpps_avx(auVar121,auVar346,1);
  auVar16 = vblendvps_avx(auVar359,auVar346,auVar121);
  auVar121 = vandps_avx(auVar249,auVar306);
  auVar121 = vcmpps_avx(auVar121,auVar346,1);
  auVar121 = vblendvps_avx(auVar249,auVar346,auVar121);
  auVar189._0_4_ = fVar233 * auVar18._0_4_ + auVar19._0_4_ * fVar210 + fVar214 * auVar325._0_4_;
  auVar189._4_4_ = fVar235 * auVar18._4_4_ + auVar19._4_4_ * fVar211 + fVar215 * auVar325._4_4_;
  auVar189._8_4_ = fVar237 * auVar18._8_4_ + auVar19._8_4_ * fVar212 + fVar216 * auVar325._8_4_;
  auVar189._12_4_ = fVar239 * auVar18._12_4_ + auVar19._12_4_ * fVar213 + fVar231 * auVar325._12_4_;
  auVar189._16_4_ = fVar233 * auVar18._16_4_ + auVar19._16_4_ * fVar210 + fVar214 * auVar325._16_4_;
  auVar189._20_4_ = fVar235 * auVar18._20_4_ + auVar19._20_4_ * fVar211 + fVar215 * auVar325._20_4_;
  auVar189._24_4_ = fVar237 * auVar18._24_4_ + auVar19._24_4_ * fVar212 + fVar216 * auVar325._24_4_;
  auVar189._28_4_ = auVar158._28_4_ + fVar213 + fVar196;
  auVar17 = vrcpps_avx(auVar157);
  fVar196 = auVar17._0_4_;
  fVar210 = auVar17._4_4_;
  auVar158._4_4_ = auVar157._4_4_ * fVar210;
  auVar158._0_4_ = auVar157._0_4_ * fVar196;
  fVar211 = auVar17._8_4_;
  auVar158._8_4_ = auVar157._8_4_ * fVar211;
  fVar212 = auVar17._12_4_;
  auVar158._12_4_ = auVar157._12_4_ * fVar212;
  fVar213 = auVar17._16_4_;
  auVar158._16_4_ = auVar157._16_4_ * fVar213;
  fVar214 = auVar17._20_4_;
  auVar158._20_4_ = auVar157._20_4_ * fVar214;
  fVar215 = auVar17._24_4_;
  auVar158._24_4_ = auVar157._24_4_ * fVar215;
  auVar158._28_4_ = auVar157._28_4_;
  auVar323._8_4_ = 0x3f800000;
  auVar323._0_8_ = &DAT_3f8000003f800000;
  auVar323._12_4_ = 0x3f800000;
  auVar323._16_4_ = 0x3f800000;
  auVar323._20_4_ = 0x3f800000;
  auVar323._24_4_ = 0x3f800000;
  auVar323._28_4_ = 0x3f800000;
  auVar158 = vsubps_avx(auVar323,auVar158);
  auVar157 = vrcpps_avx(auVar16);
  fVar196 = fVar196 + fVar196 * auVar158._0_4_;
  fVar210 = fVar210 + fVar210 * auVar158._4_4_;
  fVar211 = fVar211 + fVar211 * auVar158._8_4_;
  fVar212 = fVar212 + fVar212 * auVar158._12_4_;
  fVar213 = fVar213 + fVar213 * auVar158._16_4_;
  fVar214 = fVar214 + fVar214 * auVar158._20_4_;
  fVar215 = fVar215 + fVar215 * auVar158._24_4_;
  fVar243 = auVar157._0_4_;
  fVar263 = auVar157._4_4_;
  auVar160._4_4_ = fVar263 * auVar16._4_4_;
  auVar160._0_4_ = fVar243 * auVar16._0_4_;
  fVar264 = auVar157._8_4_;
  auVar160._8_4_ = fVar264 * auVar16._8_4_;
  fVar265 = auVar157._12_4_;
  auVar160._12_4_ = fVar265 * auVar16._12_4_;
  fVar266 = auVar157._16_4_;
  auVar160._16_4_ = fVar266 * auVar16._16_4_;
  fVar267 = auVar157._20_4_;
  auVar160._20_4_ = fVar267 * auVar16._20_4_;
  fVar268 = auVar157._24_4_;
  auVar160._24_4_ = fVar268 * auVar16._24_4_;
  auVar160._28_4_ = auVar17._28_4_;
  auVar157 = vsubps_avx(auVar323,auVar160);
  fVar243 = fVar243 + fVar243 * auVar157._0_4_;
  fVar263 = fVar263 + fVar263 * auVar157._4_4_;
  fVar264 = fVar264 + fVar264 * auVar157._8_4_;
  fVar265 = fVar265 + fVar265 * auVar157._12_4_;
  fVar266 = fVar266 + fVar266 * auVar157._16_4_;
  fVar267 = fVar267 + fVar267 * auVar157._20_4_;
  fVar268 = fVar268 + fVar268 * auVar157._24_4_;
  auVar157 = vrcpps_avx(auVar121);
  fVar216 = auVar157._0_4_;
  fVar231 = auVar157._4_4_;
  auVar325._4_4_ = fVar231 * auVar121._4_4_;
  auVar325._0_4_ = fVar216 * auVar121._0_4_;
  fVar233 = auVar157._8_4_;
  auVar325._8_4_ = fVar233 * auVar121._8_4_;
  fVar235 = auVar157._12_4_;
  auVar325._12_4_ = fVar235 * auVar121._12_4_;
  fVar237 = auVar157._16_4_;
  auVar325._16_4_ = fVar237 * auVar121._16_4_;
  fVar239 = auVar157._20_4_;
  auVar325._20_4_ = fVar239 * auVar121._20_4_;
  fVar241 = auVar157._24_4_;
  auVar325._24_4_ = fVar241 * auVar121._24_4_;
  auVar325._28_4_ = auVar16._28_4_;
  auVar121 = vsubps_avx(auVar323,auVar325);
  fVar216 = fVar216 + fVar216 * auVar121._0_4_;
  fVar231 = fVar231 + fVar231 * auVar121._4_4_;
  fVar233 = fVar233 + fVar233 * auVar121._8_4_;
  fVar235 = fVar235 + fVar235 * auVar121._12_4_;
  fVar237 = fVar237 + fVar237 * auVar121._16_4_;
  fVar239 = fVar239 + fVar239 * auVar121._20_4_;
  fVar241 = fVar241 + fVar241 * auVar121._24_4_;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar100 * 7 + 6);
  auVar144 = vpmovsxwd_avx(auVar144);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar100 * 7 + 0xe);
  auVar107 = vpmovsxwd_avx(auVar107);
  auVar115._16_16_ = auVar107;
  auVar115._0_16_ = auVar144;
  auVar121 = vcvtdq2ps_avx(auVar115);
  auVar121 = vsubps_avx(auVar121,auVar275);
  auVar103._0_4_ = fVar196 * auVar121._0_4_;
  auVar103._4_4_ = fVar210 * auVar121._4_4_;
  auVar103._8_4_ = fVar211 * auVar121._8_4_;
  auVar103._12_4_ = fVar212 * auVar121._12_4_;
  auVar16._16_4_ = fVar213 * auVar121._16_4_;
  auVar16._0_16_ = auVar103;
  auVar16._20_4_ = fVar214 * auVar121._20_4_;
  auVar16._24_4_ = fVar215 * auVar121._24_4_;
  auVar16._28_4_ = auVar121._28_4_;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + lVar15 + 6);
  auVar144 = vpmovsxwd_avx(auVar179);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + lVar15 + 0xe);
  auVar107 = vpmovsxwd_avx(auVar141);
  auVar307._16_16_ = auVar107;
  auVar307._0_16_ = auVar144;
  auVar121 = vcvtdq2ps_avx(auVar307);
  auVar121 = vsubps_avx(auVar121,auVar275);
  auVar197._0_4_ = fVar196 * auVar121._0_4_;
  auVar197._4_4_ = fVar210 * auVar121._4_4_;
  auVar197._8_4_ = fVar211 * auVar121._8_4_;
  auVar197._12_4_ = fVar212 * auVar121._12_4_;
  auVar18._16_4_ = fVar213 * auVar121._16_4_;
  auVar18._0_16_ = auVar197;
  auVar18._20_4_ = fVar214 * auVar121._20_4_;
  auVar18._24_4_ = fVar215 * auVar121._24_4_;
  auVar18._28_4_ = auVar17._28_4_ + auVar158._28_4_;
  lVar99 = (ulong)(byte)PVar12 * 0x10;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + lVar99 + 6);
  auVar144 = vpmovsxwd_avx(auVar106);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar99 + 0xe);
  auVar107 = vpmovsxwd_avx(auVar6);
  lVar99 = lVar99 + uVar100 * -2;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + lVar99 + 6);
  auVar179 = vpmovsxwd_avx(auVar149);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar99 + 0xe);
  auVar141 = vpmovsxwd_avx(auVar7);
  auVar276._16_16_ = auVar141;
  auVar276._0_16_ = auVar179;
  auVar121 = vcvtdq2ps_avx(auVar276);
  auVar121 = vsubps_avx(auVar121,auVar152);
  auVar271._0_4_ = fVar243 * auVar121._0_4_;
  auVar271._4_4_ = fVar263 * auVar121._4_4_;
  auVar271._8_4_ = fVar264 * auVar121._8_4_;
  auVar271._12_4_ = fVar265 * auVar121._12_4_;
  auVar157._16_4_ = fVar266 * auVar121._16_4_;
  auVar157._0_16_ = auVar271;
  auVar157._20_4_ = fVar267 * auVar121._20_4_;
  auVar157._24_4_ = fVar268 * auVar121._24_4_;
  auVar157._28_4_ = auVar121._28_4_;
  auVar308._16_16_ = auVar107;
  auVar308._0_16_ = auVar144;
  auVar121 = vcvtdq2ps_avx(auVar308);
  auVar121 = vsubps_avx(auVar121,auVar152);
  auVar139._0_4_ = fVar243 * auVar121._0_4_;
  auVar139._4_4_ = fVar263 * auVar121._4_4_;
  auVar139._8_4_ = fVar264 * auVar121._8_4_;
  auVar139._12_4_ = fVar265 * auVar121._12_4_;
  auVar17._16_4_ = fVar266 * auVar121._16_4_;
  auVar17._0_16_ = auVar139;
  auVar17._20_4_ = fVar267 * auVar121._20_4_;
  auVar17._24_4_ = fVar268 * auVar121._24_4_;
  auVar17._28_4_ = auVar121._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar96 + uVar100 + 6);
  auVar144 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar96 + uVar100 + 0xe);
  auVar107 = vpmovsxwd_avx(auVar9);
  auVar250._16_16_ = auVar107;
  auVar250._0_16_ = auVar144;
  auVar121 = vcvtdq2ps_avx(auVar250);
  auVar121 = vsubps_avx(auVar121,auVar189);
  auVar245._0_4_ = fVar216 * auVar121._0_4_;
  auVar245._4_4_ = fVar231 * auVar121._4_4_;
  auVar245._8_4_ = fVar233 * auVar121._8_4_;
  auVar245._12_4_ = fVar235 * auVar121._12_4_;
  auVar19._16_4_ = fVar237 * auVar121._16_4_;
  auVar19._0_16_ = auVar245;
  auVar19._20_4_ = fVar239 * auVar121._20_4_;
  auVar19._24_4_ = fVar241 * auVar121._24_4_;
  auVar19._28_4_ = auVar121._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar100 * 0x17 + 6);
  auVar144 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar100 * 0x17 + 0xe);
  auVar107 = vpmovsxwd_avx(auVar11);
  auVar309._16_16_ = auVar107;
  auVar309._0_16_ = auVar144;
  auVar121 = vcvtdq2ps_avx(auVar309);
  auVar121 = vsubps_avx(auVar121,auVar189);
  auVar178._0_4_ = fVar216 * auVar121._0_4_;
  auVar178._4_4_ = fVar231 * auVar121._4_4_;
  auVar178._8_4_ = fVar233 * auVar121._8_4_;
  auVar178._12_4_ = fVar235 * auVar121._12_4_;
  auVar28._16_4_ = fVar237 * auVar121._16_4_;
  auVar28._0_16_ = auVar178;
  auVar28._20_4_ = fVar239 * auVar121._20_4_;
  auVar28._24_4_ = fVar241 * auVar121._24_4_;
  auVar28._28_4_ = auVar121._28_4_;
  auVar144 = vpminsd_avx(auVar16._16_16_,auVar18._16_16_);
  auVar107 = vpminsd_avx(auVar103,auVar197);
  auVar324._16_16_ = auVar144;
  auVar324._0_16_ = auVar107;
  auVar106 = auVar157._16_16_;
  auVar355 = ZEXT1664(auVar106);
  auVar144 = vpminsd_avx(auVar106,auVar17._16_16_);
  auVar107 = vpminsd_avx(auVar271,auVar139);
  auVar360._16_16_ = auVar144;
  auVar360._0_16_ = auVar107;
  auVar121 = vmaxps_avx(auVar324,auVar360);
  auVar179 = auVar28._16_16_;
  auVar362 = ZEXT1664(auVar179);
  auVar141 = auVar19._16_16_;
  auVar375 = ZEXT1664(auVar141);
  auVar144 = vpminsd_avx(auVar141,auVar179);
  auVar107 = vpminsd_avx(auVar245,auVar178);
  auVar387._16_16_ = auVar144;
  auVar387._0_16_ = auVar107;
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar402._4_4_ = uVar1;
  auVar402._0_4_ = uVar1;
  auVar402._8_4_ = uVar1;
  auVar402._12_4_ = uVar1;
  auVar402._16_4_ = uVar1;
  auVar402._20_4_ = uVar1;
  auVar402._24_4_ = uVar1;
  auVar402._28_4_ = uVar1;
  auVar157 = vmaxps_avx(auVar387,auVar402);
  auVar121 = vmaxps_avx(auVar121,auVar157);
  local_2a0._4_4_ = auVar121._4_4_ * 0.99999964;
  local_2a0._0_4_ = auVar121._0_4_ * 0.99999964;
  local_2a0._8_4_ = auVar121._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar121._12_4_ * 0.99999964;
  local_2a0._16_4_ = auVar121._16_4_ * 0.99999964;
  local_2a0._20_4_ = auVar121._20_4_ * 0.99999964;
  local_2a0._24_4_ = auVar121._24_4_ * 0.99999964;
  local_2a0._28_4_ = auVar121._28_4_;
  auVar144 = vpmaxsd_avx(auVar16._16_16_,auVar18._16_16_);
  auVar107 = vpmaxsd_avx(auVar103,auVar197);
  auVar116._16_16_ = auVar144;
  auVar116._0_16_ = auVar107;
  auVar144 = vpmaxsd_avx(auVar106,auVar17._16_16_);
  auVar107 = vpmaxsd_avx(auVar271,auVar139);
  auVar153._16_16_ = auVar144;
  auVar153._0_16_ = auVar107;
  auVar121 = vminps_avx(auVar116,auVar153);
  auVar144 = vpmaxsd_avx(auVar141,auVar179);
  auVar107 = vpmaxsd_avx(auVar245,auVar178);
  fVar196 = (ray->super_RayK<1>).tfar;
  auVar205._4_4_ = fVar196;
  auVar205._0_4_ = fVar196;
  auVar205._8_4_ = fVar196;
  auVar205._12_4_ = fVar196;
  auVar205._16_4_ = fVar196;
  auVar205._20_4_ = fVar196;
  auVar205._24_4_ = fVar196;
  auVar205._28_4_ = fVar196;
  auVar154._16_16_ = auVar144;
  auVar154._0_16_ = auVar107;
  auVar157 = vminps_avx(auVar154,auVar205);
  auVar121 = vminps_avx(auVar121,auVar157);
  auVar29._4_4_ = auVar121._4_4_ * 1.0000004;
  auVar29._0_4_ = auVar121._0_4_ * 1.0000004;
  auVar29._8_4_ = auVar121._8_4_ * 1.0000004;
  auVar29._12_4_ = auVar121._12_4_ * 1.0000004;
  auVar29._16_4_ = auVar121._16_4_ * 1.0000004;
  auVar29._20_4_ = auVar121._20_4_ * 1.0000004;
  auVar29._24_4_ = auVar121._24_4_ * 1.0000004;
  auVar29._28_4_ = auVar121._28_4_;
  auVar121 = vcmpps_avx(local_2a0,auVar29,2);
  auVar144 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar155._16_16_ = auVar144;
  auVar155._0_16_ = auVar144;
  auVar157 = vcvtdq2ps_avx(auVar155);
  auVar157 = vcmpps_avx(_DAT_02020f40,auVar157,1);
  auVar121 = vandps_avx(auVar121,auVar157);
  uVar95 = vmovmskps_avx(auVar121);
  if (uVar95 == 0) {
    return;
  }
  auVar117._16_16_ = mm_lookupmask_ps._240_16_;
  auVar117._0_16_ = mm_lookupmask_ps._240_16_;
  uVar95 = uVar95 & 0xff;
  local_280 = vblendps_avx(auVar117,ZEXT832(0) << 0x20,0x80);
  local_7b0 = prim;
LAB_01196c69:
  local_7a8 = (ulong)uVar95;
  lVar99 = 0;
  if (local_7a8 != 0) {
    for (; (uVar95 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
    }
  }
  local_7a8 = local_7a8 - 1 & local_7a8;
  local_ac8 = (ulong)*(uint *)(local_7b0 + 2);
  pGVar13 = (context->scene->geometries).items[*(uint *)(local_7b0 + 2)].ptr;
  local_a68 = (ulong)*(uint *)(local_7b0 + lVar99 * 4 + 6);
  uVar100 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                            pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)*(uint *)(local_7b0 + lVar99 * 4 + 6));
  p_Var14 = pGVar13[1].intersectionFilterN;
  lVar99 = *(long *)&pGVar13[1].time_range.upper;
  auVar144 = *(undefined1 (*) [16])(lVar99 + (long)p_Var14 * uVar100);
  auVar107 = *(undefined1 (*) [16])(lVar99 + (uVar100 + 1) * (long)p_Var14);
  auVar179 = *(undefined1 (*) [16])(lVar99 + (uVar100 + 2) * (long)p_Var14);
  lVar15 = 0;
  if (local_7a8 != 0) {
    for (; (local_7a8 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
    }
  }
  auVar141 = *(undefined1 (*) [16])(lVar99 + (uVar100 + 3) * (long)p_Var14);
  if (((local_7a8 != 0) && (uVar100 = local_7a8 - 1 & local_7a8, uVar100 != 0)) &&
     (lVar99 = 0, uVar100 != 0)) {
    for (; (uVar100 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
    }
  }
  auVar104._0_4_ = (auVar144._0_4_ + auVar107._0_4_ + auVar179._0_4_ + auVar141._0_4_) * 0.25;
  auVar104._4_4_ = (auVar144._4_4_ + auVar107._4_4_ + auVar179._4_4_ + auVar141._4_4_) * 0.25;
  auVar104._8_4_ = (auVar144._8_4_ + auVar107._8_4_ + auVar179._8_4_ + auVar141._8_4_) * 0.25;
  auVar104._12_4_ = (auVar144._12_4_ + auVar107._12_4_ + auVar179._12_4_ + auVar141._12_4_) * 0.25;
  aVar3 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar106 = vsubps_avx(auVar104,(undefined1  [16])aVar3);
  auVar106 = vdpps_avx(auVar106,(undefined1  [16])aVar4,0x7f);
  auVar6 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  auVar149 = vrcpss_avx(auVar6,auVar6);
  auVar348 = ZEXT464(0x40000000);
  fVar196 = auVar106._0_4_ * auVar149._0_4_ * (2.0 - auVar149._0_4_ * auVar6._0_4_);
  local_7c0 = ZEXT416((uint)fVar196);
  auVar6 = vshufps_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),0);
  fVar196 = aVar4.x;
  fVar210 = aVar4.y;
  fVar211 = aVar4.z;
  aVar176 = aVar4.field_3;
  auVar272._0_4_ = aVar3.x + fVar196 * auVar6._0_4_;
  auVar272._4_4_ = aVar3.y + fVar210 * auVar6._4_4_;
  auVar272._8_4_ = aVar3.z + fVar211 * auVar6._8_4_;
  auVar272._12_4_ = aVar3.field_3.w + aVar176.w * auVar6._12_4_;
  auVar106 = vblendps_avx(auVar272,_DAT_01feba10,8);
  _local_950 = vsubps_avx(auVar144,auVar106);
  _local_960 = vsubps_avx(auVar179,auVar106);
  _local_970 = vsubps_avx(auVar107,auVar106);
  _local_980 = vsubps_avx(auVar141,auVar106);
  auVar144 = vshufps_avx(_local_950,_local_950,0);
  register0x00001290 = auVar144;
  _local_1a0 = auVar144;
  auVar144 = vshufps_avx(_local_950,_local_950,0x55);
  register0x00001290 = auVar144;
  _local_1c0 = auVar144;
  auVar144 = vshufps_avx(_local_950,_local_950,0xaa);
  register0x00001290 = auVar144;
  _local_1e0 = auVar144;
  auVar144 = vshufps_avx(_local_950,_local_950,0xff);
  register0x00001290 = auVar144;
  _local_2c0 = auVar144;
  auVar144 = vshufps_avx(_local_970,_local_970,0);
  register0x00001290 = auVar144;
  _local_200 = auVar144;
  auVar144 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001290 = auVar144;
  _local_220 = auVar144;
  auVar144 = vshufps_avx(_local_970,_local_970,0xaa);
  register0x00001290 = auVar144;
  _local_240 = auVar144;
  auVar140._0_4_ = fVar196 * fVar196;
  auVar140._4_4_ = fVar210 * fVar210;
  auVar140._8_4_ = fVar211 * fVar211;
  auVar140._12_4_ = aVar176.w * aVar176.w;
  auVar144 = vshufps_avx(auVar140,auVar140,0xaa);
  auVar107 = vshufps_avx(auVar140,auVar140,0x55);
  auVar179 = vshufps_avx(_local_970,_local_970,0xff);
  register0x000012d0 = auVar179;
  _local_2e0 = auVar179;
  auVar179 = vshufps_avx(auVar140,auVar140,0);
  local_260._0_4_ = auVar179._0_4_ + auVar107._0_4_ + auVar144._0_4_;
  local_260._4_4_ = auVar179._4_4_ + auVar107._4_4_ + auVar144._4_4_;
  local_260._8_4_ = auVar179._8_4_ + auVar107._8_4_ + auVar144._8_4_;
  local_260._12_4_ = auVar179._12_4_ + auVar107._12_4_ + auVar144._12_4_;
  local_260._16_4_ = auVar179._0_4_ + auVar107._0_4_ + auVar144._0_4_;
  local_260._20_4_ = auVar179._4_4_ + auVar107._4_4_ + auVar144._4_4_;
  local_260._24_4_ = auVar179._8_4_ + auVar107._8_4_ + auVar144._8_4_;
  local_260._28_4_ = auVar179._12_4_ + auVar107._12_4_ + auVar144._12_4_;
  auVar144 = vshufps_avx(_local_960,_local_960,0);
  register0x00001250 = auVar144;
  _local_300 = auVar144;
  auVar144 = vshufps_avx(_local_960,_local_960,0x55);
  register0x00001250 = auVar144;
  _local_320 = auVar144;
  auVar144 = vshufps_avx(_local_960,_local_960,0xaa);
  register0x00001250 = auVar144;
  _local_340 = auVar144;
  auVar144 = vshufps_avx(_local_960,_local_960,0xff);
  register0x00001250 = auVar144;
  _local_360 = auVar144;
  auVar144 = vshufps_avx(_local_980,_local_980,0);
  register0x00001250 = auVar144;
  _local_380 = auVar144;
  auVar144 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001250 = auVar144;
  _local_3a0 = auVar144;
  auVar144 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001250 = auVar144;
  _local_3c0 = auVar144;
  auVar144 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001250 = auVar144;
  _local_3e0 = auVar144;
  register0x00001390 = auVar6;
  _local_820 = auVar6;
  auVar282 = ZEXT3264(_local_820);
  uVar100 = 1;
  uVar96 = 0;
  local_520 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  local_540 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  local_620 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  auVar118._8_4_ = 0x7fffffff;
  auVar118._0_8_ = 0x7fffffff7fffffff;
  auVar118._12_4_ = 0x7fffffff;
  auVar118._16_4_ = 0x7fffffff;
  auVar118._20_4_ = 0x7fffffff;
  auVar118._24_4_ = 0x7fffffff;
  auVar118._28_4_ = 0x7fffffff;
  local_400 = vandps_avx(local_260,auVar118);
  auVar312 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar262 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    local_900 = auVar312._0_16_;
    auVar144 = vmovshdup_avx(local_900);
    fVar216 = auVar144._0_4_ - auVar312._0_4_;
    auVar144 = vshufps_avx(local_900,local_900,0);
    local_860._16_16_ = auVar144;
    local_860._0_16_ = auVar144;
    auVar107 = vshufps_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),0);
    local_800._16_16_ = auVar107;
    local_800._0_16_ = auVar107;
    fVar137 = auVar107._0_4_;
    fVar174 = auVar107._4_4_;
    fVar175 = auVar107._8_4_;
    fVar177 = auVar107._12_4_;
    fVar102 = auVar144._0_4_;
    auVar206._0_4_ = fVar102 + fVar137 * 0.0;
    fVar128 = auVar144._4_4_;
    auVar206._4_4_ = fVar128 + fVar174 * 0.14285715;
    fVar130 = auVar144._8_4_;
    auVar206._8_4_ = fVar130 + fVar175 * 0.2857143;
    fVar132 = auVar144._12_4_;
    auVar206._12_4_ = fVar132 + fVar177 * 0.42857146;
    auVar206._16_4_ = fVar102 + fVar137 * 0.5714286;
    auVar206._20_4_ = fVar128 + fVar174 * 0.71428573;
    auVar206._24_4_ = fVar130 + fVar175 * 0.8571429;
    auVar206._28_4_ = fVar132 + fVar177;
    auVar121 = vsubps_avx(auVar262._0_32_,auVar206);
    fVar196 = auVar121._0_4_;
    fVar210 = auVar121._4_4_;
    fVar211 = auVar121._8_4_;
    fVar212 = auVar121._12_4_;
    fVar213 = auVar121._16_4_;
    fVar214 = auVar121._20_4_;
    fVar215 = auVar121._24_4_;
    fVar233 = fVar196 * fVar196 * fVar196;
    fVar265 = fVar210 * fVar210 * fVar210;
    fVar267 = fVar211 * fVar211 * fVar211;
    fVar286 = fVar212 * fVar212 * fVar212;
    fVar290 = fVar213 * fVar213 * fVar213;
    fVar294 = fVar214 * fVar214 * fVar214;
    fVar298 = fVar215 * fVar215 * fVar215;
    fVar303 = auVar206._0_4_ * auVar206._0_4_ * auVar206._0_4_;
    fVar313 = auVar206._4_4_ * auVar206._4_4_ * auVar206._4_4_;
    fVar314 = auVar206._8_4_ * auVar206._8_4_ * auVar206._8_4_;
    fVar315 = auVar206._12_4_ * auVar206._12_4_ * auVar206._12_4_;
    fVar316 = auVar206._16_4_ * auVar206._16_4_ * auVar206._16_4_;
    fVar317 = auVar206._20_4_ * auVar206._20_4_ * auVar206._20_4_;
    fVar318 = auVar206._24_4_ * auVar206._24_4_ * auVar206._24_4_;
    fVar231 = auVar206._0_4_ * fVar196;
    fVar235 = auVar206._4_4_ * fVar210;
    fVar237 = auVar206._8_4_ * fVar211;
    fVar239 = auVar206._12_4_ * fVar212;
    fVar241 = auVar206._16_4_ * fVar213;
    fVar243 = auVar206._20_4_ * fVar214;
    fVar264 = auVar206._24_4_ * fVar215;
    fVar263 = auVar355._28_4_ + auVar375._28_4_;
    fVar341 = auVar312._28_4_ + auVar262._28_4_ + fVar263;
    fVar350 = fVar263 + auVar282._28_4_ + auVar362._28_4_ + auVar348._28_4_;
    fVar263 = fVar233 * 0.16666667;
    fVar266 = fVar265 * 0.16666667;
    fVar268 = fVar267 * 0.16666667;
    fVar287 = fVar286 * 0.16666667;
    fVar291 = fVar290 * 0.16666667;
    fVar295 = fVar294 * 0.16666667;
    fVar299 = fVar298 * 0.16666667;
    fVar319 = (fVar303 + fVar233 * 4.0 + fVar196 * fVar231 * 12.0 + auVar206._0_4_ * fVar231 * 6.0)
              * 0.16666667;
    fVar329 = (fVar313 + fVar265 * 4.0 + fVar210 * fVar235 * 12.0 + auVar206._4_4_ * fVar235 * 6.0)
              * 0.16666667;
    fVar331 = (fVar314 + fVar267 * 4.0 + fVar211 * fVar237 * 12.0 + auVar206._8_4_ * fVar237 * 6.0)
              * 0.16666667;
    fVar333 = (fVar315 + fVar286 * 4.0 + fVar212 * fVar239 * 12.0 + auVar206._12_4_ * fVar239 * 6.0)
              * 0.16666667;
    fVar335 = (fVar316 + fVar290 * 4.0 + fVar213 * fVar241 * 12.0 + auVar206._16_4_ * fVar241 * 6.0)
              * 0.16666667;
    fVar337 = (fVar317 + fVar294 * 4.0 + fVar214 * fVar243 * 12.0 + auVar206._20_4_ * fVar243 * 6.0)
              * 0.16666667;
    fVar339 = (fVar318 + fVar298 * 4.0 + fVar215 * fVar264 * 12.0 + auVar206._24_4_ * fVar264 * 6.0)
              * 0.16666667;
    fVar233 = (fVar303 * 4.0 + fVar233 + auVar206._0_4_ * fVar231 * 12.0 + fVar196 * fVar231 * 6.0)
              * 0.16666667;
    fVar265 = (fVar313 * 4.0 + fVar265 + auVar206._4_4_ * fVar235 * 12.0 + fVar210 * fVar235 * 6.0)
              * 0.16666667;
    fVar267 = (fVar314 * 4.0 + fVar267 + auVar206._8_4_ * fVar237 * 12.0 + fVar211 * fVar237 * 6.0)
              * 0.16666667;
    fVar286 = (fVar315 * 4.0 + fVar286 + auVar206._12_4_ * fVar239 * 12.0 + fVar212 * fVar239 * 6.0)
              * 0.16666667;
    fVar290 = (fVar316 * 4.0 + fVar290 + auVar206._16_4_ * fVar241 * 12.0 + fVar213 * fVar241 * 6.0)
              * 0.16666667;
    fVar294 = (fVar317 * 4.0 + fVar294 + auVar206._20_4_ * fVar243 * 12.0 + fVar214 * fVar243 * 6.0)
              * 0.16666667;
    fVar298 = (fVar318 * 4.0 + fVar298 + auVar206._24_4_ * fVar264 * 12.0 + fVar215 * fVar264 * 6.0)
              * 0.16666667;
    fVar303 = fVar303 * 0.16666667;
    fVar313 = fVar313 * 0.16666667;
    fVar314 = fVar314 * 0.16666667;
    fVar315 = fVar315 * 0.16666667;
    fVar316 = fVar316 * 0.16666667;
    fVar317 = fVar317 * 0.16666667;
    fVar318 = fVar318 * 0.16666667;
    fVar369 = auVar362._28_4_ + 12.0;
    fVar351 = fVar350 + 12.166667;
    local_a60 = (float)local_1a0._0_4_ * fVar263 +
                (float)local_200._0_4_ * fVar319 +
                fVar303 * (float)local_380._0_4_ + fVar233 * (float)local_300._0_4_;
    fStack_a5c = (float)local_1a0._4_4_ * fVar266 +
                 (float)local_200._4_4_ * fVar329 +
                 fVar313 * (float)local_380._4_4_ + fVar265 * (float)local_300._4_4_;
    fStack_a58 = fStack_198 * fVar268 +
                 fStack_1f8 * fVar331 + fVar314 * fStack_378 + fVar267 * fStack_2f8;
    fStack_a54 = fStack_194 * fVar287 +
                 fStack_1f4 * fVar333 + fVar315 * fStack_374 + fVar286 * fStack_2f4;
    fStack_a50 = fStack_190 * fVar291 +
                 fStack_1f0 * fVar335 + fVar316 * fStack_370 + fVar290 * fStack_2f0;
    fStack_a4c = fStack_18c * fVar295 +
                 fStack_1ec * fVar337 + fVar317 * fStack_36c + fVar294 * fStack_2ec;
    fStack_a48 = fStack_188 * fVar299 +
                 fStack_1e8 * fVar339 + fVar318 * fStack_368 + fVar298 * fStack_2e8;
    fStack_a44 = fVar341 + fVar351;
    local_ac0 = (float)local_1c0._0_4_ * fVar263 +
                (float)local_220._0_4_ * fVar319 +
                fVar303 * (float)local_3a0._0_4_ + fVar233 * (float)local_320._0_4_;
    fStack_abc = (float)local_1c0._4_4_ * fVar266 +
                 (float)local_220._4_4_ * fVar329 +
                 fVar313 * (float)local_3a0._4_4_ + fVar265 * (float)local_320._4_4_;
    fStack_ab8 = fStack_1b8 * fVar268 +
                 fStack_218 * fVar331 + fVar314 * fStack_398 + fVar267 * fStack_318;
    fStack_ab4 = fStack_1b4 * fVar287 +
                 fStack_214 * fVar333 + fVar315 * fStack_394 + fVar286 * fStack_314;
    fStack_ab0 = fStack_1b0 * fVar291 +
                 fStack_210 * fVar335 + fVar316 * fStack_390 + fVar290 * fStack_310;
    fStack_aac = fStack_1ac * fVar295 +
                 fStack_20c * fVar337 + fVar317 * fStack_38c + fVar294 * fStack_30c;
    fStack_aa8 = fStack_1a8 * fVar299 +
                 fStack_208 * fVar339 + fVar318 * fStack_388 + fVar298 * fStack_308;
    fStack_aa4 = fStack_a44 + fVar369 + 12.166667;
    local_aa0 = (float)local_1e0._0_4_ * fVar263 +
                fVar319 * (float)local_240._0_4_ +
                fVar303 * (float)local_3c0._0_4_ + fVar233 * (float)local_340._0_4_;
    fStack_a9c = (float)local_1e0._4_4_ * fVar266 +
                 fVar329 * (float)local_240._4_4_ +
                 fVar313 * (float)local_3c0._4_4_ + fVar265 * (float)local_340._4_4_;
    fStack_a98 = fStack_1d8 * fVar268 +
                 fVar331 * fStack_238 + fVar314 * fStack_3b8 + fVar267 * fStack_338;
    fStack_a94 = fStack_1d4 * fVar287 +
                 fVar333 * fStack_234 + fVar315 * fStack_3b4 + fVar286 * fStack_334;
    fStack_a90 = fStack_1d0 * fVar291 +
                 fVar335 * fStack_230 + fVar316 * fStack_3b0 + fVar290 * fStack_330;
    fStack_a8c = fStack_1cc * fVar295 +
                 fVar337 * fStack_22c + fVar317 * fStack_3ac + fVar294 * fStack_32c;
    fStack_a88 = fStack_1c8 * fVar299 +
                 fVar339 * fStack_228 + fVar318 * fStack_3a8 + fVar298 * fStack_328;
    fStack_a84 = fStack_aa4 + fVar369 + auVar375._28_4_ + 12.0;
    local_700._0_4_ =
         fVar263 * (float)local_2c0._0_4_ +
         fVar319 * (float)local_2e0._0_4_ +
         fVar233 * (float)local_360._0_4_ + fVar303 * (float)local_3e0._0_4_;
    local_700._4_4_ =
         fVar266 * (float)local_2c0._4_4_ +
         fVar329 * (float)local_2e0._4_4_ +
         fVar265 * (float)local_360._4_4_ + fVar313 * (float)local_3e0._4_4_;
    local_700._8_4_ =
         fVar268 * fStack_2b8 + fVar331 * fStack_2d8 + fVar267 * fStack_358 + fVar314 * fStack_3d8;
    local_700._12_4_ =
         fVar287 * fStack_2b4 + fVar333 * fStack_2d4 + fVar286 * fStack_354 + fVar315 * fStack_3d4;
    local_700._16_4_ =
         fVar291 * fStack_2b0 + fVar335 * fStack_2d0 + fVar290 * fStack_350 + fVar316 * fStack_3d0;
    local_700._20_4_ =
         fVar295 * fStack_2ac + fVar337 * fStack_2cc + fVar294 * fStack_34c + fVar317 * fStack_3cc;
    local_700._24_4_ =
         fVar299 * fStack_2a8 + fVar339 * fStack_2c8 + fVar298 * fStack_348 + fVar318 * fStack_3c8;
    local_700._28_4_ = auVar282._28_4_ + fVar341 + fVar350 + auVar312._28_4_;
    auVar30._4_4_ = auVar206._4_4_ * -auVar206._4_4_;
    auVar30._0_4_ = auVar206._0_4_ * -auVar206._0_4_;
    auVar30._8_4_ = auVar206._8_4_ * -auVar206._8_4_;
    auVar30._12_4_ = auVar206._12_4_ * -auVar206._12_4_;
    auVar30._16_4_ = auVar206._16_4_ * -auVar206._16_4_;
    auVar30._20_4_ = auVar206._20_4_ * -auVar206._20_4_;
    auVar30._24_4_ = auVar206._24_4_ * -auVar206._24_4_;
    auVar30._28_4_ = auVar206._28_4_;
    auVar31._4_4_ = fVar235 * 4.0;
    auVar31._0_4_ = fVar231 * 4.0;
    auVar31._8_4_ = fVar237 * 4.0;
    auVar31._12_4_ = fVar239 * 4.0;
    auVar31._16_4_ = fVar241 * 4.0;
    auVar31._20_4_ = fVar243 * 4.0;
    auVar31._24_4_ = fVar264 * 4.0;
    auVar31._28_4_ = auVar262._28_4_;
    auVar121 = vsubps_avx(auVar30,auVar31);
    fVar287 = fVar196 * -fVar196 * 0.5;
    fVar291 = fVar210 * -fVar210 * 0.5;
    fVar299 = fVar211 * -fVar211 * 0.5;
    fVar303 = fVar212 * -fVar212 * 0.5;
    fVar313 = fVar213 * -fVar213 * 0.5;
    fVar314 = fVar214 * -fVar214 * 0.5;
    fVar315 = fVar215 * -fVar215 * 0.5;
    fVar263 = auVar121._0_4_ * 0.5;
    fVar267 = auVar121._4_4_ * 0.5;
    fVar268 = auVar121._8_4_ * 0.5;
    fVar286 = auVar121._12_4_ * 0.5;
    fVar294 = auVar121._16_4_ * 0.5;
    fVar295 = auVar121._20_4_ * 0.5;
    fVar298 = auVar121._24_4_ * 0.5;
    fVar233 = (fVar196 * fVar196 + fVar231 * 4.0) * 0.5;
    fVar235 = (fVar210 * fVar210 + fVar235 * 4.0) * 0.5;
    fVar237 = (fVar211 * fVar211 + fVar237 * 4.0) * 0.5;
    fVar239 = (fVar212 * fVar212 + fVar239 * 4.0) * 0.5;
    fVar241 = (fVar213 * fVar213 + fVar241 * 4.0) * 0.5;
    fVar265 = (fVar214 * fVar214 + fVar243 * 4.0) * 0.5;
    fVar266 = (fVar215 * fVar215 + fVar264 * 4.0) * 0.5;
    fVar196 = auVar206._0_4_ * auVar206._0_4_ * 0.5;
    fVar210 = auVar206._4_4_ * auVar206._4_4_ * 0.5;
    fVar211 = auVar206._8_4_ * auVar206._8_4_ * 0.5;
    fVar212 = auVar206._12_4_ * auVar206._12_4_ * 0.5;
    fVar213 = auVar206._16_4_ * auVar206._16_4_ * 0.5;
    fVar214 = auVar206._20_4_ * auVar206._20_4_ * 0.5;
    fVar231 = auVar206._24_4_ * auVar206._24_4_ * 0.5;
    fVar302 = fStack_a84 + fVar351 + fVar351 + 4.0;
    auVar144 = vpermilps_avx(ZEXT416((uint)(fVar216 * 0.04761905)),0);
    fVar215 = auVar144._0_4_;
    fVar270 = fVar215 * ((float)local_1a0._0_4_ * fVar287 +
                        (float)local_200._0_4_ * fVar263 +
                        fVar233 * (float)local_300._0_4_ + fVar196 * (float)local_380._0_4_);
    fVar243 = auVar144._4_4_;
    fVar283 = fVar243 * ((float)local_1a0._4_4_ * fVar291 +
                        (float)local_200._4_4_ * fVar267 +
                        fVar235 * (float)local_300._4_4_ + fVar210 * (float)local_380._4_4_);
    local_9e0._4_4_ = fVar283;
    local_9e0._0_4_ = fVar270;
    fVar264 = auVar144._8_4_;
    fVar284 = fVar264 * (fStack_198 * fVar299 +
                        fStack_1f8 * fVar268 + fVar237 * fStack_2f8 + fVar211 * fStack_378);
    local_9e0._8_4_ = fVar284;
    fVar290 = auVar144._12_4_;
    fVar288 = fVar290 * (fStack_194 * fVar303 +
                        fStack_1f4 * fVar286 + fVar239 * fStack_2f4 + fVar212 * fStack_374);
    local_9e0._12_4_ = fVar288;
    fVar292 = fVar215 * (fStack_190 * fVar313 +
                        fStack_1f0 * fVar294 + fVar241 * fStack_2f0 + fVar213 * fStack_370);
    local_9e0._16_4_ = fVar292;
    fVar296 = fVar243 * (fStack_18c * fVar314 +
                        fStack_1ec * fVar295 + fVar265 * fStack_2ec + fVar214 * fStack_36c);
    local_9e0._20_4_ = fVar296;
    fVar300 = fVar264 * (fStack_188 * fVar315 +
                        fStack_1e8 * fVar298 + fVar266 * fStack_2e8 + fVar231 * fStack_368);
    local_9e0._24_4_ = fVar300;
    local_9e0._28_4_ = fVar302;
    fVar370 = fVar215 * ((float)local_1c0._0_4_ * fVar287 +
                        (float)local_220._0_4_ * fVar263 +
                        fVar233 * (float)local_320._0_4_ + fVar196 * (float)local_3a0._0_4_);
    fVar376 = fVar243 * ((float)local_1c0._4_4_ * fVar291 +
                        (float)local_220._4_4_ * fVar267 +
                        fVar235 * (float)local_320._4_4_ + fVar210 * (float)local_3a0._4_4_);
    local_840._4_4_ = fVar376;
    local_840._0_4_ = fVar370;
    fVar378 = fVar264 * (fStack_1b8 * fVar299 +
                        fStack_218 * fVar268 + fVar237 * fStack_318 + fVar211 * fStack_398);
    local_840._8_4_ = fVar378;
    fVar379 = fVar290 * (fStack_1b4 * fVar303 +
                        fStack_214 * fVar286 + fVar239 * fStack_314 + fVar212 * fStack_394);
    local_840._12_4_ = fVar379;
    fVar380 = fVar215 * (fStack_1b0 * fVar313 +
                        fStack_210 * fVar294 + fVar241 * fStack_310 + fVar213 * fStack_390);
    local_840._16_4_ = fVar380;
    fVar381 = fVar243 * (fStack_1ac * fVar314 +
                        fStack_20c * fVar295 + fVar265 * fStack_30c + fVar214 * fStack_38c);
    local_840._20_4_ = fVar381;
    fVar382 = fVar264 * (fStack_1a8 * fVar315 +
                        fStack_208 * fVar298 + fVar266 * fStack_308 + fVar231 * fStack_388);
    local_840._24_4_ = fVar382;
    local_840._28_4_ = fStack_184;
    fVar384 = fVar215 * ((float)local_1e0._0_4_ * fVar287 +
                        fVar196 * (float)local_3c0._0_4_ + fVar233 * (float)local_340._0_4_ +
                        (float)local_240._0_4_ * fVar263);
    fVar389 = fVar243 * ((float)local_1e0._4_4_ * fVar291 +
                        fVar210 * (float)local_3c0._4_4_ + fVar235 * (float)local_340._4_4_ +
                        (float)local_240._4_4_ * fVar267);
    local_9a0._4_4_ = fVar389;
    local_9a0._0_4_ = fVar384;
    fVar391 = fVar264 * (fStack_1d8 * fVar299 +
                        fVar211 * fStack_3b8 + fVar237 * fStack_338 + fStack_238 * fVar268);
    local_9a0._8_4_ = fVar391;
    fVar393 = fVar290 * (fStack_1d4 * fVar303 +
                        fVar212 * fStack_3b4 + fVar239 * fStack_334 + fStack_234 * fVar286);
    local_9a0._12_4_ = fVar393;
    fVar395 = fVar215 * (fStack_1d0 * fVar313 +
                        fVar213 * fStack_3b0 + fVar241 * fStack_330 + fStack_230 * fVar294);
    local_9a0._16_4_ = fVar395;
    fVar397 = fVar243 * (fStack_1cc * fVar314 +
                        fVar214 * fStack_3ac + fVar265 * fStack_32c + fStack_22c * fVar295);
    local_9a0._20_4_ = fVar397;
    fVar399 = fVar264 * (fStack_1c8 * fVar315 +
                        fVar231 * fStack_3a8 + fVar266 * fStack_328 + fStack_228 * fVar298);
    local_9a0._24_4_ = fVar399;
    local_9a0._28_4_ = uStack_1a4;
    fVar216 = fVar215 * (fVar287 * (float)local_2c0._0_4_ +
                        fVar263 * (float)local_2e0._0_4_ +
                        fVar196 * (float)local_3e0._0_4_ + fVar233 * (float)local_360._0_4_);
    fVar263 = fVar243 * (fVar291 * (float)local_2c0._4_4_ +
                        fVar267 * (float)local_2e0._4_4_ +
                        fVar210 * (float)local_3e0._4_4_ + fVar235 * (float)local_360._4_4_);
    auVar32._4_4_ = fVar263;
    auVar32._0_4_ = fVar216;
    fVar287 = fVar264 * (fVar299 * fStack_2b8 +
                        fVar268 * fStack_2d8 + fVar211 * fStack_3d8 + fVar237 * fStack_358);
    auVar32._8_4_ = fVar287;
    fVar291 = fVar290 * (fVar303 * fStack_2b4 +
                        fVar286 * fStack_2d4 + fVar212 * fStack_3d4 + fVar239 * fStack_354);
    auVar32._12_4_ = fVar291;
    fVar215 = fVar215 * (fVar313 * fStack_2b0 +
                        fVar294 * fStack_2d0 + fVar213 * fStack_3d0 + fVar241 * fStack_350);
    auVar32._16_4_ = fVar215;
    fVar243 = fVar243 * (fVar314 * fStack_2ac +
                        fVar295 * fStack_2cc + fVar214 * fStack_3cc + fVar265 * fStack_34c);
    auVar32._20_4_ = fVar243;
    fVar264 = fVar264 * (fVar315 * fStack_2a8 +
                        fVar298 * fStack_2c8 + fVar231 * fStack_3c8 + fVar266 * fStack_348);
    auVar32._24_4_ = fVar264;
    auVar32._28_4_ = fVar290;
    auVar88._4_4_ = fStack_abc;
    auVar88._0_4_ = local_ac0;
    auVar88._8_4_ = fStack_ab8;
    auVar88._12_4_ = fStack_ab4;
    auVar88._16_4_ = fStack_ab0;
    auVar88._20_4_ = fStack_aac;
    auVar88._24_4_ = fStack_aa8;
    auVar88._28_4_ = fStack_aa4;
    auVar121 = vperm2f128_avx(auVar88,auVar88,1);
    auVar121 = vshufps_avx(auVar121,auVar88,0x30);
    _local_880 = vshufps_avx(auVar88,auVar121,0x29);
    auVar90._4_4_ = fStack_a9c;
    auVar90._0_4_ = local_aa0;
    auVar90._8_4_ = fStack_a98;
    auVar90._12_4_ = fStack_a94;
    auVar90._16_4_ = fStack_a90;
    auVar90._20_4_ = fStack_a8c;
    auVar90._24_4_ = fStack_a88;
    auVar90._28_4_ = fStack_a84;
    auVar121 = vperm2f128_avx(auVar90,auVar90,1);
    auVar121 = vshufps_avx(auVar121,auVar90,0x30);
    local_8a0 = vshufps_avx(auVar90,auVar121,0x29);
    auVar157 = vsubps_avx(local_700,auVar32);
    auVar121 = vperm2f128_avx(auVar157,auVar157,1);
    auVar121 = vshufps_avx(auVar121,auVar157,0x30);
    local_720 = vshufps_avx(auVar157,auVar121,0x29);
    _local_680 = vsubps_avx(_local_880,auVar88);
    _local_660 = vsubps_avx(local_8a0,auVar90);
    fVar210 = local_680._0_4_;
    fVar233 = local_680._4_4_;
    auVar33._4_4_ = fVar389 * fVar233;
    auVar33._0_4_ = fVar384 * fVar210;
    fVar265 = local_680._8_4_;
    auVar33._8_4_ = fVar391 * fVar265;
    fVar294 = local_680._12_4_;
    auVar33._12_4_ = fVar393 * fVar294;
    fVar316 = local_680._16_4_;
    auVar33._16_4_ = fVar395 * fVar316;
    fVar337 = local_680._20_4_;
    auVar33._20_4_ = fVar397 * fVar337;
    fVar21 = local_680._24_4_;
    auVar33._24_4_ = fVar399 * fVar21;
    auVar33._28_4_ = auVar157._28_4_;
    fVar211 = local_660._0_4_;
    fVar235 = local_660._4_4_;
    auVar34._4_4_ = fVar376 * fVar235;
    auVar34._0_4_ = fVar370 * fVar211;
    fVar266 = local_660._8_4_;
    auVar34._8_4_ = fVar378 * fVar266;
    fVar295 = local_660._12_4_;
    auVar34._12_4_ = fVar379 * fVar295;
    fVar317 = local_660._16_4_;
    auVar34._16_4_ = fVar380 * fVar317;
    fVar339 = local_660._20_4_;
    auVar34._20_4_ = fVar381 * fVar339;
    fVar22 = local_660._24_4_;
    auVar34._24_4_ = fVar382 * fVar22;
    auVar34._28_4_ = auVar121._28_4_;
    auVar16 = vsubps_avx(auVar34,auVar33);
    auVar92._4_4_ = fStack_a5c;
    auVar92._0_4_ = local_a60;
    auVar92._8_4_ = fStack_a58;
    auVar92._12_4_ = fStack_a54;
    auVar92._16_4_ = fStack_a50;
    auVar92._20_4_ = fStack_a4c;
    auVar92._24_4_ = fStack_a48;
    auVar92._28_4_ = fStack_a44;
    auVar121 = vperm2f128_avx(auVar92,auVar92,1);
    auVar121 = vshufps_avx(auVar121,auVar92,0x30);
    local_920 = vshufps_avx(auVar92,auVar121,0x29);
    _local_6a0 = vsubps_avx(local_920,auVar92);
    auVar35._4_4_ = fVar235 * fVar283;
    auVar35._0_4_ = fVar211 * fVar270;
    auVar35._8_4_ = fVar266 * fVar284;
    auVar35._12_4_ = fVar295 * fVar288;
    auVar35._16_4_ = fVar317 * fVar292;
    auVar35._20_4_ = fVar339 * fVar296;
    auVar35._24_4_ = fVar22 * fVar300;
    auVar35._28_4_ = auVar121._28_4_;
    fVar212 = local_6a0._0_4_;
    fVar237 = local_6a0._4_4_;
    auVar36._4_4_ = fVar389 * fVar237;
    auVar36._0_4_ = fVar384 * fVar212;
    fVar267 = local_6a0._8_4_;
    auVar36._8_4_ = fVar391 * fVar267;
    fVar298 = local_6a0._12_4_;
    auVar36._12_4_ = fVar393 * fVar298;
    fVar318 = local_6a0._16_4_;
    auVar36._16_4_ = fVar395 * fVar318;
    fVar341 = local_6a0._20_4_;
    auVar36._20_4_ = fVar397 * fVar341;
    fVar23 = local_6a0._24_4_;
    auVar36._24_4_ = fVar399 * fVar23;
    auVar36._28_4_ = local_8a0._28_4_;
    auVar17 = vsubps_avx(auVar36,auVar35);
    auVar37._4_4_ = fVar376 * fVar237;
    auVar37._0_4_ = fVar370 * fVar212;
    auVar37._8_4_ = fVar378 * fVar267;
    auVar37._12_4_ = fVar379 * fVar298;
    auVar37._16_4_ = fVar380 * fVar318;
    auVar37._20_4_ = fVar381 * fVar341;
    auVar37._24_4_ = fVar382 * fVar23;
    auVar37._28_4_ = local_8a0._28_4_;
    auVar38._4_4_ = fVar233 * fVar283;
    auVar38._0_4_ = fVar210 * fVar270;
    auVar38._8_4_ = fVar265 * fVar284;
    auVar38._12_4_ = fVar294 * fVar288;
    auVar38._16_4_ = fVar316 * fVar292;
    auVar38._20_4_ = fVar337 * fVar296;
    auVar38._24_4_ = fVar21 * fVar300;
    auVar38._28_4_ = uStack_1c4;
    auVar158 = vsubps_avx(auVar38,auVar37);
    fVar196 = auVar158._28_4_;
    auVar156._0_4_ = fVar212 * fVar212 + fVar210 * fVar210 + fVar211 * fVar211;
    auVar156._4_4_ = fVar237 * fVar237 + fVar233 * fVar233 + fVar235 * fVar235;
    auVar156._8_4_ = fVar267 * fVar267 + fVar265 * fVar265 + fVar266 * fVar266;
    auVar156._12_4_ = fVar298 * fVar298 + fVar294 * fVar294 + fVar295 * fVar295;
    auVar156._16_4_ = fVar318 * fVar318 + fVar316 * fVar316 + fVar317 * fVar317;
    auVar156._20_4_ = fVar341 * fVar341 + fVar337 * fVar337 + fVar339 * fVar339;
    auVar156._24_4_ = fVar23 * fVar23 + fVar21 * fVar21 + fVar22 * fVar22;
    auVar156._28_4_ = fVar196 + fVar196 + auVar16._28_4_;
    auVar121 = vrcpps_avx(auVar156);
    fVar313 = auVar121._0_4_;
    fVar314 = auVar121._4_4_;
    auVar39._4_4_ = fVar314 * auVar156._4_4_;
    auVar39._0_4_ = fVar313 * auVar156._0_4_;
    fVar315 = auVar121._8_4_;
    auVar39._8_4_ = fVar315 * auVar156._8_4_;
    fVar331 = auVar121._12_4_;
    auVar39._12_4_ = fVar331 * auVar156._12_4_;
    fVar333 = auVar121._16_4_;
    auVar39._16_4_ = fVar333 * auVar156._16_4_;
    fVar335 = auVar121._20_4_;
    auVar39._20_4_ = fVar335 * auVar156._20_4_;
    fVar369 = auVar121._24_4_;
    auVar39._24_4_ = fVar369 * auVar156._24_4_;
    auVar39._28_4_ = uStack_1c4;
    auVar190._8_4_ = 0x3f800000;
    auVar190._0_8_ = &DAT_3f8000003f800000;
    auVar190._12_4_ = 0x3f800000;
    auVar190._16_4_ = 0x3f800000;
    auVar190._20_4_ = 0x3f800000;
    auVar190._24_4_ = 0x3f800000;
    auVar190._28_4_ = 0x3f800000;
    auVar160 = vsubps_avx(auVar190,auVar39);
    fVar313 = auVar160._0_4_ * fVar313 + fVar313;
    fVar314 = auVar160._4_4_ * fVar314 + fVar314;
    fVar315 = auVar160._8_4_ * fVar315 + fVar315;
    fVar331 = auVar160._12_4_ * fVar331 + fVar331;
    fVar333 = auVar160._16_4_ * fVar333 + fVar333;
    fVar335 = auVar160._20_4_ * fVar335 + fVar335;
    fVar369 = auVar160._24_4_ * fVar369 + fVar369;
    auVar157 = vperm2f128_avx(local_840,local_840,1);
    auVar157 = vshufps_avx(auVar157,local_840,0x30);
    local_9c0 = vshufps_avx(local_840,auVar157,0x29);
    auVar157 = vperm2f128_avx(local_9a0,local_9a0,1);
    auVar157 = vshufps_avx(auVar157,local_9a0,0x30);
    local_7e0 = vshufps_avx(local_9a0,auVar157,0x29);
    fVar385 = local_7e0._0_4_;
    fVar390 = local_7e0._4_4_;
    auVar40._4_4_ = fVar390 * fVar233;
    auVar40._0_4_ = fVar385 * fVar210;
    fVar392 = local_7e0._8_4_;
    auVar40._8_4_ = fVar392 * fVar265;
    fVar394 = local_7e0._12_4_;
    auVar40._12_4_ = fVar394 * fVar294;
    fVar396 = local_7e0._16_4_;
    auVar40._16_4_ = fVar396 * fVar316;
    fVar398 = local_7e0._20_4_;
    auVar40._20_4_ = fVar398 * fVar337;
    fVar400 = local_7e0._24_4_;
    auVar40._24_4_ = fVar400 * fVar21;
    auVar40._28_4_ = auVar157._28_4_;
    fVar213 = local_9c0._0_4_;
    fVar239 = local_9c0._4_4_;
    auVar41._4_4_ = fVar235 * fVar239;
    auVar41._0_4_ = fVar211 * fVar213;
    fVar268 = local_9c0._8_4_;
    auVar41._8_4_ = fVar266 * fVar268;
    fVar299 = local_9c0._12_4_;
    auVar41._12_4_ = fVar295 * fVar299;
    fVar319 = local_9c0._16_4_;
    auVar41._16_4_ = fVar317 * fVar319;
    fVar350 = local_9c0._20_4_;
    auVar41._20_4_ = fVar339 * fVar350;
    fVar24 = local_9c0._24_4_;
    auVar41._24_4_ = fVar22 * fVar24;
    auVar41._28_4_ = fStack_184;
    auVar325 = vsubps_avx(auVar41,auVar40);
    auVar157 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar157 = vshufps_avx(auVar157,local_9e0,0x30);
    local_940 = vshufps_avx(local_9e0,auVar157,0x29);
    fVar214 = local_940._0_4_;
    fVar241 = local_940._4_4_;
    auVar42._4_4_ = fVar235 * fVar241;
    auVar42._0_4_ = fVar211 * fVar214;
    fVar286 = local_940._8_4_;
    auVar42._8_4_ = fVar266 * fVar286;
    fVar303 = local_940._12_4_;
    auVar42._12_4_ = fVar295 * fVar303;
    fVar329 = local_940._16_4_;
    auVar42._16_4_ = fVar317 * fVar329;
    fVar351 = local_940._20_4_;
    auVar42._20_4_ = fVar339 * fVar351;
    fVar25 = local_940._24_4_;
    auVar42._24_4_ = fVar22 * fVar25;
    auVar42._28_4_ = auVar157._28_4_;
    auVar43._4_4_ = fVar390 * fVar237;
    auVar43._0_4_ = fVar385 * fVar212;
    auVar43._8_4_ = fVar392 * fVar267;
    auVar43._12_4_ = fVar394 * fVar298;
    auVar43._16_4_ = fVar396 * fVar318;
    auVar43._20_4_ = fVar398 * fVar341;
    uVar95 = local_7e0._28_4_;
    auVar43._24_4_ = fVar400 * fVar23;
    auVar43._28_4_ = uVar95;
    auVar157 = vsubps_avx(auVar43,auVar42);
    auVar19 = local_9c0;
    auVar44._4_4_ = fVar237 * fVar239;
    auVar44._0_4_ = fVar212 * fVar213;
    auVar44._8_4_ = fVar267 * fVar268;
    auVar44._12_4_ = fVar298 * fVar299;
    auVar44._16_4_ = fVar318 * fVar319;
    auVar44._20_4_ = fVar341 * fVar350;
    auVar44._24_4_ = fVar23 * fVar24;
    auVar44._28_4_ = uVar95;
    auVar45._4_4_ = fVar233 * fVar241;
    auVar45._0_4_ = fVar210 * fVar214;
    auVar45._8_4_ = fVar265 * fVar286;
    auVar45._12_4_ = fVar294 * fVar303;
    auVar45._16_4_ = fVar316 * fVar329;
    auVar45._20_4_ = fVar337 * fVar351;
    auVar45._24_4_ = fVar21 * fVar25;
    auVar45._28_4_ = uStack_1e4;
    auVar18 = vsubps_avx(auVar45,auVar44);
    fVar231 = auVar18._28_4_;
    fVar383 = auVar157._28_4_ + fVar231;
    auVar46._4_4_ =
         (auVar16._4_4_ * auVar16._4_4_ +
         auVar17._4_4_ * auVar17._4_4_ + auVar158._4_4_ * auVar158._4_4_) * fVar314;
    auVar46._0_4_ =
         (auVar16._0_4_ * auVar16._0_4_ +
         auVar17._0_4_ * auVar17._0_4_ + auVar158._0_4_ * auVar158._0_4_) * fVar313;
    auVar46._8_4_ =
         (auVar16._8_4_ * auVar16._8_4_ +
         auVar17._8_4_ * auVar17._8_4_ + auVar158._8_4_ * auVar158._8_4_) * fVar315;
    auVar46._12_4_ =
         (auVar16._12_4_ * auVar16._12_4_ +
         auVar17._12_4_ * auVar17._12_4_ + auVar158._12_4_ * auVar158._12_4_) * fVar331;
    auVar46._16_4_ =
         (auVar16._16_4_ * auVar16._16_4_ +
         auVar17._16_4_ * auVar17._16_4_ + auVar158._16_4_ * auVar158._16_4_) * fVar333;
    auVar46._20_4_ =
         (auVar16._20_4_ * auVar16._20_4_ +
         auVar17._20_4_ * auVar17._20_4_ + auVar158._20_4_ * auVar158._20_4_) * fVar335;
    auVar46._24_4_ =
         (auVar16._24_4_ * auVar16._24_4_ +
         auVar17._24_4_ * auVar17._24_4_ + auVar158._24_4_ * auVar158._24_4_) * fVar369;
    auVar46._28_4_ = auVar16._28_4_ + auVar17._28_4_ + fVar196;
    auVar47._4_4_ =
         (auVar325._4_4_ * auVar325._4_4_ +
         auVar157._4_4_ * auVar157._4_4_ + auVar18._4_4_ * auVar18._4_4_) * fVar314;
    auVar47._0_4_ =
         (auVar325._0_4_ * auVar325._0_4_ +
         auVar157._0_4_ * auVar157._0_4_ + auVar18._0_4_ * auVar18._0_4_) * fVar313;
    auVar47._8_4_ =
         (auVar325._8_4_ * auVar325._8_4_ +
         auVar157._8_4_ * auVar157._8_4_ + auVar18._8_4_ * auVar18._8_4_) * fVar315;
    auVar47._12_4_ =
         (auVar325._12_4_ * auVar325._12_4_ +
         auVar157._12_4_ * auVar157._12_4_ + auVar18._12_4_ * auVar18._12_4_) * fVar331;
    auVar47._16_4_ =
         (auVar325._16_4_ * auVar325._16_4_ +
         auVar157._16_4_ * auVar157._16_4_ + auVar18._16_4_ * auVar18._16_4_) * fVar333;
    auVar47._20_4_ =
         (auVar325._20_4_ * auVar325._20_4_ +
         auVar157._20_4_ * auVar157._20_4_ + auVar18._20_4_ * auVar18._20_4_) * fVar335;
    auVar47._24_4_ =
         (auVar325._24_4_ * auVar325._24_4_ +
         auVar157._24_4_ * auVar157._24_4_ + auVar18._24_4_ * auVar18._24_4_) * fVar369;
    auVar47._28_4_ = auVar160._28_4_ + auVar121._28_4_;
    auVar121 = vmaxps_avx(auVar46,auVar47);
    auVar157 = vperm2f128_avx(local_700,local_700,1);
    auVar157 = vshufps_avx(auVar157,local_700,0x30);
    local_740 = vshufps_avx(local_700,auVar157,0x29);
    local_760._0_4_ = (float)local_700._0_4_ + fVar216;
    local_760._4_4_ = local_700._4_4_ + fVar263;
    fStack_758 = local_700._8_4_ + fVar287;
    fStack_754 = local_700._12_4_ + fVar291;
    fStack_750 = local_700._16_4_ + fVar215;
    fStack_74c = local_700._20_4_ + fVar243;
    fStack_748 = local_700._24_4_ + fVar264;
    fStack_744 = local_700._28_4_ + fVar290;
    auVar157 = vmaxps_avx(local_700,_local_760);
    auVar16 = vmaxps_avx(local_720,local_740);
    _local_a40 = vmaxps_avx(auVar157,auVar16);
    auVar157 = vrsqrtps_avx(auVar156);
    fVar196 = auVar157._0_4_;
    fVar215 = auVar157._4_4_;
    fVar216 = auVar157._8_4_;
    fVar243 = auVar157._12_4_;
    fVar263 = auVar157._16_4_;
    fVar264 = auVar157._20_4_;
    fVar287 = auVar157._24_4_;
    auVar48._4_4_ = fVar215 * fVar215 * fVar215 * auVar156._4_4_ * 0.5;
    auVar48._0_4_ = fVar196 * fVar196 * fVar196 * auVar156._0_4_ * 0.5;
    auVar48._8_4_ = fVar216 * fVar216 * fVar216 * auVar156._8_4_ * 0.5;
    auVar48._12_4_ = fVar243 * fVar243 * fVar243 * auVar156._12_4_ * 0.5;
    auVar48._16_4_ = fVar263 * fVar263 * fVar263 * auVar156._16_4_ * 0.5;
    auVar48._20_4_ = fVar264 * fVar264 * fVar264 * auVar156._20_4_ * 0.5;
    auVar48._24_4_ = fVar287 * fVar287 * fVar287 * auVar156._24_4_ * 0.5;
    auVar48._28_4_ = auVar156._28_4_;
    auVar49._4_4_ = fVar215 * 1.5;
    auVar49._0_4_ = fVar196 * 1.5;
    auVar49._8_4_ = fVar216 * 1.5;
    auVar49._12_4_ = fVar243 * 1.5;
    auVar49._16_4_ = fVar263 * 1.5;
    auVar49._20_4_ = fVar264 * 1.5;
    auVar49._24_4_ = fVar287 * 1.5;
    auVar49._28_4_ = auVar157._28_4_;
    local_5a0 = vsubps_avx(auVar49,auVar48);
    auVar89._4_4_ = fStack_abc;
    auVar89._0_4_ = local_ac0;
    auVar89._8_4_ = fStack_ab8;
    auVar89._12_4_ = fStack_ab4;
    auVar89._16_4_ = fStack_ab0;
    auVar89._20_4_ = fStack_aac;
    auVar89._24_4_ = fStack_aa8;
    auVar89._28_4_ = fStack_aa4;
    auVar157 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_8c0 = vsubps_avx(auVar157,auVar89);
    auVar91._4_4_ = fStack_a9c;
    auVar91._0_4_ = local_aa0;
    auVar91._8_4_ = fStack_a98;
    auVar91._12_4_ = fStack_a94;
    auVar91._16_4_ = fStack_a90;
    auVar91._20_4_ = fStack_a8c;
    auVar91._24_4_ = fStack_a88;
    auVar91._28_4_ = fStack_a84;
    auVar157 = vsubps_avx(auVar157,auVar91);
    fVar215 = auVar157._0_4_;
    fVar243 = auVar157._4_4_;
    fVar287 = auVar157._8_4_;
    fVar313 = auVar157._12_4_;
    fVar331 = auVar157._16_4_;
    fVar369 = auVar157._20_4_;
    fVar26 = auVar157._24_4_;
    fVar216 = local_8c0._0_4_;
    fVar263 = local_8c0._4_4_;
    fVar290 = local_8c0._8_4_;
    fVar314 = local_8c0._12_4_;
    fVar333 = local_8c0._16_4_;
    fVar20 = local_8c0._20_4_;
    fVar27 = local_8c0._24_4_;
    auVar158 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar16 = vsubps_avx(auVar158,auVar92);
    auVar362 = ZEXT3264(auVar16);
    fVar356 = auVar16._0_4_;
    fVar363 = auVar16._4_4_;
    fVar364 = auVar16._8_4_;
    fVar365 = auVar16._12_4_;
    fVar366 = auVar16._16_4_;
    fVar367 = auVar16._20_4_;
    fVar368 = auVar16._24_4_;
    auVar354._0_4_ = fVar356 * local_520 + local_540 * fVar216 + local_620 * fVar215;
    auVar354._4_4_ = fVar363 * fStack_51c + fStack_53c * fVar263 + fStack_61c * fVar243;
    auVar354._8_4_ = fVar364 * fStack_518 + fStack_538 * fVar290 + fStack_618 * fVar287;
    auVar354._12_4_ = fVar365 * fStack_514 + fStack_534 * fVar314 + fStack_614 * fVar313;
    auVar354._16_4_ = fVar366 * fStack_510 + fStack_530 * fVar333 + fStack_610 * fVar331;
    auVar354._20_4_ = fVar367 * fStack_50c + fStack_52c * fVar20 + fStack_60c * fVar369;
    auVar354._24_4_ = fVar368 * fStack_508 + fStack_528 * fVar27 + fStack_608 * fVar26;
    auVar354._28_4_ = fVar383 + fVar383 + auVar325._28_4_ + fVar383;
    auVar373._0_4_ = fVar356 * fVar356 + fVar216 * fVar216 + fVar215 * fVar215;
    auVar373._4_4_ = fVar363 * fVar363 + fVar263 * fVar263 + fVar243 * fVar243;
    auVar373._8_4_ = fVar364 * fVar364 + fVar290 * fVar290 + fVar287 * fVar287;
    auVar373._12_4_ = fVar365 * fVar365 + fVar314 * fVar314 + fVar313 * fVar313;
    auVar373._16_4_ = fVar366 * fVar366 + fVar333 * fVar333 + fVar331 * fVar331;
    auVar373._20_4_ = fVar367 * fVar367 + fVar20 * fVar20 + fVar369 * fVar369;
    auVar373._24_4_ = fVar368 * fVar368 + fVar27 * fVar27 + fVar26 * fVar26;
    auVar373._28_4_ = fVar231 + fVar231 + fVar383;
    fVar231 = local_5a0._0_4_;
    fVar264 = local_5a0._4_4_;
    fVar291 = local_5a0._8_4_;
    fVar315 = local_5a0._12_4_;
    fVar335 = local_5a0._16_4_;
    fVar383 = local_5a0._20_4_;
    fVar269 = local_5a0._24_4_;
    fVar320 = local_520 * fVar212 * fVar231 +
              fVar210 * fVar231 * local_540 + fVar211 * fVar231 * local_620;
    fVar330 = fStack_51c * fVar237 * fVar264 +
              fVar233 * fVar264 * fStack_53c + fVar235 * fVar264 * fStack_61c;
    fVar332 = fStack_518 * fVar267 * fVar291 +
              fVar265 * fVar291 * fStack_538 + fVar266 * fVar291 * fStack_618;
    fVar334 = fStack_514 * fVar298 * fVar315 +
              fVar294 * fVar315 * fStack_534 + fVar295 * fVar315 * fStack_614;
    fVar336 = fStack_510 * fVar318 * fVar335 +
              fVar316 * fVar335 * fStack_530 + fVar317 * fVar335 * fStack_610;
    fVar338 = fStack_50c * fVar341 * fVar383 +
              fVar337 * fVar383 * fStack_52c + fVar339 * fVar383 * fStack_60c;
    fVar340 = fStack_508 * fVar23 * fVar269 +
              fVar21 * fVar269 * fStack_528 + fVar22 * fVar269 * fStack_608;
    fVar342 = fStack_504 + fStack_524 + fStack_604;
    fVar196 = fStack_504 + fStack_524 + fStack_604;
    local_6e0._0_4_ =
         fVar356 * fVar212 * fVar231 + fVar210 * fVar231 * fVar216 + fVar211 * fVar231 * fVar215;
    local_6e0._4_4_ =
         fVar363 * fVar237 * fVar264 + fVar233 * fVar264 * fVar263 + fVar235 * fVar264 * fVar243;
    local_6e0._8_4_ =
         fVar364 * fVar267 * fVar291 + fVar265 * fVar291 * fVar290 + fVar266 * fVar291 * fVar287;
    local_6e0._12_4_ =
         fVar365 * fVar298 * fVar315 + fVar294 * fVar315 * fVar314 + fVar295 * fVar315 * fVar313;
    local_6e0._16_4_ =
         fVar366 * fVar318 * fVar335 + fVar316 * fVar335 * fVar333 + fVar317 * fVar335 * fVar331;
    local_6e0._20_4_ =
         fVar367 * fVar341 * fVar383 + fVar337 * fVar383 * fVar20 + fVar339 * fVar383 * fVar369;
    local_6e0._24_4_ =
         fVar368 * fVar23 * fVar269 + fVar21 * fVar269 * fVar27 + fVar22 * fVar269 * fVar26;
    local_6e0._28_4_ = fStack_524 + fVar196;
    auVar50._4_4_ = fVar330 * local_6e0._4_4_;
    auVar50._0_4_ = fVar320 * local_6e0._0_4_;
    auVar50._8_4_ = fVar332 * local_6e0._8_4_;
    auVar50._12_4_ = fVar334 * local_6e0._12_4_;
    auVar50._16_4_ = fVar336 * local_6e0._16_4_;
    auVar50._20_4_ = fVar338 * local_6e0._20_4_;
    auVar50._24_4_ = fVar340 * local_6e0._24_4_;
    auVar50._28_4_ = fVar196;
    auVar16 = vsubps_avx(auVar354,auVar50);
    auVar51._4_4_ = local_6e0._4_4_ * local_6e0._4_4_;
    auVar51._0_4_ = local_6e0._0_4_ * local_6e0._0_4_;
    auVar51._8_4_ = local_6e0._8_4_ * local_6e0._8_4_;
    auVar51._12_4_ = local_6e0._12_4_ * local_6e0._12_4_;
    auVar51._16_4_ = local_6e0._16_4_ * local_6e0._16_4_;
    auVar51._20_4_ = local_6e0._20_4_ * local_6e0._20_4_;
    auVar51._24_4_ = local_6e0._24_4_ * local_6e0._24_4_;
    auVar51._28_4_ = local_6e0._28_4_;
    local_640 = vsubps_avx(auVar373,auVar51);
    _local_560 = vsqrtps_avx(auVar121);
    fVar196 = (local_560._0_4_ + (float)local_a40._0_4_) * 1.0000002;
    fVar129 = (local_560._4_4_ + (float)local_a40._4_4_) * 1.0000002;
    fVar131 = (local_560._8_4_ + fStack_a38) * 1.0000002;
    fVar133 = (local_560._12_4_ + fStack_a34) * 1.0000002;
    fVar134 = (local_560._16_4_ + fStack_a30) * 1.0000002;
    fVar135 = (local_560._20_4_ + fStack_a2c) * 1.0000002;
    fVar136 = (local_560._24_4_ + fStack_a28) * 1.0000002;
    auVar52._4_4_ = fVar129 * fVar129;
    auVar52._0_4_ = fVar196 * fVar196;
    auVar52._8_4_ = fVar131 * fVar131;
    auVar52._12_4_ = fVar133 * fVar133;
    auVar52._16_4_ = fVar134 * fVar134;
    auVar52._20_4_ = fVar135 * fVar135;
    auVar52._24_4_ = fVar136 * fVar136;
    auVar52._28_4_ = local_560._28_4_ + fStack_a24;
    fVar371 = auVar16._0_4_ + auVar16._0_4_;
    fVar377 = auVar16._4_4_ + auVar16._4_4_;
    local_580._0_8_ = CONCAT44(fVar377,fVar371);
    local_580._8_4_ = auVar16._8_4_ + auVar16._8_4_;
    local_580._12_4_ = auVar16._12_4_ + auVar16._12_4_;
    local_580._16_4_ = auVar16._16_4_ + auVar16._16_4_;
    local_580._20_4_ = auVar16._20_4_ + auVar16._20_4_;
    local_580._24_4_ = auVar16._24_4_ + auVar16._24_4_;
    local_580._28_4_ = auVar16._28_4_ + auVar16._28_4_;
    auVar16 = vsubps_avx(local_640,auVar52);
    local_5c0._4_4_ = (uint)(fVar330 * fVar330);
    local_5c0._0_4_ = (uint)(fVar320 * fVar320);
    local_5c0._8_4_ = (uint)(fVar332 * fVar332);
    local_5c0._12_4_ = (uint)(fVar334 * fVar334);
    local_5c0._16_4_ = (uint)(fVar336 * fVar336);
    local_5c0._20_4_ = (uint)(fVar338 * fVar338);
    local_5c0._24_4_ = (uint)(fVar340 * fVar340);
    local_5c0._28_4_ = local_6a0._28_4_;
    local_6c0 = vsubps_avx(local_260,local_5c0);
    auVar348 = ZEXT3264(local_6c0);
    local_780._4_4_ = fVar377 * fVar377;
    local_780._0_4_ = fVar371 * fVar371;
    fStack_778 = local_580._8_4_ * local_580._8_4_;
    fStack_774 = local_580._12_4_ * local_580._12_4_;
    fStack_770 = local_580._16_4_ * local_580._16_4_;
    fStack_76c = local_580._20_4_ * local_580._20_4_;
    fStack_768 = local_580._24_4_ * local_580._24_4_;
    fStack_764 = 1.0000002;
    fVar129 = local_6c0._0_4_;
    local_7a0._0_4_ = fVar129 * 4.0;
    fVar131 = local_6c0._4_4_;
    local_7a0._4_4_ = fVar131 * 4.0;
    fVar133 = local_6c0._8_4_;
    fStack_798 = fVar133 * 4.0;
    fVar134 = local_6c0._12_4_;
    fStack_794 = fVar134 * 4.0;
    fVar135 = local_6c0._16_4_;
    fStack_790 = fVar135 * 4.0;
    fVar136 = local_6c0._20_4_;
    fStack_78c = fVar136 * 4.0;
    fVar349 = local_6c0._24_4_;
    fStack_788 = fVar349 * 4.0;
    uStack_784 = 0x40800000;
    auVar53._4_4_ = auVar16._4_4_ * (float)local_7a0._4_4_;
    auVar53._0_4_ = auVar16._0_4_ * (float)local_7a0._0_4_;
    auVar53._8_4_ = auVar16._8_4_ * fStack_798;
    auVar53._12_4_ = auVar16._12_4_ * fStack_794;
    auVar53._16_4_ = auVar16._16_4_ * fStack_790;
    auVar53._20_4_ = auVar16._20_4_ * fStack_78c;
    auVar53._24_4_ = auVar16._24_4_ * fStack_788;
    auVar53._28_4_ = 0x40800000;
    auVar17 = vsubps_avx(_local_780,auVar53);
    auVar121 = vcmpps_avx(auVar17,auVar158,5);
    fVar196 = local_6c0._28_4_;
    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar121 >> 0x7f,0) == '\0') &&
          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar121 >> 0xbf,0) == '\0') &&
        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar121[0x1f])
    {
      auVar226._8_4_ = 0x7f800000;
      auVar226._0_8_ = 0x7f8000007f800000;
      auVar226._12_4_ = 0x7f800000;
      auVar226._16_4_ = 0x7f800000;
      auVar226._20_4_ = 0x7f800000;
      auVar226._24_4_ = 0x7f800000;
      auVar226._28_4_ = 0x7f800000;
      auVar374._8_4_ = 0xff800000;
      auVar374._0_8_ = 0xff800000ff800000;
      auVar374._12_4_ = 0xff800000;
      auVar374._16_4_ = 0xff800000;
      auVar374._20_4_ = 0xff800000;
      auVar374._24_4_ = 0xff800000;
      auVar374._28_4_ = 0xff800000;
      fVar371 = 0.0;
    }
    else {
      auVar325 = vsqrtps_avx(auVar17);
      auVar277._0_4_ = fVar129 + fVar129;
      auVar277._4_4_ = fVar131 + fVar131;
      auVar277._8_4_ = fVar133 + fVar133;
      auVar277._12_4_ = fVar134 + fVar134;
      auVar277._16_4_ = fVar135 + fVar135;
      auVar277._20_4_ = fVar136 + fVar136;
      auVar277._24_4_ = fVar349 + fVar349;
      auVar277._28_4_ = fVar196 + fVar196;
      auVar160 = vrcpps_avx(auVar277);
      auVar158 = vcmpps_avx(auVar17,auVar158,5);
      fVar217 = auVar160._0_4_;
      fVar232 = auVar160._4_4_;
      auVar54._4_4_ = auVar277._4_4_ * fVar232;
      auVar54._0_4_ = auVar277._0_4_ * fVar217;
      fVar234 = auVar160._8_4_;
      auVar54._8_4_ = auVar277._8_4_ * fVar234;
      fVar236 = auVar160._12_4_;
      auVar54._12_4_ = auVar277._12_4_ * fVar236;
      fVar238 = auVar160._16_4_;
      auVar54._16_4_ = auVar277._16_4_ * fVar238;
      fVar240 = auVar160._20_4_;
      auVar54._20_4_ = auVar277._20_4_ * fVar240;
      fVar242 = auVar160._24_4_;
      auVar54._24_4_ = auVar277._24_4_ * fVar242;
      auVar54._28_4_ = auVar17._28_4_;
      auVar159._8_4_ = 0x3f800000;
      auVar159._0_8_ = &DAT_3f8000003f800000;
      auVar159._12_4_ = 0x3f800000;
      auVar159._16_4_ = 0x3f800000;
      auVar159._20_4_ = 0x3f800000;
      auVar159._24_4_ = 0x3f800000;
      auVar159._28_4_ = 0x3f800000;
      auVar17 = vsubps_avx(auVar159,auVar54);
      fVar217 = fVar217 + fVar217 * auVar17._0_4_;
      fVar232 = fVar232 + fVar232 * auVar17._4_4_;
      fVar234 = fVar234 + fVar234 * auVar17._8_4_;
      fVar236 = fVar236 + fVar236 * auVar17._12_4_;
      fVar238 = fVar238 + fVar238 * auVar17._16_4_;
      fVar240 = fVar240 + fVar240 * auVar17._20_4_;
      fVar242 = fVar242 + fVar242 * auVar17._24_4_;
      auVar278._0_8_ = CONCAT44(fVar377,fVar371) ^ 0x8000000080000000;
      auVar278._8_4_ = -local_580._8_4_;
      auVar278._12_4_ = -local_580._12_4_;
      auVar278._16_4_ = -local_580._16_4_;
      auVar278._20_4_ = -local_580._20_4_;
      auVar278._24_4_ = -local_580._24_4_;
      auVar278._28_4_ = -local_580._28_4_;
      auVar18 = vsubps_avx(auVar278,auVar325);
      fVar371 = auVar18._0_4_ * fVar217;
      fVar377 = auVar18._4_4_ * fVar232;
      auVar55._4_4_ = fVar377;
      auVar55._0_4_ = fVar371;
      fVar285 = auVar18._8_4_ * fVar234;
      auVar55._8_4_ = fVar285;
      fVar289 = auVar18._12_4_ * fVar236;
      auVar55._12_4_ = fVar289;
      fVar293 = auVar18._16_4_ * fVar238;
      auVar55._16_4_ = fVar293;
      fVar297 = auVar18._20_4_ * fVar240;
      auVar55._20_4_ = fVar297;
      fVar301 = auVar18._24_4_ * fVar242;
      auVar55._24_4_ = fVar301;
      auVar55._28_4_ = auVar18._28_4_;
      auVar325 = vsubps_avx(auVar325,local_580);
      fVar217 = auVar325._0_4_ * fVar217;
      fVar232 = auVar325._4_4_ * fVar232;
      auVar56._4_4_ = fVar232;
      auVar56._0_4_ = fVar217;
      fVar234 = auVar325._8_4_ * fVar234;
      auVar56._8_4_ = fVar234;
      fVar236 = auVar325._12_4_ * fVar236;
      auVar56._12_4_ = fVar236;
      fVar238 = auVar325._16_4_ * fVar238;
      auVar56._16_4_ = fVar238;
      fVar240 = auVar325._20_4_ * fVar240;
      auVar56._20_4_ = fVar240;
      fVar242 = auVar325._24_4_ * fVar242;
      auVar56._24_4_ = fVar242;
      auVar56._28_4_ = auVar325._28_4_;
      fStack_4c4 = local_6e0._28_4_ + auVar160._28_4_ + auVar17._28_4_;
      local_4e0[0] = fVar231 * (local_6e0._0_4_ + fVar320 * fVar371);
      local_4e0[1] = fVar264 * (local_6e0._4_4_ + fVar330 * fVar377);
      local_4e0[2] = fVar291 * (local_6e0._8_4_ + fVar332 * fVar285);
      local_4e0[3] = fVar315 * (local_6e0._12_4_ + fVar334 * fVar289);
      fStack_4d0 = fVar335 * (local_6e0._16_4_ + fVar336 * fVar293);
      fStack_4cc = fVar383 * (local_6e0._20_4_ + fVar338 * fVar297);
      fStack_4c8 = fVar269 * (local_6e0._24_4_ + fVar340 * fVar301);
      local_a40._4_4_ = fVar330;
      local_a40._0_4_ = fVar320;
      fStack_a38 = fVar332;
      fStack_a34 = fVar334;
      fStack_a30 = fVar336;
      fStack_a2c = fVar338;
      fStack_a28 = fVar340;
      fStack_a24 = fVar342;
      local_500[0] = fVar231 * (local_6e0._0_4_ + fVar320 * fVar217);
      local_500[1] = fVar264 * (local_6e0._4_4_ + fVar330 * fVar232);
      local_500[2] = fVar291 * (local_6e0._8_4_ + fVar332 * fVar234);
      local_500[3] = fVar315 * (local_6e0._12_4_ + fVar334 * fVar236);
      fStack_4f0 = fVar335 * (local_6e0._16_4_ + fVar336 * fVar238);
      fStack_4ec = fVar383 * (local_6e0._20_4_ + fVar338 * fVar240);
      fStack_4e8 = fVar269 * (local_6e0._24_4_ + fVar340 * fVar242);
      fStack_4e4 = local_6e0._28_4_ + fStack_4c4;
      auVar227._8_4_ = 0x7f800000;
      auVar227._0_8_ = 0x7f8000007f800000;
      auVar227._12_4_ = 0x7f800000;
      auVar227._16_4_ = 0x7f800000;
      auVar227._20_4_ = 0x7f800000;
      auVar227._24_4_ = 0x7f800000;
      auVar227._28_4_ = 0x7f800000;
      auVar226 = vblendvps_avx(auVar227,auVar55,auVar158);
      auVar310._8_4_ = 0x7fffffff;
      auVar310._0_8_ = 0x7fffffff7fffffff;
      auVar310._12_4_ = 0x7fffffff;
      auVar310._16_4_ = 0x7fffffff;
      auVar310._20_4_ = 0x7fffffff;
      auVar310._24_4_ = 0x7fffffff;
      auVar310._28_4_ = 0x7fffffff;
      auVar17 = vandps_avx(local_5c0,auVar310);
      auVar17 = vmaxps_avx(local_400,auVar17);
      auVar57._4_4_ = auVar17._4_4_ * 1.9073486e-06;
      auVar57._0_4_ = auVar17._0_4_ * 1.9073486e-06;
      auVar57._8_4_ = auVar17._8_4_ * 1.9073486e-06;
      auVar57._12_4_ = auVar17._12_4_ * 1.9073486e-06;
      auVar57._16_4_ = auVar17._16_4_ * 1.9073486e-06;
      auVar57._20_4_ = auVar17._20_4_ * 1.9073486e-06;
      auVar57._24_4_ = auVar17._24_4_ * 1.9073486e-06;
      auVar57._28_4_ = auVar17._28_4_;
      auVar17 = vandps_avx(local_6c0,auVar310);
      auVar17 = vcmpps_avx(auVar17,auVar57,1);
      auVar279._8_4_ = 0xff800000;
      auVar279._0_8_ = 0xff800000ff800000;
      auVar279._12_4_ = 0xff800000;
      auVar279._16_4_ = 0xff800000;
      auVar279._20_4_ = 0xff800000;
      auVar279._24_4_ = 0xff800000;
      auVar279._28_4_ = 0xff800000;
      auVar374 = vblendvps_avx(auVar279,auVar56,auVar158);
      auVar160 = auVar158 & auVar17;
      fVar371 = local_6e0._28_4_;
      if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar160 >> 0x7f,0) != '\0') ||
            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar160 >> 0xbf,0) != '\0') ||
          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar160[0x1f] < '\0') {
        auVar121 = vandps_avx(auVar17,auVar158);
        auVar144 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar17 = vcmpps_avx(auVar16,ZEXT832(0) << 0x20,2);
        auVar404._8_4_ = 0xff800000;
        auVar404._0_8_ = 0xff800000ff800000;
        auVar404._12_4_ = 0xff800000;
        auVar404._16_4_ = 0xff800000;
        auVar404._20_4_ = 0xff800000;
        auVar404._24_4_ = 0xff800000;
        auVar404._28_4_ = 0xff800000;
        auVar327._8_4_ = 0x7f800000;
        auVar327._0_8_ = 0x7f8000007f800000;
        auVar327._12_4_ = 0x7f800000;
        auVar327._16_4_ = 0x7f800000;
        auVar327._20_4_ = 0x7f800000;
        auVar327._24_4_ = 0x7f800000;
        auVar327._28_4_ = 0x7f800000;
        auVar16 = vblendvps_avx(auVar327,auVar404,auVar17);
        auVar107 = vpmovsxwd_avx(auVar144);
        auVar144 = vpunpckhwd_avx(auVar144,auVar144);
        auVar261._16_16_ = auVar144;
        auVar261._0_16_ = auVar107;
        auVar226 = vblendvps_avx(auVar226,auVar16,auVar261);
        auVar16 = vblendvps_avx(auVar404,auVar327,auVar17);
        auVar374 = vblendvps_avx(auVar374,auVar16,auVar261);
        auVar16 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar125._0_4_ = auVar121._0_4_ ^ auVar16._0_4_;
        auVar125._4_4_ = auVar121._4_4_ ^ auVar16._4_4_;
        auVar125._8_4_ = auVar121._8_4_ ^ auVar16._8_4_;
        auVar125._12_4_ = auVar121._12_4_ ^ auVar16._12_4_;
        auVar125._16_4_ = auVar121._16_4_ ^ auVar16._16_4_;
        auVar125._20_4_ = auVar121._20_4_ ^ auVar16._20_4_;
        auVar125._24_4_ = auVar121._24_4_ ^ auVar16._24_4_;
        auVar125._28_4_ = auVar121._28_4_ ^ auVar16._28_4_;
        auVar121 = vorps_avx(auVar17,auVar125);
        auVar121 = vandps_avx(auVar158,auVar121);
      }
    }
    auVar375 = ZEXT3264(auVar374);
    auVar355 = ZEXT3264(local_6e0);
    auVar16 = local_280 & auVar121;
    auVar251._8_4_ = 0x3f800000;
    auVar251._0_8_ = &DAT_3f8000003f800000;
    auVar251._12_4_ = 0x3f800000;
    auVar251._16_4_ = 0x3f800000;
    auVar251._20_4_ = 0x3f800000;
    auVar251._24_4_ = 0x3f800000;
    auVar251._28_4_ = 0x3f800000;
    auVar262 = ZEXT3264(auVar251);
    auVar282 = ZEXT3264(_local_820);
    auVar312 = ZEXT1664(local_900);
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      local_a40._4_4_ = fVar330;
      local_a40._0_4_ = fVar320;
      fStack_a38 = fVar332;
      fStack_a34 = fVar334;
      fStack_a30 = fVar336;
      fStack_a2c = fVar338;
      fStack_a28 = fVar340;
      fStack_a24 = fVar342;
      auVar144 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7c0._0_4_));
      auVar144 = vshufps_avx(auVar144,auVar144,0);
      auVar252._16_16_ = auVar144;
      auVar252._0_16_ = auVar144;
      auVar17 = vmaxps_avx(auVar252,auVar226);
      auVar144 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7c0._0_4_));
      auVar144 = vshufps_avx(auVar144,auVar144,0);
      auVar253._16_16_ = auVar144;
      auVar253._0_16_ = auVar144;
      auVar158 = vminps_avx(auVar253,auVar374);
      fVar238 = auVar157._28_4_;
      auVar191._0_4_ = local_520 * fVar270 + local_540 * fVar370 + fVar384 * local_620;
      auVar191._4_4_ = fStack_51c * fVar283 + fStack_53c * fVar376 + fVar389 * fStack_61c;
      auVar191._8_4_ = fStack_518 * fVar284 + fStack_538 * fVar378 + fVar391 * fStack_618;
      auVar191._12_4_ = fStack_514 * fVar288 + fStack_534 * fVar379 + fVar393 * fStack_614;
      auVar191._16_4_ = fStack_510 * fVar292 + fStack_530 * fVar380 + fVar395 * fStack_610;
      auVar191._20_4_ = fStack_50c * fVar296 + fStack_52c * fVar381 + fVar397 * fStack_60c;
      auVar191._24_4_ = fStack_508 * fVar300 + fStack_528 * fVar382 + fVar399 * fStack_608;
      auVar191._28_4_ = fVar302 + fStack_184 + fVar238;
      auVar157 = vrcpps_avx(auVar191);
      fVar302 = auVar157._0_4_;
      fVar342 = auVar157._4_4_;
      auVar58._4_4_ = auVar191._4_4_ * fVar342;
      auVar58._0_4_ = auVar191._0_4_ * fVar302;
      fVar377 = auVar157._8_4_;
      auVar58._8_4_ = auVar191._8_4_ * fVar377;
      fVar217 = auVar157._12_4_;
      auVar58._12_4_ = auVar191._12_4_ * fVar217;
      fVar232 = auVar157._16_4_;
      auVar58._16_4_ = auVar191._16_4_ * fVar232;
      fVar234 = auVar157._20_4_;
      auVar58._20_4_ = auVar191._20_4_ * fVar234;
      fVar236 = auVar157._24_4_;
      auVar58._24_4_ = auVar191._24_4_ * fVar236;
      auVar58._28_4_ = fStack_184;
      auVar16 = vsubps_avx(auVar251,auVar58);
      auVar311._8_4_ = 0x7fffffff;
      auVar311._0_8_ = 0x7fffffff7fffffff;
      auVar311._12_4_ = 0x7fffffff;
      auVar311._16_4_ = 0x7fffffff;
      auVar311._20_4_ = 0x7fffffff;
      auVar311._24_4_ = 0x7fffffff;
      auVar311._28_4_ = 0x7fffffff;
      auVar157 = vandps_avx(auVar191,auVar311);
      auVar347._8_4_ = 0x219392ef;
      auVar347._0_8_ = 0x219392ef219392ef;
      auVar347._12_4_ = 0x219392ef;
      auVar347._16_4_ = 0x219392ef;
      auVar347._20_4_ = 0x219392ef;
      auVar347._24_4_ = 0x219392ef;
      auVar347._28_4_ = 0x219392ef;
      auVar348 = ZEXT3264(auVar347);
      auVar157 = vcmpps_avx(auVar157,auVar347,1);
      auVar362 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar59._4_4_ =
           (fVar342 + fVar342 * auVar16._4_4_) *
           -(fVar363 * fVar283 + fVar376 * fVar263 + fVar389 * fVar243);
      auVar59._0_4_ =
           (fVar302 + fVar302 * auVar16._0_4_) *
           -(fVar356 * fVar270 + fVar370 * fVar216 + fVar384 * fVar215);
      auVar59._8_4_ =
           (fVar377 + fVar377 * auVar16._8_4_) *
           -(fVar364 * fVar284 + fVar378 * fVar290 + fVar391 * fVar287);
      auVar59._12_4_ =
           (fVar217 + fVar217 * auVar16._12_4_) *
           -(fVar365 * fVar288 + fVar379 * fVar314 + fVar393 * fVar313);
      auVar59._16_4_ =
           (fVar232 + fVar232 * auVar16._16_4_) *
           -(fVar366 * fVar292 + fVar380 * fVar333 + fVar395 * fVar331);
      auVar59._20_4_ =
           (fVar234 + fVar234 * auVar16._20_4_) *
           -(fVar367 * fVar296 + fVar381 * fVar20 + fVar397 * fVar369);
      auVar59._24_4_ =
           (fVar236 + fVar236 * auVar16._24_4_) *
           -(fVar368 * fVar300 + fVar382 * fVar27 + fVar399 * fVar26);
      auVar59._28_4_ = -(fVar238 + fVar371 + fVar238);
      auVar325 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar16 = vcmpps_avx(auVar191,auVar325,1);
      auVar160 = vorps_avx(auVar157,auVar16);
      auVar16 = vcmpps_avx(auVar191,auVar325,6);
      auVar16 = vorps_avx(auVar157,auVar16);
      local_600._8_4_ = 0xff800000;
      local_600._0_8_ = 0xff800000ff800000;
      local_600._12_4_ = 0xff800000;
      local_600._16_4_ = 0xff800000;
      local_600._20_4_ = 0xff800000;
      local_600._24_4_ = 0xff800000;
      local_600._28_4_ = 0xff800000;
      auVar157 = vblendvps_avx(auVar59,local_600,auVar160);
      auVar403._8_4_ = 0x7f800000;
      auVar403._0_8_ = 0x7f8000007f800000;
      auVar403._12_4_ = 0x7f800000;
      auVar403._16_4_ = 0x7f800000;
      auVar403._20_4_ = 0x7f800000;
      auVar403._24_4_ = 0x7f800000;
      auVar403._28_4_ = 0x7f800000;
      auVar16 = vblendvps_avx(auVar59,auVar403,auVar16);
      auVar17 = vmaxps_avx(auVar17,auVar157);
      auVar158 = vminps_avx(auVar158,auVar16);
      auVar160 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar157 = vsubps_avx(auVar160,_local_880);
      auVar16 = vsubps_avx(auVar160,local_8a0);
      auVar60._4_4_ = auVar16._4_4_ * -fVar390;
      auVar60._0_4_ = auVar16._0_4_ * -fVar385;
      auVar60._8_4_ = auVar16._8_4_ * -fVar392;
      auVar60._12_4_ = auVar16._12_4_ * -fVar394;
      auVar60._16_4_ = auVar16._16_4_ * -fVar396;
      auVar60._20_4_ = auVar16._20_4_ * -fVar398;
      auVar60._24_4_ = auVar16._24_4_ * -fVar400;
      auVar60._28_4_ = auVar16._28_4_;
      auVar61._4_4_ = fVar239 * auVar157._4_4_;
      auVar61._0_4_ = fVar213 * auVar157._0_4_;
      auVar61._8_4_ = fVar268 * auVar157._8_4_;
      auVar61._12_4_ = fVar299 * auVar157._12_4_;
      auVar61._16_4_ = fVar319 * auVar157._16_4_;
      auVar61._20_4_ = fVar350 * auVar157._20_4_;
      auVar61._24_4_ = fVar24 * auVar157._24_4_;
      auVar61._28_4_ = auVar157._28_4_;
      auVar157 = vsubps_avx(auVar60,auVar61);
      auVar16 = vsubps_avx(auVar160,local_920);
      auVar62._4_4_ = fVar241 * auVar16._4_4_;
      auVar62._0_4_ = fVar214 * auVar16._0_4_;
      auVar62._8_4_ = fVar286 * auVar16._8_4_;
      auVar62._12_4_ = fVar303 * auVar16._12_4_;
      auVar62._16_4_ = fVar329 * auVar16._16_4_;
      auVar62._20_4_ = fVar351 * auVar16._20_4_;
      uVar1 = auVar16._28_4_;
      auVar62._24_4_ = fVar25 * auVar16._24_4_;
      auVar62._28_4_ = uVar1;
      auVar160 = vsubps_avx(auVar157,auVar62);
      auVar63._4_4_ = -fVar390 * fStack_61c;
      auVar63._0_4_ = -fVar385 * local_620;
      auVar63._8_4_ = -fVar392 * fStack_618;
      auVar63._12_4_ = -fVar394 * fStack_614;
      auVar63._16_4_ = -fVar396 * fStack_610;
      auVar63._20_4_ = -fVar398 * fStack_60c;
      auVar63._24_4_ = -fVar400 * fStack_608;
      auVar63._28_4_ = uVar95 ^ 0x80000000;
      auVar64._4_4_ = fStack_53c * fVar239;
      auVar64._0_4_ = local_540 * fVar213;
      auVar64._8_4_ = fStack_538 * fVar268;
      auVar64._12_4_ = fStack_534 * fVar299;
      auVar64._16_4_ = fStack_530 * fVar319;
      auVar64._20_4_ = fStack_52c * fVar350;
      auVar64._24_4_ = fStack_528 * fVar24;
      auVar64._28_4_ = uVar1;
      auVar259._8_4_ = 0x3f800000;
      auVar259._0_8_ = &DAT_3f8000003f800000;
      auVar259._12_4_ = 0x3f800000;
      auVar259._16_4_ = 0x3f800000;
      auVar259._20_4_ = 0x3f800000;
      auVar259._24_4_ = 0x3f800000;
      auVar259._28_4_ = 0x3f800000;
      auVar157 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = fStack_51c * fVar241;
      auVar65._0_4_ = local_520 * fVar214;
      auVar65._8_4_ = fStack_518 * fVar286;
      auVar65._12_4_ = fStack_514 * fVar303;
      auVar65._16_4_ = fStack_510 * fVar329;
      auVar65._20_4_ = fStack_50c * fVar351;
      auVar65._24_4_ = fStack_508 * fVar25;
      auVar65._28_4_ = uVar1;
      auVar325 = vsubps_avx(auVar157,auVar65);
      auVar157 = vrcpps_avx(auVar325);
      fVar213 = auVar157._0_4_;
      fVar214 = auVar157._4_4_;
      auVar66._4_4_ = auVar325._4_4_ * fVar214;
      auVar66._0_4_ = auVar325._0_4_ * fVar213;
      fVar215 = auVar157._8_4_;
      auVar66._8_4_ = auVar325._8_4_ * fVar215;
      fVar216 = auVar157._12_4_;
      auVar66._12_4_ = auVar325._12_4_ * fVar216;
      fVar239 = auVar157._16_4_;
      auVar66._16_4_ = auVar325._16_4_ * fVar239;
      fVar241 = auVar157._20_4_;
      auVar66._20_4_ = auVar325._20_4_ * fVar241;
      fVar243 = auVar157._24_4_;
      auVar66._24_4_ = auVar325._24_4_ * fVar243;
      auVar66._28_4_ = local_9c0._28_4_;
      auVar18 = vsubps_avx(auVar259,auVar66);
      auVar157 = vandps_avx(auVar325,auVar311);
      auVar16 = vcmpps_avx(auVar157,auVar347,1);
      auVar67._4_4_ = (fVar214 + fVar214 * auVar18._4_4_) * -auVar160._4_4_;
      auVar67._0_4_ = (fVar213 + fVar213 * auVar18._0_4_) * -auVar160._0_4_;
      auVar67._8_4_ = (fVar215 + fVar215 * auVar18._8_4_) * -auVar160._8_4_;
      auVar67._12_4_ = (fVar216 + fVar216 * auVar18._12_4_) * -auVar160._12_4_;
      auVar67._16_4_ = (fVar239 + fVar239 * auVar18._16_4_) * -auVar160._16_4_;
      auVar67._20_4_ = (fVar241 + fVar241 * auVar18._20_4_) * -auVar160._20_4_;
      auVar67._24_4_ = (fVar243 + fVar243 * auVar18._24_4_) * -auVar160._24_4_;
      auVar67._28_4_ = auVar160._28_4_ ^ 0x80000000;
      auVar157 = vcmpps_avx(auVar325,ZEXT832(0) << 0x20,1);
      auVar157 = vorps_avx(auVar16,auVar157);
      auVar157 = vblendvps_avx(auVar67,local_600,auVar157);
      local_420 = vmaxps_avx(auVar17,auVar157);
      auVar157 = vcmpps_avx(auVar325,ZEXT832(0) << 0x20,6);
      auVar157 = vorps_avx(auVar16,auVar157);
      auVar157 = vblendvps_avx(auVar67,auVar403,auVar157);
      auVar121 = vandps_avx(local_280,auVar121);
      local_480 = vminps_avx(auVar158,auVar157);
      auVar157 = vcmpps_avx(local_420,local_480,2);
      auVar16 = auVar121 & auVar157;
      auVar17 = auVar259;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar16 >> 0x7f,0) == '\0') &&
            (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar16 >> 0xbf,0) == '\0') &&
          (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar16[0x1f])
      {
LAB_01197d72:
        auVar375 = ZEXT3264(local_600);
        auVar355 = ZEXT3264(auVar17);
        auVar282 = ZEXT3264(_local_820);
      }
      else {
        auVar16 = vminps_avx(local_700,_local_760);
        auVar17 = vminps_avx(local_720,local_740);
        auVar16 = vminps_avx(auVar16,auVar17);
        auVar16 = vsubps_avx(auVar16,_local_560);
        auVar121 = vandps_avx(auVar157,auVar121);
        auVar94._4_4_ = local_4e0[1];
        auVar94._0_4_ = local_4e0[0];
        auVar94._8_4_ = local_4e0[2];
        auVar94._12_4_ = local_4e0[3];
        auVar94._16_4_ = fStack_4d0;
        auVar94._20_4_ = fStack_4cc;
        auVar94._24_4_ = fStack_4c8;
        auVar94._28_4_ = fStack_4c4;
        auVar157 = vminps_avx(auVar94,auVar259);
        auVar157 = vmaxps_avx(auVar157,ZEXT832(0) << 0x20);
        local_4e0[0] = fVar102 + fVar137 * (auVar157._0_4_ + 0.0) * 0.125;
        local_4e0[1] = fVar128 + fVar174 * (auVar157._4_4_ + 1.0) * 0.125;
        local_4e0[2] = fVar130 + fVar175 * (auVar157._8_4_ + 2.0) * 0.125;
        local_4e0[3] = fVar132 + fVar177 * (auVar157._12_4_ + 3.0) * 0.125;
        fStack_4d0 = fVar102 + fVar137 * (auVar157._16_4_ + 4.0) * 0.125;
        fStack_4cc = fVar128 + fVar174 * (auVar157._20_4_ + 5.0) * 0.125;
        fStack_4c8 = fVar130 + fVar175 * (auVar157._24_4_ + 6.0) * 0.125;
        fStack_4c4 = fVar132 + auVar157._28_4_ + 7.0;
        auVar93._4_4_ = local_500[1];
        auVar93._0_4_ = local_500[0];
        auVar93._8_4_ = local_500[2];
        auVar93._12_4_ = local_500[3];
        auVar93._16_4_ = fStack_4f0;
        auVar93._20_4_ = fStack_4ec;
        auVar93._24_4_ = fStack_4e8;
        auVar93._28_4_ = fStack_4e4;
        auVar157 = vminps_avx(auVar93,auVar259);
        auVar157 = vmaxps_avx(auVar157,ZEXT832(0) << 0x20);
        local_500[0] = fVar102 + fVar137 * (auVar157._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar128 + fVar174 * (auVar157._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar130 + fVar175 * (auVar157._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar132 + fVar177 * (auVar157._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar102 + fVar137 * (auVar157._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar128 + fVar174 * (auVar157._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar130 + fVar175 * (auVar157._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar132 + auVar157._28_4_ + 7.0;
        auVar68._4_4_ = auVar16._4_4_ * 0.99999976;
        auVar68._0_4_ = auVar16._0_4_ * 0.99999976;
        auVar68._8_4_ = auVar16._8_4_ * 0.99999976;
        auVar68._12_4_ = auVar16._12_4_ * 0.99999976;
        auVar68._16_4_ = auVar16._16_4_ * 0.99999976;
        auVar68._20_4_ = auVar16._20_4_ * 0.99999976;
        auVar68._24_4_ = auVar16._24_4_ * 0.99999976;
        auVar68._28_4_ = 0x3f7ffffc;
        auVar157 = vmaxps_avx(ZEXT832(0) << 0x20,auVar68);
        auVar69._4_4_ = auVar157._4_4_ * auVar157._4_4_;
        auVar69._0_4_ = auVar157._0_4_ * auVar157._0_4_;
        auVar69._8_4_ = auVar157._8_4_ * auVar157._8_4_;
        auVar69._12_4_ = auVar157._12_4_ * auVar157._12_4_;
        auVar69._16_4_ = auVar157._16_4_ * auVar157._16_4_;
        auVar69._20_4_ = auVar157._20_4_ * auVar157._20_4_;
        auVar69._24_4_ = auVar157._24_4_ * auVar157._24_4_;
        auVar69._28_4_ = auVar157._28_4_;
        auVar16 = vsubps_avx(local_640,auVar69);
        auVar70._4_4_ = auVar16._4_4_ * (float)local_7a0._4_4_;
        auVar70._0_4_ = auVar16._0_4_ * (float)local_7a0._0_4_;
        auVar70._8_4_ = auVar16._8_4_ * fStack_798;
        auVar70._12_4_ = auVar16._12_4_ * fStack_794;
        auVar70._16_4_ = auVar16._16_4_ * fStack_790;
        auVar70._20_4_ = auVar16._20_4_ * fStack_78c;
        auVar70._24_4_ = auVar16._24_4_ * fStack_788;
        auVar70._28_4_ = auVar157._28_4_;
        auVar17 = vsubps_avx(_local_780,auVar70);
        auVar157 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,5);
        if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar157 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar157 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar157 >> 0x7f,0) == '\0') &&
              (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar157 >> 0xbf,0) == '\0') &&
            (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar157[0x1f]) {
          auVar160 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_6a0 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          _local_660 = ZEXT832(0) << 0x20;
          auVar202 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar348 = ZEXT864(0) << 0x20;
          auVar228._8_4_ = 0x7f800000;
          auVar228._0_8_ = 0x7f8000007f800000;
          auVar228._12_4_ = 0x7f800000;
          auVar228._16_4_ = 0x7f800000;
          auVar228._20_4_ = 0x7f800000;
          auVar228._24_4_ = 0x7f800000;
          auVar228._28_4_ = 0x7f800000;
          auVar254._8_4_ = 0xff800000;
          auVar254._0_8_ = 0xff800000ff800000;
          auVar254._12_4_ = 0xff800000;
          auVar254._16_4_ = 0xff800000;
          auVar254._20_4_ = 0xff800000;
          auVar254._24_4_ = 0xff800000;
          auVar254._28_4_ = 0xff800000;
        }
        else {
          local_920 = auVar16;
          local_9a0 = auVar157;
          _local_880 = auVar121;
          auVar160 = vsqrtps_avx(auVar17);
          auVar207._0_4_ = fVar129 + fVar129;
          auVar207._4_4_ = fVar131 + fVar131;
          auVar207._8_4_ = fVar133 + fVar133;
          auVar207._12_4_ = fVar134 + fVar134;
          auVar207._16_4_ = fVar135 + fVar135;
          auVar207._20_4_ = fVar136 + fVar136;
          auVar207._24_4_ = fVar349 + fVar349;
          auVar207._28_4_ = fVar196 + fVar196;
          auVar158 = vrcpps_avx(auVar207);
          fVar196 = auVar158._0_4_;
          fVar213 = auVar158._4_4_;
          auVar71._4_4_ = auVar207._4_4_ * fVar213;
          auVar71._0_4_ = auVar207._0_4_ * fVar196;
          fVar214 = auVar158._8_4_;
          auVar71._8_4_ = auVar207._8_4_ * fVar214;
          fVar215 = auVar158._12_4_;
          auVar71._12_4_ = auVar207._12_4_ * fVar215;
          fVar216 = auVar158._16_4_;
          auVar71._16_4_ = auVar207._16_4_ * fVar216;
          fVar239 = auVar158._20_4_;
          auVar71._20_4_ = auVar207._20_4_ * fVar239;
          fVar241 = auVar158._24_4_;
          auVar71._24_4_ = auVar207._24_4_ * fVar241;
          auVar71._28_4_ = auVar207._28_4_;
          auVar325 = vsubps_avx(auVar259,auVar71);
          fVar196 = fVar196 + fVar196 * auVar325._0_4_;
          fVar213 = fVar213 + fVar213 * auVar325._4_4_;
          fVar214 = fVar214 + fVar214 * auVar325._8_4_;
          fVar215 = fVar215 + fVar215 * auVar325._12_4_;
          fVar216 = fVar216 + fVar216 * auVar325._16_4_;
          fVar239 = fVar239 + fVar239 * auVar325._20_4_;
          fVar241 = fVar241 + fVar241 * auVar325._24_4_;
          fVar243 = auVar158._28_4_ + auVar325._28_4_;
          auVar255._0_8_ = local_580._0_8_ ^ 0x8000000080000000;
          auVar255._8_4_ = -local_580._8_4_;
          auVar255._12_4_ = -local_580._12_4_;
          auVar255._16_4_ = -local_580._16_4_;
          auVar255._20_4_ = -local_580._20_4_;
          auVar255._24_4_ = -local_580._24_4_;
          auVar255._28_4_ = -local_580._28_4_;
          auVar158 = vsubps_avx(auVar255,auVar160);
          fVar313 = auVar158._0_4_ * fVar196;
          fVar314 = auVar158._4_4_ * fVar213;
          auVar72._4_4_ = fVar314;
          auVar72._0_4_ = fVar313;
          fVar319 = auVar158._8_4_ * fVar214;
          auVar72._8_4_ = fVar319;
          fVar329 = auVar158._12_4_ * fVar215;
          auVar72._12_4_ = fVar329;
          fVar331 = auVar158._16_4_ * fVar216;
          auVar72._16_4_ = fVar331;
          fVar333 = auVar158._20_4_ * fVar239;
          auVar72._20_4_ = fVar333;
          fVar350 = auVar158._24_4_ * fVar241;
          auVar72._24_4_ = fVar350;
          auVar72._28_4_ = local_280._28_4_;
          auVar160 = vsubps_avx(auVar160,local_580);
          fVar196 = auVar160._0_4_ * fVar196;
          fVar213 = auVar160._4_4_ * fVar213;
          auVar73._4_4_ = fVar213;
          auVar73._0_4_ = fVar196;
          fVar214 = auVar160._8_4_ * fVar214;
          auVar73._8_4_ = fVar214;
          fVar215 = auVar160._12_4_ * fVar215;
          auVar73._12_4_ = fVar215;
          fVar216 = auVar160._16_4_ * fVar216;
          auVar73._16_4_ = fVar216;
          fVar239 = auVar160._20_4_ * fVar239;
          auVar73._20_4_ = fVar239;
          fVar241 = auVar160._24_4_ * fVar241;
          auVar73._24_4_ = fVar241;
          auVar73._28_4_ = 0xff800000;
          fVar263 = fVar231 * (fVar313 * fVar320 + local_6e0._0_4_);
          fVar268 = fVar264 * (fVar314 * fVar330 + local_6e0._4_4_);
          fVar286 = fVar291 * (fVar319 * fVar332 + local_6e0._8_4_);
          fVar287 = fVar315 * (fVar329 * fVar334 + local_6e0._12_4_);
          fVar290 = fVar335 * (fVar331 * fVar336 + local_6e0._16_4_);
          fVar299 = fVar383 * (fVar333 * fVar338 + local_6e0._20_4_);
          fVar303 = fVar269 * (fVar350 * fVar340 + local_6e0._24_4_);
          auVar161._0_4_ = local_a60 + fVar212 * fVar263;
          auVar161._4_4_ = fStack_a5c + fVar237 * fVar268;
          auVar161._8_4_ = fStack_a58 + fVar267 * fVar286;
          auVar161._12_4_ = fStack_a54 + fVar298 * fVar287;
          auVar161._16_4_ = fStack_a50 + fVar318 * fVar290;
          auVar161._20_4_ = fStack_a4c + fVar341 * fVar299;
          auVar161._24_4_ = fStack_a48 + fVar23 * fVar303;
          auVar161._28_4_ = fStack_a44 + auVar160._28_4_ + local_6e0._28_4_;
          auVar74._4_4_ = fStack_51c * fVar314;
          auVar74._0_4_ = local_520 * fVar313;
          auVar74._8_4_ = fStack_518 * fVar319;
          auVar74._12_4_ = fStack_514 * fVar329;
          auVar74._16_4_ = fStack_510 * fVar331;
          auVar74._20_4_ = fStack_50c * fVar333;
          auVar74._24_4_ = fStack_508 * fVar350;
          auVar74._28_4_ = fVar243;
          auVar160 = vsubps_avx(auVar74,auVar161);
          local_8a0 = auVar160;
          auVar208._0_4_ = local_ac0 + fVar210 * fVar263;
          auVar208._4_4_ = fStack_abc + fVar233 * fVar268;
          auVar208._8_4_ = fStack_ab8 + fVar265 * fVar286;
          auVar208._12_4_ = fStack_ab4 + fVar294 * fVar287;
          auVar208._16_4_ = fStack_ab0 + fVar316 * fVar290;
          auVar208._20_4_ = fStack_aac + fVar337 * fVar299;
          auVar208._24_4_ = fStack_aa8 + fVar21 * fVar303;
          auVar208._28_4_ = fStack_aa4 + fVar243;
          auVar75._4_4_ = fStack_53c * fVar314;
          auVar75._0_4_ = local_540 * fVar313;
          auVar75._8_4_ = fStack_538 * fVar319;
          auVar75._12_4_ = fStack_534 * fVar329;
          auVar75._16_4_ = fStack_530 * fVar331;
          auVar75._20_4_ = fStack_52c * fVar333;
          auVar75._24_4_ = fStack_528 * fVar350;
          auVar75._28_4_ = fVar132;
          local_9e0 = vsubps_avx(auVar75,auVar208);
          auVar256._0_4_ = local_aa0 + fVar211 * fVar263;
          auVar256._4_4_ = fStack_a9c + fVar235 * fVar268;
          auVar256._8_4_ = fStack_a98 + fVar266 * fVar286;
          auVar256._12_4_ = fStack_a94 + fVar295 * fVar287;
          auVar256._16_4_ = fStack_a90 + fVar317 * fVar290;
          auVar256._20_4_ = fStack_a8c + fVar339 * fVar299;
          auVar256._24_4_ = fStack_a88 + fVar22 * fVar303;
          auVar256._28_4_ = fStack_a84 + auVar158._28_4_;
          auVar76._4_4_ = fStack_61c * fVar314;
          auVar76._0_4_ = local_620 * fVar313;
          auVar76._8_4_ = fStack_618 * fVar319;
          auVar76._12_4_ = fStack_614 * fVar329;
          auVar76._16_4_ = fStack_610 * fVar331;
          auVar76._20_4_ = fStack_60c * fVar333;
          auVar76._24_4_ = fStack_608 * fVar350;
          auVar76._28_4_ = fVar132;
          local_840 = vsubps_avx(auVar76,auVar256);
          fVar231 = fVar231 * (fVar196 * fVar320 + local_6e0._0_4_);
          fVar264 = fVar264 * (fVar213 * fVar330 + local_6e0._4_4_);
          fVar291 = fVar291 * (fVar214 * fVar332 + local_6e0._8_4_);
          fVar315 = fVar315 * (fVar215 * fVar334 + local_6e0._12_4_);
          fVar335 = fVar335 * (fVar216 * fVar336 + local_6e0._16_4_);
          fVar383 = fVar383 * (fVar239 * fVar338 + local_6e0._20_4_);
          fVar269 = fVar269 * (fVar241 * fVar340 + local_6e0._24_4_);
          auVar280._0_4_ = local_a60 + fVar212 * fVar231;
          auVar280._4_4_ = fStack_a5c + fVar237 * fVar264;
          auVar280._8_4_ = fStack_a58 + fVar267 * fVar291;
          auVar280._12_4_ = fStack_a54 + fVar298 * fVar315;
          auVar280._16_4_ = fStack_a50 + fVar318 * fVar335;
          auVar280._20_4_ = fStack_a4c + fVar341 * fVar383;
          auVar280._24_4_ = fStack_a48 + fVar23 * fVar269;
          auVar280._28_4_ = fStack_a44 + fVar132;
          auVar77._4_4_ = fStack_51c * fVar213;
          auVar77._0_4_ = local_520 * fVar196;
          auVar77._8_4_ = fStack_518 * fVar214;
          auVar77._12_4_ = fStack_514 * fVar215;
          auVar77._16_4_ = fStack_510 * fVar216;
          auVar77._20_4_ = fStack_50c * fVar239;
          auVar77._24_4_ = fStack_508 * fVar241;
          auVar77._28_4_ = fStack_504;
          _local_6a0 = vsubps_avx(auVar77,auVar280);
          auVar281._0_4_ = local_ac0 + fVar210 * fVar231;
          auVar281._4_4_ = fStack_abc + fVar233 * fVar264;
          auVar281._8_4_ = fStack_ab8 + fVar265 * fVar291;
          auVar281._12_4_ = fStack_ab4 + fVar294 * fVar315;
          auVar281._16_4_ = fStack_ab0 + fVar316 * fVar335;
          auVar281._20_4_ = fStack_aac + fVar337 * fVar383;
          auVar281._24_4_ = fStack_aa8 + fVar21 * fVar269;
          auVar281._28_4_ = fStack_aa4 + local_6a0._28_4_;
          auVar78._4_4_ = fStack_53c * fVar213;
          auVar78._0_4_ = local_540 * fVar196;
          auVar78._8_4_ = fStack_538 * fVar214;
          auVar78._12_4_ = fStack_534 * fVar215;
          auVar78._16_4_ = fStack_530 * fVar216;
          auVar78._20_4_ = fStack_52c * fVar239;
          auVar78._24_4_ = fStack_528 * fVar241;
          auVar78._28_4_ = fStack_504;
          _local_680 = vsubps_avx(auVar78,auVar281);
          auVar257._0_4_ = local_aa0 + fVar211 * fVar231;
          auVar257._4_4_ = fStack_a9c + fVar235 * fVar264;
          auVar257._8_4_ = fStack_a98 + fVar266 * fVar291;
          auVar257._12_4_ = fStack_a94 + fVar295 * fVar315;
          auVar257._16_4_ = fStack_a90 + fVar317 * fVar335;
          auVar257._20_4_ = fStack_a8c + fVar339 * fVar383;
          auVar257._24_4_ = fStack_a88 + fVar22 * fVar269;
          auVar257._28_4_ = fStack_a84 + local_840._28_4_ + local_6e0._28_4_;
          auVar79._4_4_ = fStack_61c * fVar213;
          auVar79._0_4_ = local_620 * fVar196;
          auVar79._8_4_ = fStack_618 * fVar214;
          auVar79._12_4_ = fStack_614 * fVar215;
          auVar79._16_4_ = fStack_610 * fVar216;
          auVar79._20_4_ = fStack_60c * fVar239;
          auVar79._24_4_ = fStack_608 * fVar241;
          auVar79._28_4_ = local_680._28_4_;
          _local_660 = vsubps_avx(auVar79,auVar257);
          auVar158 = vcmpps_avx(auVar17,_DAT_02020f00,5);
          auVar229._8_4_ = 0x7f800000;
          auVar229._0_8_ = 0x7f8000007f800000;
          auVar229._12_4_ = 0x7f800000;
          auVar229._16_4_ = 0x7f800000;
          auVar229._20_4_ = 0x7f800000;
          auVar229._24_4_ = 0x7f800000;
          auVar229._28_4_ = 0x7f800000;
          auVar228 = vblendvps_avx(auVar229,auVar72,auVar158);
          auVar326._8_4_ = 0x7fffffff;
          auVar326._0_8_ = 0x7fffffff7fffffff;
          auVar326._12_4_ = 0x7fffffff;
          auVar326._16_4_ = 0x7fffffff;
          auVar326._20_4_ = 0x7fffffff;
          auVar326._24_4_ = 0x7fffffff;
          auVar326._28_4_ = 0x7fffffff;
          auVar17 = vandps_avx(auVar326,local_5c0);
          auVar17 = vmaxps_avx(local_400,auVar17);
          auVar80._4_4_ = auVar17._4_4_ * 1.9073486e-06;
          auVar80._0_4_ = auVar17._0_4_ * 1.9073486e-06;
          auVar80._8_4_ = auVar17._8_4_ * 1.9073486e-06;
          auVar80._12_4_ = auVar17._12_4_ * 1.9073486e-06;
          auVar80._16_4_ = auVar17._16_4_ * 1.9073486e-06;
          auVar80._20_4_ = auVar17._20_4_ * 1.9073486e-06;
          auVar80._24_4_ = auVar17._24_4_ * 1.9073486e-06;
          auVar80._28_4_ = auVar17._28_4_;
          auVar17 = vandps_avx(auVar326,local_6c0);
          auVar17 = vcmpps_avx(auVar17,auVar80,1);
          auVar258._8_4_ = 0xff800000;
          auVar258._0_8_ = 0xff800000ff800000;
          auVar258._12_4_ = 0xff800000;
          auVar258._16_4_ = 0xff800000;
          auVar258._20_4_ = 0xff800000;
          auVar258._24_4_ = 0xff800000;
          auVar258._28_4_ = 0xff800000;
          auVar254 = vblendvps_avx(auVar258,auVar73,auVar158);
          auVar325 = auVar158 & auVar17;
          if ((((((((auVar325 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar325 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar325 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar325 >> 0x7f,0) != '\0') ||
                (auVar325 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar325 >> 0xbf,0) != '\0') ||
              (auVar325 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar325[0x1f] < '\0') {
            auVar157 = vandps_avx(auVar17,auVar158);
            auVar144 = vpackssdw_avx(auVar157._0_16_,auVar157._16_16_);
            auVar325 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar17 = vcmpps_avx(auVar16,auVar325,2);
            auVar405._8_4_ = 0xff800000;
            auVar405._0_8_ = 0xff800000ff800000;
            auVar405._12_4_ = 0xff800000;
            auVar405._16_4_ = 0xff800000;
            auVar405._20_4_ = 0xff800000;
            auVar405._24_4_ = 0xff800000;
            auVar405._28_4_ = 0xff800000;
            auVar406._8_4_ = 0x7f800000;
            auVar406._0_8_ = 0x7f8000007f800000;
            auVar406._12_4_ = 0x7f800000;
            auVar406._16_4_ = 0x7f800000;
            auVar406._20_4_ = 0x7f800000;
            auVar406._24_4_ = 0x7f800000;
            auVar406._28_4_ = 0x7f800000;
            auVar16 = vblendvps_avx(auVar406,auVar405,auVar17);
            auVar107 = vpmovsxwd_avx(auVar144);
            auVar144 = vpunpckhwd_avx(auVar144,auVar144);
            auVar328._16_16_ = auVar144;
            auVar328._0_16_ = auVar107;
            auVar228 = vblendvps_avx(auVar228,auVar16,auVar328);
            auVar16 = vblendvps_avx(auVar405,auVar406,auVar17);
            auVar254 = vblendvps_avx(auVar254,auVar16,auVar328);
            auVar16 = vcmpps_avx(auVar325,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar126._0_4_ = auVar16._0_4_ ^ auVar157._0_4_;
            auVar126._4_4_ = auVar16._4_4_ ^ auVar157._4_4_;
            auVar126._8_4_ = auVar16._8_4_ ^ auVar157._8_4_;
            auVar126._12_4_ = auVar16._12_4_ ^ auVar157._12_4_;
            auVar126._16_4_ = auVar16._16_4_ ^ auVar157._16_4_;
            auVar126._20_4_ = auVar16._20_4_ ^ auVar157._20_4_;
            auVar126._24_4_ = auVar16._24_4_ ^ auVar157._24_4_;
            auVar126._28_4_ = auVar16._28_4_ ^ auVar157._28_4_;
            auVar157 = vorps_avx(auVar17,auVar126);
            auVar157 = vandps_avx(auVar158,auVar157);
          }
          auVar202 = local_9e0._0_28_;
          auVar348 = ZEXT3264(local_840);
        }
        local_780._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar196 = (ray->super_RayK<1>).dir.field_0.m128[1];
        auVar361._4_4_ = fVar196;
        auVar361._0_4_ = fVar196;
        auVar361._8_4_ = fVar196;
        auVar361._12_4_ = fVar196;
        auVar361._16_4_ = fVar196;
        auVar361._20_4_ = fVar196;
        auVar361._24_4_ = fVar196;
        auVar361._28_4_ = fVar196;
        auVar362 = ZEXT3264(auVar361);
        fVar210 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar388._4_4_ = fVar210;
        auVar388._0_4_ = fVar210;
        auVar388._8_4_ = fVar210;
        auVar388._12_4_ = fVar210;
        auVar388._16_4_ = fVar210;
        auVar388._20_4_ = fVar210;
        auVar388._24_4_ = fVar210;
        auVar388._28_4_ = fVar210;
        local_460 = local_420;
        local_440 = vminps_avx(local_480,auVar228);
        _local_7a0 = vmaxps_avx(local_420,auVar254);
        _local_4a0 = _local_7a0;
        auVar16 = vcmpps_avx(local_420,local_440,2);
        local_580 = vandps_avx(auVar16,auVar121);
        local_5e0 = local_580;
        auVar16 = vcmpps_avx(_local_7a0,local_480,2);
        local_600 = vandps_avx(auVar16,auVar121);
        auVar121 = vorps_avx(local_600,local_580);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0x7f,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar121 >> 0xbf,0) == '\0') &&
            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar121[0x1f]) {
          auVar259._8_4_ = 0x3f800000;
          auVar259._0_8_ = &DAT_3f8000003f800000;
          auVar259._12_4_ = 0x3f800000;
          auVar259._16_4_ = 0x3f800000;
          auVar259._20_4_ = 0x3f800000;
          auVar259._24_4_ = 0x3f800000;
          auVar259._28_4_ = 0x3f800000;
          auVar17 = _local_7a0;
          goto LAB_01197d72;
        }
        local_6e0 = local_600;
        auVar121 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
        local_5c0._0_4_ = auVar157._0_4_ ^ auVar121._0_4_;
        local_5c0._4_4_ = auVar157._4_4_ ^ auVar121._4_4_;
        local_5c0._8_4_ = auVar157._8_4_ ^ auVar121._8_4_;
        local_5c0._12_4_ = auVar157._12_4_ ^ auVar121._12_4_;
        local_5c0._16_4_ = auVar157._16_4_ ^ auVar121._16_4_;
        local_5c0._20_4_ = auVar157._20_4_ ^ auVar121._20_4_;
        local_5c0._24_4_ = auVar157._24_4_ ^ auVar121._24_4_;
        local_5c0._28_4_ = (uint)auVar157._28_4_ ^ (uint)auVar121._28_4_;
        auVar375 = ZEXT3264(auVar361);
        auVar355 = ZEXT3264(auVar388);
        auVar120._0_4_ =
             (float)local_780._0_4_ * auVar160._0_4_ +
             fVar196 * auVar202._0_4_ + auVar348._0_4_ * fVar210;
        auVar120._4_4_ =
             (float)local_780._0_4_ * auVar160._4_4_ +
             fVar196 * auVar202._4_4_ + auVar348._4_4_ * fVar210;
        auVar120._8_4_ =
             (float)local_780._0_4_ * auVar160._8_4_ +
             fVar196 * auVar202._8_4_ + auVar348._8_4_ * fVar210;
        auVar120._12_4_ =
             (float)local_780._0_4_ * auVar160._12_4_ +
             fVar196 * auVar202._12_4_ + auVar348._12_4_ * fVar210;
        auVar120._16_4_ =
             (float)local_780._0_4_ * auVar160._16_4_ +
             fVar196 * auVar202._16_4_ + auVar348._16_4_ * fVar210;
        auVar120._20_4_ =
             (float)local_780._0_4_ * auVar160._20_4_ +
             fVar196 * auVar202._20_4_ + auVar348._20_4_ * fVar210;
        auVar120._24_4_ =
             (float)local_780._0_4_ * auVar160._24_4_ +
             fVar196 * auVar202._24_4_ + auVar348._24_4_ * fVar210;
        auVar120._28_4_ = auVar157._28_4_ + auVar160._28_4_ + auVar121._28_4_;
        auVar163._8_4_ = 0x7fffffff;
        auVar163._0_8_ = 0x7fffffff7fffffff;
        auVar163._12_4_ = 0x7fffffff;
        auVar163._16_4_ = 0x7fffffff;
        auVar163._20_4_ = 0x7fffffff;
        auVar163._24_4_ = 0x7fffffff;
        auVar163._28_4_ = 0x7fffffff;
        auVar121 = vandps_avx(auVar120,auVar163);
        auVar164._8_4_ = 0x3e99999a;
        auVar164._0_8_ = 0x3e99999a3e99999a;
        auVar164._12_4_ = 0x3e99999a;
        auVar164._16_4_ = 0x3e99999a;
        auVar164._20_4_ = 0x3e99999a;
        auVar164._24_4_ = 0x3e99999a;
        auVar164._28_4_ = 0x3e99999a;
        auVar121 = vcmpps_avx(auVar121,auVar164,1);
        auVar121 = vorps_avx(local_5c0,auVar121);
        auVar165._8_4_ = 3;
        auVar165._0_8_ = 0x300000003;
        auVar165._12_4_ = 3;
        auVar165._16_4_ = 3;
        auVar165._20_4_ = 3;
        auVar165._24_4_ = 3;
        auVar165._28_4_ = 3;
        auVar192._8_4_ = 2;
        auVar192._0_8_ = 0x200000002;
        auVar192._12_4_ = 2;
        auVar192._16_4_ = 2;
        auVar192._20_4_ = 2;
        auVar192._24_4_ = 2;
        auVar192._28_4_ = 2;
        auVar121 = vblendvps_avx(auVar192,auVar165,auVar121);
        local_5a0 = ZEXT432((uint)uVar100);
        local_4b0 = vpshufd_avx(ZEXT416((uint)uVar100),0);
        auVar144 = vpcmpgtd_avx(auVar121._16_16_,local_4b0);
        auVar107 = vpcmpgtd_avx(auVar121._0_16_,local_4b0);
        auVar166._16_16_ = auVar144;
        auVar166._0_16_ = auVar107;
        auVar121 = vblendps_avx(ZEXT1632(auVar107),auVar166,0xf0);
        local_5e0 = vandnps_avx(auVar121,local_580);
        auVar262 = ZEXT3264(local_5e0);
        local_6c0 = auVar121;
        auVar157 = local_580 & ~auVar121;
        auVar282 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_640._0_8_ = uVar100;
        local_780._4_4_ = local_780._0_4_;
        fStack_778 = (float)local_780._0_4_;
        fStack_774 = (float)local_780._0_4_;
        fStack_770 = (float)local_780._0_4_;
        fStack_76c = (float)local_780._0_4_;
        fStack_768 = (float)local_780._0_4_;
        local_9c0 = auVar19;
        if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar157 >> 0x7f,0) != '\0') ||
              (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar157 >> 0xbf,0) != '\0') ||
            (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar157[0x1f] < '\0') {
          local_560._4_4_ = local_420._4_4_ + (float)local_820._4_4_;
          local_560._0_4_ = local_420._0_4_ + (float)local_820._0_4_;
          fStack_558 = local_420._8_4_ + fStack_818;
          fStack_554 = local_420._12_4_ + fStack_814;
          fStack_550 = local_420._16_4_ + fStack_810;
          fStack_54c = local_420._20_4_ + fStack_80c;
          fStack_548 = local_420._24_4_ + fStack_808;
          fStack_544 = local_420._28_4_ + fStack_804;
          local_8c0 = auVar361;
          local_860 = auVar388;
          fStack_764 = (float)local_780._0_4_;
          do {
            auVar218 = auVar282._0_16_;
            auVar167._8_4_ = 0x7f800000;
            auVar167._0_8_ = 0x7f8000007f800000;
            auVar167._12_4_ = 0x7f800000;
            auVar167._16_4_ = 0x7f800000;
            auVar167._20_4_ = 0x7f800000;
            auVar167._24_4_ = 0x7f800000;
            auVar167._28_4_ = 0x7f800000;
            auVar121 = auVar262._0_32_;
            auVar157 = vblendvps_avx(auVar167,local_420,auVar121);
            auVar16 = vshufps_avx(auVar157,auVar157,0xb1);
            auVar16 = vminps_avx(auVar157,auVar16);
            auVar17 = vshufpd_avx(auVar16,auVar16,5);
            auVar16 = vminps_avx(auVar16,auVar17);
            auVar17 = vperm2f128_avx(auVar16,auVar16,1);
            auVar16 = vminps_avx(auVar16,auVar17);
            auVar157 = vcmpps_avx(auVar157,auVar16,0);
            auVar16 = auVar121 & auVar157;
            if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0x7f,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0xbf,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar16[0x1f] < '\0') {
              auVar121 = vandps_avx(auVar157,auVar121);
            }
            uVar98 = vmovmskps_avx(auVar121);
            uVar95 = 0;
            if (uVar98 != 0) {
              for (; (uVar98 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
              }
            }
            uVar100 = (ulong)uVar95;
            *(undefined4 *)(local_5e0 + uVar100 * 4) = 0;
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            _local_880 = (undefined1  [16])aVar5;
            auVar144 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            local_aa0 = local_4e0[uVar100];
            auVar262 = ZEXT464((uint)local_aa0);
            local_ac0 = *(float *)(local_460 + uVar100 * 4);
            auVar312 = ZEXT464((uint)local_ac0);
            if (auVar144._0_4_ < 0.0) {
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              fStack_abc = 0.0;
              fStack_ab8 = 0.0;
              fStack_ab4 = 0.0;
              fVar196 = sqrtf(auVar144._0_4_);
              auVar312 = ZEXT1664(CONCAT412(fStack_ab4,
                                            CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
              auVar262 = ZEXT1664(CONCAT412(fStack_a94,
                                            CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
              auVar218._8_4_ = 0x7fffffff;
              auVar218._0_8_ = 0x7fffffff7fffffff;
              auVar218._12_4_ = 0x7fffffff;
            }
            else {
              auVar144 = vsqrtss_avx(auVar144,auVar144);
              fVar196 = auVar144._0_4_;
            }
            auVar107 = vminps_avx(_local_950,_local_970);
            auVar144 = vmaxps_avx(_local_950,_local_970);
            auVar179 = vminps_avx(_local_960,_local_980);
            auVar141 = vminps_avx(auVar107,auVar179);
            auVar107 = vmaxps_avx(_local_960,_local_980);
            auVar179 = vmaxps_avx(auVar144,auVar107);
            auVar144 = vandps_avx(auVar141,auVar218);
            auVar107 = vandps_avx(auVar179,auVar218);
            auVar144 = vmaxps_avx(auVar144,auVar107);
            auVar107 = vmovshdup_avx(auVar144);
            auVar107 = vmaxss_avx(auVar107,auVar144);
            auVar144 = vshufpd_avx(auVar144,auVar144,1);
            auVar144 = vmaxss_avx(auVar144,auVar107);
            local_8a0._0_4_ = auVar144._0_4_ * 1.9073486e-06;
            local_7e0._0_4_ = fVar196 * 1.9073486e-06;
            _local_760 = vshufps_avx(auVar179,auVar179,0xff);
            lVar99 = 4;
            do {
              local_aa0 = auVar262._0_4_;
              fVar214 = 1.0 - local_aa0;
              fVar196 = fVar214 * fVar214;
              fVar210 = fVar214 * fVar196;
              fVar211 = local_aa0 * local_aa0;
              fVar212 = local_aa0 * fVar211;
              fVar213 = local_aa0 * fVar214;
              local_9e0._0_4_ = fVar213;
              auVar144 = vshufps_avx(ZEXT416((uint)(fVar212 * 0.16666667)),
                                     ZEXT416((uint)(fVar212 * 0.16666667)),0);
              auVar107 = ZEXT416((uint)((fVar212 * 4.0 + fVar210 +
                                        local_aa0 * fVar213 * 12.0 + fVar214 * fVar213 * 6.0) *
                                       0.16666667));
              auVar107 = vshufps_avx(auVar107,auVar107,0);
              auVar179 = ZEXT416((uint)((fVar210 * 4.0 + fVar212 +
                                        fVar214 * fVar213 * 12.0 + local_aa0 * fVar213 * 6.0) *
                                       0.16666667));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar401 = auVar312._0_16_;
              auVar141 = vshufps_avx(auVar401,auVar401,0);
              auVar180._0_4_ = auVar141._0_4_ * (float)local_880._0_4_ + 0.0;
              auVar180._4_4_ = auVar141._4_4_ * (float)local_880._4_4_ + 0.0;
              auVar180._8_4_ = auVar141._8_4_ * fStack_878 + 0.0;
              auVar180._12_4_ = auVar141._12_4_ * fStack_874 + 0.0;
              auVar141 = vshufps_avx(ZEXT416((uint)(fVar210 * 0.16666667)),
                                     ZEXT416((uint)(fVar210 * 0.16666667)),0);
              auVar105._0_4_ =
                   auVar141._0_4_ * (float)local_950._0_4_ +
                   auVar179._0_4_ * (float)local_970._0_4_ +
                   auVar144._0_4_ * (float)local_980._0_4_ + auVar107._0_4_ * (float)local_960._0_4_
              ;
              auVar105._4_4_ =
                   auVar141._4_4_ * (float)local_950._4_4_ +
                   auVar179._4_4_ * (float)local_970._4_4_ +
                   auVar144._4_4_ * (float)local_980._4_4_ + auVar107._4_4_ * (float)local_960._4_4_
              ;
              auVar105._8_4_ =
                   auVar141._8_4_ * fStack_948 +
                   auVar179._8_4_ * fStack_968 +
                   auVar144._8_4_ * fStack_978 + auVar107._8_4_ * fStack_958;
              auVar105._12_4_ =
                   auVar141._12_4_ * fStack_944 +
                   auVar179._12_4_ * fStack_964 +
                   auVar144._12_4_ * fStack_974 + auVar107._12_4_ * fStack_954;
              local_840._0_16_ = auVar105;
              auVar144 = vsubps_avx(auVar180,auVar105);
              _local_a40 = auVar144;
              auVar144 = vdpps_avx(auVar144,auVar144,0x7f);
              local_a60 = auVar144._0_4_;
              auVar386 = auVar262._0_16_;
              fStack_a9c = auVar262._4_4_;
              fStack_a98 = auVar262._8_4_;
              fStack_a94 = auVar262._12_4_;
              local_ac0 = auVar312._0_4_;
              fStack_abc = auVar312._4_4_;
              fStack_ab8 = auVar312._8_4_;
              fStack_ab4 = auVar312._12_4_;
              fStack_a5c = auVar144._4_4_;
              fStack_a58 = auVar144._8_4_;
              fStack_a54 = auVar144._12_4_;
              if (local_a60 < 0.0) {
                local_9a0._0_16_ = ZEXT416((uint)fVar214);
                local_920._0_4_ = fVar211;
                local_9c0._0_4_ = fVar196;
                fVar210 = sqrtf(local_a60);
                auVar401._4_4_ = fStack_abc;
                auVar401._0_4_ = local_ac0;
                auVar401._8_4_ = fStack_ab8;
                auVar401._12_4_ = fStack_ab4;
                auVar386._4_4_ = fStack_a9c;
                auVar386._0_4_ = local_aa0;
                auVar386._8_4_ = fStack_a98;
                auVar386._12_4_ = fStack_a94;
                fVar196 = (float)local_9c0._0_4_;
                fVar211 = (float)local_920._0_4_;
                auVar144 = local_9a0._0_16_;
              }
              else {
                auVar144 = vsqrtss_avx(auVar144,auVar144);
                fVar210 = auVar144._0_4_;
                auVar144 = ZEXT416((uint)fVar214);
              }
              fVar212 = auVar144._0_4_;
              fVar213 = auVar386._0_4_;
              auVar107 = vshufps_avx(ZEXT416((uint)(fVar211 * 0.5)),ZEXT416((uint)(fVar211 * 0.5)),0
                                    );
              auVar179 = ZEXT416((uint)((fVar196 + (float)local_9e0._0_4_ * 4.0) * 0.5));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar141 = ZEXT416((uint)((fVar213 * -fVar213 - (float)local_9e0._0_4_ * 4.0) * 0.5));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar106 = ZEXT416((uint)(fVar212 * -fVar212 * 0.5));
              auVar106 = vshufps_avx(auVar106,auVar106,0);
              auVar343._0_4_ =
                   (float)local_950._0_4_ * auVar106._0_4_ +
                   (float)local_970._0_4_ * auVar141._0_4_ +
                   (float)local_980._0_4_ * auVar107._0_4_ + (float)local_960._0_4_ * auVar179._0_4_
              ;
              auVar343._4_4_ =
                   (float)local_950._4_4_ * auVar106._4_4_ +
                   (float)local_970._4_4_ * auVar141._4_4_ +
                   (float)local_980._4_4_ * auVar107._4_4_ + (float)local_960._4_4_ * auVar179._4_4_
              ;
              auVar343._8_4_ =
                   fStack_948 * auVar106._8_4_ +
                   fStack_968 * auVar141._8_4_ +
                   fStack_978 * auVar107._8_4_ + fStack_958 * auVar179._8_4_;
              auVar343._12_4_ =
                   fStack_944 * auVar106._12_4_ +
                   fStack_964 * auVar141._12_4_ +
                   fStack_974 * auVar107._12_4_ + fStack_954 * auVar179._12_4_;
              auVar179 = vshufps_avx(auVar386,auVar386,0);
              auVar107 = ZEXT416((uint)(fVar212 - (fVar213 + fVar213)));
              auVar141 = vshufps_avx(auVar107,auVar107,0);
              auVar107 = ZEXT416((uint)(fVar213 - (fVar212 + fVar212)));
              auVar106 = vshufps_avx(auVar107,auVar107,0);
              auVar144 = vshufps_avx(auVar144,auVar144,0);
              auVar107 = vdpps_avx(auVar343,auVar343,0x7f);
              auVar142._0_4_ =
                   (float)local_950._0_4_ * auVar144._0_4_ +
                   (float)local_970._0_4_ * auVar106._0_4_ +
                   (float)local_980._0_4_ * auVar179._0_4_ + (float)local_960._0_4_ * auVar141._0_4_
              ;
              auVar142._4_4_ =
                   (float)local_950._4_4_ * auVar144._4_4_ +
                   (float)local_970._4_4_ * auVar106._4_4_ +
                   (float)local_980._4_4_ * auVar179._4_4_ + (float)local_960._4_4_ * auVar141._4_4_
              ;
              auVar142._8_4_ =
                   fStack_948 * auVar144._8_4_ +
                   fStack_968 * auVar106._8_4_ +
                   fStack_978 * auVar179._8_4_ + fStack_958 * auVar141._8_4_;
              auVar142._12_4_ =
                   fStack_944 * auVar144._12_4_ +
                   fStack_964 * auVar106._12_4_ +
                   fStack_974 * auVar179._12_4_ + fStack_954 * auVar141._12_4_;
              auVar144 = vblendps_avx(auVar107,_DAT_01feba10,0xe);
              auVar179 = vrsqrtss_avx(auVar144,auVar144);
              fVar211 = auVar179._0_4_;
              fVar196 = auVar107._0_4_;
              auVar179 = vdpps_avx(auVar343,auVar142,0x7f);
              auVar141 = vshufps_avx(auVar107,auVar107,0);
              auVar143._0_4_ = auVar142._0_4_ * auVar141._0_4_;
              auVar143._4_4_ = auVar142._4_4_ * auVar141._4_4_;
              auVar143._8_4_ = auVar142._8_4_ * auVar141._8_4_;
              auVar143._12_4_ = auVar142._12_4_ * auVar141._12_4_;
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar219._0_4_ = auVar343._0_4_ * auVar179._0_4_;
              auVar219._4_4_ = auVar343._4_4_ * auVar179._4_4_;
              auVar219._8_4_ = auVar343._8_4_ * auVar179._8_4_;
              auVar219._12_4_ = auVar343._12_4_ * auVar179._12_4_;
              auVar106 = vsubps_avx(auVar143,auVar219);
              auVar179 = vrcpss_avx(auVar144,auVar144);
              auVar144 = vmaxss_avx(ZEXT416((uint)local_8a0._0_4_),
                                    ZEXT416((uint)(auVar401._0_4_ * (float)local_7e0._0_4_)));
              auVar179 = ZEXT416((uint)(auVar179._0_4_ * (2.0 - fVar196 * auVar179._0_4_)));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              uVar100 = CONCAT44(auVar343._4_4_,auVar343._0_4_);
              auVar357._0_8_ = uVar100 ^ 0x8000000080000000;
              auVar357._8_4_ = -auVar343._8_4_;
              auVar357._12_4_ = -auVar343._12_4_;
              auVar141 = ZEXT416((uint)(fVar211 * 1.5 + fVar196 * -0.5 * fVar211 * fVar211 * fVar211
                                       ));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar198._0_4_ = auVar141._0_4_ * auVar106._0_4_ * auVar179._0_4_;
              auVar198._4_4_ = auVar141._4_4_ * auVar106._4_4_ * auVar179._4_4_;
              auVar198._8_4_ = auVar141._8_4_ * auVar106._8_4_ * auVar179._8_4_;
              auVar198._12_4_ = auVar141._12_4_ * auVar106._12_4_ * auVar179._12_4_;
              local_940._0_4_ = auVar343._0_4_ * auVar141._0_4_;
              local_940._4_4_ = auVar343._4_4_ * auVar141._4_4_;
              local_940._8_4_ = auVar343._8_4_ * auVar141._8_4_;
              local_940._12_4_ = auVar343._12_4_ * auVar141._12_4_;
              local_9e0._0_16_ = auVar343;
              local_9a0._0_4_ = auVar144._0_4_;
              if (fVar196 < 0.0) {
                local_920._0_4_ = fVar210;
                local_9c0._0_16_ = auVar357;
                local_800._0_16_ = auVar198;
                fVar211 = sqrtf(fVar196);
                auVar198 = local_800._0_16_;
                auVar357 = local_9c0._0_16_;
                fVar196 = (float)local_9a0._0_4_;
              }
              else {
                auVar107 = vsqrtss_avx(auVar107,auVar107);
                fVar211 = auVar107._0_4_;
                local_920._0_4_ = fVar210;
                fVar196 = auVar144._0_4_;
              }
              auVar321._4_4_ = fStack_a5c;
              auVar321._0_4_ = local_a60;
              auVar321._8_4_ = fStack_a58;
              auVar321._12_4_ = fStack_a54;
              auVar144 = vdpps_avx(_local_a40,local_940._0_16_,0x7f);
              local_9c0._0_4_ =
                   ((float)local_8a0._0_4_ / fVar211) * ((float)local_920._0_4_ + 1.0) +
                   fVar196 + (float)local_920._0_4_ * (float)local_8a0._0_4_;
              auVar107 = vdpps_avx(auVar357,local_940._0_16_,0x7f);
              auVar179 = vdpps_avx(_local_a40,auVar198,0x7f);
              auVar141 = vdpps_avx(_local_880,local_940._0_16_,0x7f);
              auVar106 = vdpps_avx(_local_a40,auVar357,0x7f);
              fVar210 = auVar107._0_4_ + auVar179._0_4_;
              fVar211 = auVar144._0_4_;
              auVar108._0_4_ = fVar211 * fVar211;
              auVar108._4_4_ = auVar144._4_4_ * auVar144._4_4_;
              auVar108._8_4_ = auVar144._8_4_ * auVar144._8_4_;
              auVar108._12_4_ = auVar144._12_4_ * auVar144._12_4_;
              auVar179 = vsubps_avx(auVar321,auVar108);
              local_940._0_16_ = ZEXT416((uint)fVar210);
              auVar107 = vdpps_avx(_local_a40,_local_880,0x7f);
              fVar212 = auVar106._0_4_ - fVar211 * fVar210;
              local_920._0_16_ = auVar144;
              fVar211 = auVar107._0_4_ - fVar211 * auVar141._0_4_;
              auVar144 = vrsqrtss_avx(auVar179,auVar179);
              fVar213 = auVar179._0_4_;
              fVar210 = auVar144._0_4_;
              fVar210 = fVar210 * 1.5 + fVar213 * -0.5 * fVar210 * fVar210 * fVar210;
              if (fVar213 < 0.0) {
                local_800._0_16_ = auVar141;
                local_700._0_4_ = fVar212;
                local_720._0_4_ = fVar211;
                local_740._0_4_ = fVar210;
                fVar213 = sqrtf(fVar213);
                auVar321._4_4_ = fStack_a5c;
                auVar321._0_4_ = local_a60;
                auVar321._8_4_ = fStack_a58;
                auVar321._12_4_ = fStack_a54;
                fVar210 = (float)local_740._0_4_;
                fVar212 = (float)local_700._0_4_;
                fVar211 = (float)local_720._0_4_;
                auVar141 = local_800._0_16_;
                fVar196 = (float)local_9a0._0_4_;
              }
              else {
                auVar144 = vsqrtss_avx(auVar179,auVar179);
                fVar213 = auVar144._0_4_;
              }
              auVar375 = ZEXT3264(local_8c0);
              auVar355 = ZEXT3264(local_860);
              auVar348 = ZEXT1664(local_9e0._0_16_);
              auVar107 = vpermilps_avx(local_840._0_16_,0xff);
              auVar106 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
              fVar212 = fVar212 * fVar210 - auVar106._0_4_;
              auVar220._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
              auVar220._8_4_ = auVar141._8_4_ ^ 0x80000000;
              auVar220._12_4_ = auVar141._12_4_ ^ 0x80000000;
              auVar246._0_4_ = -fVar212;
              auVar246._4_4_ = 0x80000000;
              auVar246._8_4_ = 0x80000000;
              auVar246._12_4_ = 0x80000000;
              auVar362 = ZEXT1664(local_940._0_16_);
              auVar144 = vinsertps_avx(ZEXT416((uint)(fVar211 * fVar210)),auVar220,0x10);
              auVar179 = vmovsldup_avx(ZEXT416((uint)(local_940._0_4_ * fVar211 * fVar210 -
                                                     auVar141._0_4_ * fVar212)));
              auVar144 = vdivps_avx(auVar144,auVar179);
              auVar141 = ZEXT416((uint)(fVar213 - auVar107._0_4_));
              auVar107 = vinsertps_avx(local_920._0_16_,auVar141,0x10);
              auVar199._0_4_ = auVar107._0_4_ * auVar144._0_4_;
              auVar199._4_4_ = auVar107._4_4_ * auVar144._4_4_;
              auVar199._8_4_ = auVar107._8_4_ * auVar144._8_4_;
              auVar199._12_4_ = auVar107._12_4_ * auVar144._12_4_;
              auVar144 = vinsertps_avx(auVar246,local_940._0_16_,0x1c);
              auVar144 = vdivps_avx(auVar144,auVar179);
              auVar181._0_4_ = auVar107._0_4_ * auVar144._0_4_;
              auVar181._4_4_ = auVar107._4_4_ * auVar144._4_4_;
              auVar181._8_4_ = auVar107._8_4_ * auVar144._8_4_;
              auVar181._12_4_ = auVar107._12_4_ * auVar144._12_4_;
              auVar144 = vhaddps_avx(auVar199,auVar199);
              auVar107 = vhaddps_avx(auVar181,auVar181);
              local_aa0 = local_aa0 - auVar144._0_4_;
              auVar262 = ZEXT464((uint)local_aa0);
              local_ac0 = local_ac0 - auVar107._0_4_;
              auVar312 = ZEXT464((uint)local_ac0);
              auVar221._8_4_ = 0x7fffffff;
              auVar221._0_8_ = 0x7fffffff7fffffff;
              auVar221._12_4_ = 0x7fffffff;
              auVar282 = ZEXT1664(auVar221);
              auVar144 = vandps_avx(local_920._0_16_,auVar221);
              if ((float)local_9c0._0_4_ <= auVar144._0_4_) {
LAB_011987ca:
                bVar81 = false;
              }
              else {
                auVar144 = vandps_avx(auVar141,auVar221);
                if ((float)local_760._0_4_ * 1.9073486e-06 + fVar196 + (float)local_9c0._0_4_ <=
                    auVar144._0_4_) goto LAB_011987ca;
                local_ac0 = local_ac0 + (float)local_7c0._0_4_;
                auVar312 = ZEXT464((uint)local_ac0);
                bVar81 = true;
                if ((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ac0) &&
                    (fVar196 = (ray->super_RayK<1>).tfar, local_ac0 <= fVar196)) &&
                   ((0.0 <= local_aa0 && (local_aa0 <= 1.0)))) {
                  auVar144 = vrsqrtss_avx(auVar321,auVar321);
                  fVar210 = auVar144._0_4_;
                  pGVar13 = (context->scene->geometries).items[local_ac8].ptr;
                  if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar144 = ZEXT416((uint)(fVar210 * 1.5 +
                                             auVar321._0_4_ * -0.5 * fVar210 * fVar210 * fVar210));
                    auVar144 = vshufps_avx(auVar144,auVar144,0);
                    auVar145._0_4_ = auVar144._0_4_ * (float)local_a40._0_4_;
                    auVar145._4_4_ = auVar144._4_4_ * (float)local_a40._4_4_;
                    auVar145._8_4_ = auVar144._8_4_ * fStack_a38;
                    auVar145._12_4_ = auVar144._12_4_ * fStack_a34;
                    auVar109._0_4_ = local_9e0._0_4_ + auVar106._0_4_ * auVar145._0_4_;
                    auVar109._4_4_ = local_9e0._4_4_ + auVar106._4_4_ * auVar145._4_4_;
                    auVar109._8_4_ = local_9e0._8_4_ + auVar106._8_4_ * auVar145._8_4_;
                    auVar109._12_4_ = local_9e0._12_4_ + auVar106._12_4_ * auVar145._12_4_;
                    auVar144 = vshufps_avx(auVar145,auVar145,0xc9);
                    auVar107 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                    auVar146._0_4_ = auVar107._0_4_ * auVar145._0_4_;
                    auVar146._4_4_ = auVar107._4_4_ * auVar145._4_4_;
                    auVar146._8_4_ = auVar107._8_4_ * auVar145._8_4_;
                    auVar146._12_4_ = auVar107._12_4_ * auVar145._12_4_;
                    auVar182._0_4_ = local_9e0._0_4_ * auVar144._0_4_;
                    auVar182._4_4_ = local_9e0._4_4_ * auVar144._4_4_;
                    auVar182._8_4_ = local_9e0._8_4_ * auVar144._8_4_;
                    auVar182._12_4_ = local_9e0._12_4_ * auVar144._12_4_;
                    auVar179 = vsubps_avx(auVar182,auVar146);
                    auVar144 = vshufps_avx(auVar179,auVar179,0xc9);
                    auVar107 = vshufps_avx(auVar109,auVar109,0xc9);
                    auVar183._0_4_ = auVar107._0_4_ * auVar144._0_4_;
                    auVar183._4_4_ = auVar107._4_4_ * auVar144._4_4_;
                    auVar183._8_4_ = auVar107._8_4_ * auVar144._8_4_;
                    auVar183._12_4_ = auVar107._12_4_ * auVar144._12_4_;
                    auVar144 = vshufps_avx(auVar179,auVar179,0xd2);
                    auVar110._0_4_ = auVar109._0_4_ * auVar144._0_4_;
                    auVar110._4_4_ = auVar109._4_4_ * auVar144._4_4_;
                    auVar110._8_4_ = auVar109._8_4_ * auVar144._8_4_;
                    auVar110._12_4_ = auVar109._12_4_ * auVar144._12_4_;
                    auVar144 = vsubps_avx(auVar183,auVar110);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = local_ac0;
                      auVar107 = vshufps_avx(auVar144,auVar144,0xe9);
                      uVar2 = vmovlps_avx(auVar107);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                      (ray->Ng).field_0.field_0.z = auVar144._0_4_;
                      ray->u = local_aa0;
                      ray->v = 0.0;
                      ray->primID = (uint)local_a68;
                      ray->geomID = (uint)local_ac8;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      auVar107 = vshufps_avx(auVar144,auVar144,0xe9);
                      local_8f0 = vmovlps_avx(auVar107);
                      local_8e8 = auVar144._0_4_;
                      local_8e4 = local_aa0;
                      local_8e0 = 0;
                      local_8dc = (uint)local_a68;
                      local_8d8 = (uint)local_ac8;
                      local_8d4 = context->user->instID[0];
                      local_8d0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = local_ac0;
                      local_acc = -1;
                      local_a10.valid = &local_acc;
                      local_a10.geometryUserPtr = pGVar13->userPtr;
                      local_a10.context = context->user;
                      local_a10.ray = (RTCRayN *)ray;
                      local_a10.hit = (RTCHitN *)&local_8f0;
                      local_a10.N = 1;
                      fStack_a9c = 0.0;
                      fStack_a98 = 0.0;
                      fStack_a94 = 0.0;
                      fStack_abc = 0.0;
                      fStack_ab8 = 0.0;
                      fStack_ab4 = 0.0;
                      local_a60 = fVar196;
                      if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01198914:
                        p_Var14 = context->args->filter;
                        if (p_Var14 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar13->field_8).field_0x2 & 0x40) != 0)) {
                            auVar348 = ZEXT1664(auVar348._0_16_);
                            auVar362 = ZEXT1664(auVar362._0_16_);
                            (*p_Var14)(&local_a10);
                            auVar312 = ZEXT1664(CONCAT412(fStack_ab4,
                                                          CONCAT48(fStack_ab8,
                                                                   CONCAT44(fStack_abc,local_ac0))))
                            ;
                            auVar262 = ZEXT1664(CONCAT412(fStack_a94,
                                                          CONCAT48(fStack_a98,
                                                                   CONCAT44(fStack_a9c,local_aa0))))
                            ;
                            auVar355 = ZEXT3264(local_860);
                            auVar375 = ZEXT3264(local_8c0);
                            auVar282 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          if (*local_a10.valid == 0) goto LAB_011989db;
                        }
                        (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).components[0] =
                             *(float *)local_a10.hit;
                        (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_a10.hit + 4);
                        (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_a10.hit + 8);
                        *(float *)((long)local_a10.ray + 0x3c) = *(float *)(local_a10.hit + 0xc);
                        *(float *)((long)local_a10.ray + 0x40) = *(float *)(local_a10.hit + 0x10);
                        *(float *)((long)local_a10.ray + 0x44) = *(float *)(local_a10.hit + 0x14);
                        *(float *)((long)local_a10.ray + 0x48) = *(float *)(local_a10.hit + 0x18);
                        *(float *)((long)local_a10.ray + 0x4c) = *(float *)(local_a10.hit + 0x1c);
                        *(float *)((long)local_a10.ray + 0x50) = *(float *)(local_a10.hit + 0x20);
                      }
                      else {
                        auVar348 = ZEXT1664(local_9e0._0_16_);
                        auVar362 = ZEXT1664(local_940._0_16_);
                        (*pGVar13->intersectionFilterN)(&local_a10);
                        auVar312 = ZEXT1664(CONCAT412(fStack_ab4,
                                                      CONCAT48(fStack_ab8,
                                                               CONCAT44(fStack_abc,local_ac0))));
                        auVar262 = ZEXT1664(CONCAT412(fStack_a94,
                                                      CONCAT48(fStack_a98,
                                                               CONCAT44(fStack_a9c,local_aa0))));
                        auVar355 = ZEXT3264(local_860);
                        auVar375 = ZEXT3264(local_8c0);
                        auVar282 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if (*local_a10.valid != 0) goto LAB_01198914;
LAB_011989db:
                        (ray->super_RayK<1>).tfar = local_a60;
                      }
                    }
                  }
                }
              }
              auVar157 = local_5e0;
              bVar101 = lVar99 != 0;
              lVar99 = lVar99 + -1;
            } while ((!bVar81) && (bVar101));
            fVar196 = (ray->super_RayK<1>).tfar;
            auVar122._4_4_ = fVar196;
            auVar122._0_4_ = fVar196;
            auVar122._8_4_ = fVar196;
            auVar122._12_4_ = fVar196;
            auVar122._16_4_ = fVar196;
            auVar122._20_4_ = fVar196;
            auVar122._24_4_ = fVar196;
            auVar122._28_4_ = fVar196;
            auVar121 = vcmpps_avx(_local_560,auVar122,2);
            local_5e0 = vandps_avx(auVar121,local_5e0);
            auVar262 = ZEXT3264(local_5e0);
            auVar157 = auVar157 & auVar121;
            uVar100 = local_640._0_8_;
          } while ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar157 >> 0x7f,0) != '\0') ||
                     (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar157 >> 0xbf,0) != '\0') ||
                   (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar157[0x1f] < '\0');
        }
        auVar123._0_4_ =
             (float)local_780._0_4_ * (float)local_6a0._0_4_ +
             auVar375._0_4_ * (float)local_680._0_4_ + auVar355._0_4_ * (float)local_660._0_4_;
        auVar123._4_4_ =
             (float)local_780._4_4_ * (float)local_6a0._4_4_ +
             auVar375._4_4_ * (float)local_680._4_4_ + auVar355._4_4_ * (float)local_660._4_4_;
        auVar123._8_4_ =
             fStack_778 * fStack_698 + auVar375._8_4_ * fStack_678 + auVar355._8_4_ * fStack_658;
        auVar123._12_4_ =
             fStack_774 * fStack_694 + auVar375._12_4_ * fStack_674 + auVar355._12_4_ * fStack_654;
        auVar123._16_4_ =
             fStack_770 * fStack_690 + auVar375._16_4_ * fStack_670 + auVar355._16_4_ * fStack_650;
        auVar123._20_4_ =
             fStack_76c * fStack_68c + auVar375._20_4_ * fStack_66c + auVar355._20_4_ * fStack_64c;
        auVar123._24_4_ =
             fStack_768 * fStack_688 + auVar375._24_4_ * fStack_668 + auVar355._24_4_ * fStack_648;
        auVar123._28_4_ = auVar121._28_4_ + auVar121._28_4_ + auVar262._28_4_;
        auVar168._8_4_ = 0x7fffffff;
        auVar168._0_8_ = 0x7fffffff7fffffff;
        auVar168._12_4_ = 0x7fffffff;
        auVar168._16_4_ = 0x7fffffff;
        auVar168._20_4_ = 0x7fffffff;
        auVar168._24_4_ = 0x7fffffff;
        auVar168._28_4_ = 0x7fffffff;
        auVar121 = vandps_avx(auVar123,auVar168);
        auVar169._8_4_ = 0x3e99999a;
        auVar169._0_8_ = 0x3e99999a3e99999a;
        auVar169._12_4_ = 0x3e99999a;
        auVar169._16_4_ = 0x3e99999a;
        auVar169._20_4_ = 0x3e99999a;
        auVar169._24_4_ = 0x3e99999a;
        auVar169._28_4_ = 0x3e99999a;
        auVar121 = vcmpps_avx(auVar121,auVar169,1);
        auVar157 = vorps_avx(auVar121,local_5c0);
        auVar170._0_4_ = local_7a0._0_4_ + (float)local_820._0_4_;
        auVar170._4_4_ = local_7a0._4_4_ + (float)local_820._4_4_;
        auVar170._8_4_ = local_7a0._8_4_ + fStack_818;
        auVar170._12_4_ = local_7a0._12_4_ + fStack_814;
        auVar170._16_4_ = local_7a0._16_4_ + fStack_810;
        auVar170._20_4_ = local_7a0._20_4_ + fStack_80c;
        auVar170._24_4_ = local_7a0._24_4_ + fStack_808;
        auVar170._28_4_ = local_7a0._28_4_ + fStack_804;
        fVar196 = (ray->super_RayK<1>).tfar;
        auVar193._4_4_ = fVar196;
        auVar193._0_4_ = fVar196;
        auVar193._8_4_ = fVar196;
        auVar193._12_4_ = fVar196;
        auVar193._16_4_ = fVar196;
        auVar193._20_4_ = fVar196;
        auVar193._24_4_ = fVar196;
        auVar193._28_4_ = fVar196;
        auVar121 = vcmpps_avx(auVar170,auVar193,2);
        _local_780 = vandps_avx(auVar121,local_6e0);
        auVar171._8_4_ = 3;
        auVar171._0_8_ = 0x300000003;
        auVar171._12_4_ = 3;
        auVar171._16_4_ = 3;
        auVar171._20_4_ = 3;
        auVar171._24_4_ = 3;
        auVar171._28_4_ = 3;
        auVar194._8_4_ = 2;
        auVar194._0_8_ = 0x200000002;
        auVar194._12_4_ = 2;
        auVar194._16_4_ = 2;
        auVar194._20_4_ = 2;
        auVar194._24_4_ = 2;
        auVar194._28_4_ = 2;
        auVar121 = vblendvps_avx(auVar194,auVar171,auVar157);
        auVar144 = vpcmpgtd_avx(auVar121._16_16_,local_4b0);
        auVar107 = vpshufd_avx(local_5a0._0_16_,0);
        auVar107 = vpcmpgtd_avx(auVar121._0_16_,auVar107);
        auVar172._16_16_ = auVar144;
        auVar172._0_16_ = auVar107;
        _local_7a0 = vblendps_avx(ZEXT1632(auVar107),auVar172,0xf0);
        local_600 = vandnps_avx(_local_7a0,_local_780);
        auVar121 = _local_780 & ~_local_7a0;
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          local_740 = _local_4a0;
          local_760._4_4_ = (float)local_4a0._4_4_ + (float)local_820._4_4_;
          local_760._0_4_ = (float)local_4a0._0_4_ + (float)local_820._0_4_;
          fStack_758 = fStack_498 + fStack_818;
          fStack_754 = fStack_494 + fStack_814;
          fStack_750 = fStack_490 + fStack_810;
          fStack_74c = fStack_48c + fStack_80c;
          fStack_748 = fStack_488 + fStack_808;
          fStack_744 = fStack_484 + fStack_804;
          do {
            auVar222 = auVar282._0_16_;
            auVar173._8_4_ = 0x7f800000;
            auVar173._0_8_ = 0x7f8000007f800000;
            auVar173._12_4_ = 0x7f800000;
            auVar173._16_4_ = 0x7f800000;
            auVar173._20_4_ = 0x7f800000;
            auVar173._24_4_ = 0x7f800000;
            auVar173._28_4_ = 0x7f800000;
            auVar121 = vblendvps_avx(auVar173,local_740,local_600);
            auVar157 = vshufps_avx(auVar121,auVar121,0xb1);
            auVar157 = vminps_avx(auVar121,auVar157);
            auVar16 = vshufpd_avx(auVar157,auVar157,5);
            auVar157 = vminps_avx(auVar157,auVar16);
            auVar16 = vperm2f128_avx(auVar157,auVar157,1);
            auVar157 = vminps_avx(auVar157,auVar16);
            auVar157 = vcmpps_avx(auVar121,auVar157,0);
            auVar16 = local_600 & auVar157;
            auVar121 = local_600;
            if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0x7f,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0xbf,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar16[0x1f] < '\0') {
              auVar121 = vandps_avx(auVar157,local_600);
            }
            uVar98 = vmovmskps_avx(auVar121);
            uVar95 = 0;
            if (uVar98 != 0) {
              for (; (uVar98 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
              }
            }
            uVar100 = (ulong)uVar95;
            *(undefined4 *)(local_600 + uVar100 * 4) = 0;
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            _local_880 = (undefined1  [16])aVar5;
            auVar144 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            local_aa0 = local_500[uVar100];
            auVar355 = ZEXT464((uint)local_aa0);
            local_ac0 = *(float *)(local_480 + uVar100 * 4);
            auVar362 = ZEXT464((uint)local_ac0);
            if (auVar144._0_4_ < 0.0) {
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              fStack_abc = 0.0;
              fStack_ab8 = 0.0;
              fStack_ab4 = 0.0;
              fVar196 = sqrtf(auVar144._0_4_);
              auVar362 = ZEXT1664(CONCAT412(fStack_ab4,
                                            CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
              auVar355 = ZEXT1664(CONCAT412(fStack_a94,
                                            CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
              auVar222._8_4_ = 0x7fffffff;
              auVar222._0_8_ = 0x7fffffff7fffffff;
              auVar222._12_4_ = 0x7fffffff;
            }
            else {
              auVar144 = vsqrtss_avx(auVar144,auVar144);
              fVar196 = auVar144._0_4_;
            }
            auVar107 = vminps_avx(_local_950,_local_970);
            auVar144 = vmaxps_avx(_local_950,_local_970);
            auVar179 = vminps_avx(_local_960,_local_980);
            auVar141 = vminps_avx(auVar107,auVar179);
            auVar107 = vmaxps_avx(_local_960,_local_980);
            auVar179 = vmaxps_avx(auVar144,auVar107);
            auVar144 = vandps_avx(auVar141,auVar222);
            auVar107 = vandps_avx(auVar179,auVar222);
            auVar144 = vmaxps_avx(auVar144,auVar107);
            auVar107 = vmovshdup_avx(auVar144);
            auVar107 = vmaxss_avx(auVar107,auVar144);
            auVar144 = vshufpd_avx(auVar144,auVar144,1);
            auVar144 = vmaxss_avx(auVar144,auVar107);
            local_8a0._0_4_ = auVar144._0_4_ * 1.9073486e-06;
            local_920._0_4_ = fVar196 * 1.9073486e-06;
            local_720._0_16_ = vshufps_avx(auVar179,auVar179,0xff);
            lVar99 = 4;
            do {
              local_aa0 = auVar355._0_4_;
              fVar214 = 1.0 - local_aa0;
              fVar196 = fVar214 * fVar214;
              fVar210 = fVar214 * fVar196;
              fVar211 = local_aa0 * local_aa0;
              fVar212 = local_aa0 * fVar211;
              fVar213 = local_aa0 * fVar214;
              local_9e0._0_4_ = fVar213;
              auVar144 = vshufps_avx(ZEXT416((uint)(fVar212 * 0.16666667)),
                                     ZEXT416((uint)(fVar212 * 0.16666667)),0);
              auVar107 = ZEXT416((uint)((fVar212 * 4.0 + fVar210 +
                                        local_aa0 * fVar213 * 12.0 + fVar214 * fVar213 * 6.0) *
                                       0.16666667));
              auVar107 = vshufps_avx(auVar107,auVar107,0);
              auVar179 = ZEXT416((uint)((fVar210 * 4.0 + fVar212 +
                                        fVar214 * fVar213 * 12.0 + local_aa0 * fVar213 * 6.0) *
                                       0.16666667));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar358 = auVar362._0_16_;
              auVar141 = vshufps_avx(auVar358,auVar358,0);
              auVar184._0_4_ = auVar141._0_4_ * (float)local_880._0_4_ + 0.0;
              auVar184._4_4_ = auVar141._4_4_ * (float)local_880._4_4_ + 0.0;
              auVar184._8_4_ = auVar141._8_4_ * fStack_878 + 0.0;
              auVar184._12_4_ = auVar141._12_4_ * fStack_874 + 0.0;
              auVar141 = vshufps_avx(ZEXT416((uint)(fVar210 * 0.16666667)),
                                     ZEXT416((uint)(fVar210 * 0.16666667)),0);
              auVar111._0_4_ =
                   auVar141._0_4_ * (float)local_950._0_4_ +
                   auVar179._0_4_ * (float)local_970._0_4_ +
                   auVar144._0_4_ * (float)local_980._0_4_ + auVar107._0_4_ * (float)local_960._0_4_
              ;
              auVar111._4_4_ =
                   auVar141._4_4_ * (float)local_950._4_4_ +
                   auVar179._4_4_ * (float)local_970._4_4_ +
                   auVar144._4_4_ * (float)local_980._4_4_ + auVar107._4_4_ * (float)local_960._4_4_
              ;
              auVar111._8_4_ =
                   auVar141._8_4_ * fStack_948 +
                   auVar179._8_4_ * fStack_968 +
                   auVar144._8_4_ * fStack_978 + auVar107._8_4_ * fStack_958;
              auVar111._12_4_ =
                   auVar141._12_4_ * fStack_944 +
                   auVar179._12_4_ * fStack_964 +
                   auVar144._12_4_ * fStack_974 + auVar107._12_4_ * fStack_954;
              local_840._0_16_ = auVar111;
              auVar144 = vsubps_avx(auVar184,auVar111);
              _local_a40 = auVar144;
              auVar144 = vdpps_avx(auVar144,auVar144,0x7f);
              local_a60 = auVar144._0_4_;
              auVar352 = auVar355._0_16_;
              fStack_a9c = auVar355._4_4_;
              fStack_a98 = auVar355._8_4_;
              fStack_a94 = auVar355._12_4_;
              local_ac0 = auVar362._0_4_;
              fStack_abc = auVar362._4_4_;
              fStack_ab8 = auVar362._8_4_;
              fStack_ab4 = auVar362._12_4_;
              fStack_a5c = auVar144._4_4_;
              fStack_a58 = auVar144._8_4_;
              fStack_a54 = auVar144._12_4_;
              if (local_a60 < 0.0) {
                local_9a0._0_16_ = ZEXT416((uint)fVar214);
                local_9c0._0_4_ = fVar211;
                local_940._0_4_ = fVar196;
                fVar210 = sqrtf(local_a60);
                auVar358._4_4_ = fStack_abc;
                auVar358._0_4_ = local_ac0;
                auVar358._8_4_ = fStack_ab8;
                auVar358._12_4_ = fStack_ab4;
                auVar352._4_4_ = fStack_a9c;
                auVar352._0_4_ = local_aa0;
                auVar352._8_4_ = fStack_a98;
                auVar352._12_4_ = fStack_a94;
                fVar196 = (float)local_940._0_4_;
                fVar211 = (float)local_9c0._0_4_;
                auVar144 = local_9a0._0_16_;
              }
              else {
                auVar144 = vsqrtss_avx(auVar144,auVar144);
                fVar210 = auVar144._0_4_;
                auVar144 = ZEXT416((uint)fVar214);
              }
              fVar213 = auVar144._0_4_;
              fVar212 = auVar352._0_4_;
              auVar107 = vshufps_avx(ZEXT416((uint)(fVar211 * 0.5)),ZEXT416((uint)(fVar211 * 0.5)),0
                                    );
              auVar179 = ZEXT416((uint)((fVar196 + (float)local_9e0._0_4_ * 4.0) * 0.5));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar141 = ZEXT416((uint)((fVar212 * -fVar212 - (float)local_9e0._0_4_ * 4.0) * 0.5));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar106 = ZEXT416((uint)(fVar213 * -fVar213 * 0.5));
              auVar106 = vshufps_avx(auVar106,auVar106,0);
              auVar344._0_4_ =
                   (float)local_950._0_4_ * auVar106._0_4_ +
                   (float)local_970._0_4_ * auVar141._0_4_ +
                   (float)local_980._0_4_ * auVar107._0_4_ + (float)local_960._0_4_ * auVar179._0_4_
              ;
              auVar344._4_4_ =
                   (float)local_950._4_4_ * auVar106._4_4_ +
                   (float)local_970._4_4_ * auVar141._4_4_ +
                   (float)local_980._4_4_ * auVar107._4_4_ + (float)local_960._4_4_ * auVar179._4_4_
              ;
              auVar344._8_4_ =
                   fStack_948 * auVar106._8_4_ +
                   fStack_968 * auVar141._8_4_ +
                   fStack_978 * auVar107._8_4_ + fStack_958 * auVar179._8_4_;
              auVar344._12_4_ =
                   fStack_944 * auVar106._12_4_ +
                   fStack_964 * auVar141._12_4_ +
                   fStack_974 * auVar107._12_4_ + fStack_954 * auVar179._12_4_;
              auVar179 = vshufps_avx(auVar352,auVar352,0);
              auVar107 = ZEXT416((uint)(fVar213 - (fVar212 + fVar212)));
              auVar141 = vshufps_avx(auVar107,auVar107,0);
              auVar107 = ZEXT416((uint)(fVar212 - (fVar213 + fVar213)));
              auVar106 = vshufps_avx(auVar107,auVar107,0);
              auVar144 = vshufps_avx(auVar144,auVar144,0);
              auVar107 = vdpps_avx(auVar344,auVar344,0x7f);
              auVar147._0_4_ =
                   (float)local_950._0_4_ * auVar144._0_4_ +
                   (float)local_970._0_4_ * auVar106._0_4_ +
                   (float)local_980._0_4_ * auVar179._0_4_ + (float)local_960._0_4_ * auVar141._0_4_
              ;
              auVar147._4_4_ =
                   (float)local_950._4_4_ * auVar144._4_4_ +
                   (float)local_970._4_4_ * auVar106._4_4_ +
                   (float)local_980._4_4_ * auVar179._4_4_ + (float)local_960._4_4_ * auVar141._4_4_
              ;
              auVar147._8_4_ =
                   fStack_948 * auVar144._8_4_ +
                   fStack_968 * auVar106._8_4_ +
                   fStack_978 * auVar179._8_4_ + fStack_958 * auVar141._8_4_;
              auVar147._12_4_ =
                   fStack_944 * auVar144._12_4_ +
                   fStack_964 * auVar106._12_4_ +
                   fStack_974 * auVar179._12_4_ + fStack_954 * auVar141._12_4_;
              auVar144 = vblendps_avx(auVar107,_DAT_01feba10,0xe);
              auVar179 = vrsqrtss_avx(auVar144,auVar144);
              fVar211 = auVar179._0_4_;
              fVar196 = auVar107._0_4_;
              auVar179 = vdpps_avx(auVar344,auVar147,0x7f);
              auVar141 = vshufps_avx(auVar107,auVar107,0);
              auVar148._0_4_ = auVar147._0_4_ * auVar141._0_4_;
              auVar148._4_4_ = auVar147._4_4_ * auVar141._4_4_;
              auVar148._8_4_ = auVar147._8_4_ * auVar141._8_4_;
              auVar148._12_4_ = auVar147._12_4_ * auVar141._12_4_;
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar223._0_4_ = auVar344._0_4_ * auVar179._0_4_;
              auVar223._4_4_ = auVar344._4_4_ * auVar179._4_4_;
              auVar223._8_4_ = auVar344._8_4_ * auVar179._8_4_;
              auVar223._12_4_ = auVar344._12_4_ * auVar179._12_4_;
              auVar106 = vsubps_avx(auVar148,auVar223);
              auVar179 = vrcpss_avx(auVar144,auVar144);
              auVar144 = vmaxss_avx(ZEXT416((uint)local_8a0._0_4_),
                                    ZEXT416((uint)(auVar358._0_4_ * (float)local_920._0_4_)));
              auVar375 = ZEXT1664(auVar144);
              auVar179 = ZEXT416((uint)(auVar179._0_4_ * (2.0 - fVar196 * auVar179._0_4_)));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              uVar100 = CONCAT44(auVar344._4_4_,auVar344._0_4_);
              auVar247._0_8_ = uVar100 ^ 0x8000000080000000;
              auVar247._8_4_ = -auVar344._8_4_;
              auVar247._12_4_ = -auVar344._12_4_;
              auVar141 = ZEXT416((uint)(fVar211 * 1.5 + fVar196 * -0.5 * fVar211 * fVar211 * fVar211
                                       ));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar200._0_4_ = auVar141._0_4_ * auVar106._0_4_ * auVar179._0_4_;
              auVar200._4_4_ = auVar141._4_4_ * auVar106._4_4_ * auVar179._4_4_;
              auVar200._8_4_ = auVar141._8_4_ * auVar106._8_4_ * auVar179._8_4_;
              auVar200._12_4_ = auVar141._12_4_ * auVar106._12_4_ * auVar179._12_4_;
              auVar273._0_4_ = auVar344._0_4_ * auVar141._0_4_;
              auVar273._4_4_ = auVar344._4_4_ * auVar141._4_4_;
              auVar273._8_4_ = auVar344._8_4_ * auVar141._8_4_;
              auVar273._12_4_ = auVar344._12_4_ * auVar141._12_4_;
              local_9e0._0_16_ = auVar344;
              local_9a0._0_4_ = auVar144._0_4_;
              if (fVar196 < 0.0) {
                local_9c0._0_4_ = fVar210;
                local_940._0_16_ = auVar247;
                local_7e0._0_16_ = auVar273;
                local_8c0._0_16_ = auVar200;
                fVar196 = sqrtf(fVar196);
                auVar375 = ZEXT464((uint)local_9a0._0_4_);
                auVar200 = local_8c0._0_16_;
                auVar247 = local_940._0_16_;
                auVar273 = local_7e0._0_16_;
                fVar210 = (float)local_9c0._0_4_;
              }
              else {
                auVar144 = vsqrtss_avx(auVar107,auVar107);
                fVar196 = auVar144._0_4_;
              }
              auVar322._4_4_ = fStack_a5c;
              auVar322._0_4_ = local_a60;
              auVar322._8_4_ = fStack_a58;
              auVar322._12_4_ = fStack_a54;
              auVar144 = vdpps_avx(_local_a40,auVar273,0x7f);
              fVar196 = ((float)local_8a0._0_4_ / fVar196) * (fVar210 + 1.0) +
                        auVar375._0_4_ + fVar210 * (float)local_8a0._0_4_;
              auVar107 = vdpps_avx(auVar247,auVar273,0x7f);
              auVar179 = vdpps_avx(_local_a40,auVar200,0x7f);
              auVar141 = vdpps_avx(_local_880,auVar273,0x7f);
              auVar106 = vdpps_avx(_local_a40,auVar247,0x7f);
              fVar210 = auVar107._0_4_ + auVar179._0_4_;
              fVar211 = auVar144._0_4_;
              auVar112._0_4_ = fVar211 * fVar211;
              auVar112._4_4_ = auVar144._4_4_ * auVar144._4_4_;
              auVar112._8_4_ = auVar144._8_4_ * auVar144._8_4_;
              auVar112._12_4_ = auVar144._12_4_ * auVar144._12_4_;
              auVar179 = vsubps_avx(auVar322,auVar112);
              auVar107 = vdpps_avx(_local_a40,_local_880,0x7f);
              fVar212 = auVar106._0_4_ - fVar211 * fVar210;
              fVar213 = auVar107._0_4_ - fVar211 * auVar141._0_4_;
              auVar107 = vrsqrtss_avx(auVar179,auVar179);
              fVar214 = auVar179._0_4_;
              fVar211 = auVar107._0_4_;
              fVar211 = fVar211 * 1.5 + fVar214 * -0.5 * fVar211 * fVar211 * fVar211;
              if (fVar214 < 0.0) {
                local_9c0._0_16_ = auVar144;
                local_940._0_4_ = fVar196;
                local_7e0._0_16_ = ZEXT416((uint)fVar210);
                local_8c0._0_16_ = auVar141;
                local_860._0_4_ = fVar212;
                local_800._0_4_ = fVar213;
                local_700._0_4_ = fVar211;
                fVar214 = sqrtf(fVar214);
                auVar375 = ZEXT464((uint)local_9a0._0_4_);
                auVar322._4_4_ = fStack_a5c;
                auVar322._0_4_ = local_a60;
                auVar322._8_4_ = fStack_a58;
                auVar322._12_4_ = fStack_a54;
                fVar211 = (float)local_700._0_4_;
                fVar212 = (float)local_860._0_4_;
                fVar213 = (float)local_800._0_4_;
                auVar141 = local_8c0._0_16_;
                fVar196 = (float)local_940._0_4_;
                auVar144 = local_9c0._0_16_;
                auVar107 = local_7e0._0_16_;
              }
              else {
                auVar107 = vsqrtss_avx(auVar179,auVar179);
                fVar214 = auVar107._0_4_;
                auVar107 = ZEXT416((uint)fVar210);
              }
              auVar348 = ZEXT1664(local_9e0._0_16_);
              auVar149 = vpermilps_avx(local_840._0_16_,0xff);
              auVar6 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
              fVar210 = fVar212 * fVar211 - auVar6._0_4_;
              auVar224._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
              auVar224._8_4_ = auVar141._8_4_ ^ 0x80000000;
              auVar224._12_4_ = auVar141._12_4_ ^ 0x80000000;
              auVar248._0_4_ = -fVar210;
              auVar248._4_4_ = 0x80000000;
              auVar248._8_4_ = 0x80000000;
              auVar248._12_4_ = 0x80000000;
              auVar179 = vinsertps_avx(ZEXT416((uint)(fVar213 * fVar211)),auVar224,0x10);
              auVar106 = vmovsldup_avx(ZEXT416((uint)(auVar107._0_4_ * fVar213 * fVar211 -
                                                     auVar141._0_4_ * fVar210)));
              auVar179 = vdivps_avx(auVar179,auVar106);
              auVar149 = ZEXT416((uint)(fVar214 - auVar149._0_4_));
              auVar141 = vinsertps_avx(auVar144,auVar149,0x10);
              auVar201._0_4_ = auVar141._0_4_ * auVar179._0_4_;
              auVar201._4_4_ = auVar141._4_4_ * auVar179._4_4_;
              auVar201._8_4_ = auVar141._8_4_ * auVar179._8_4_;
              auVar201._12_4_ = auVar141._12_4_ * auVar179._12_4_;
              auVar107 = vinsertps_avx(auVar248,auVar107,0x1c);
              auVar107 = vdivps_avx(auVar107,auVar106);
              auVar185._0_4_ = auVar141._0_4_ * auVar107._0_4_;
              auVar185._4_4_ = auVar141._4_4_ * auVar107._4_4_;
              auVar185._8_4_ = auVar141._8_4_ * auVar107._8_4_;
              auVar185._12_4_ = auVar141._12_4_ * auVar107._12_4_;
              auVar107 = vhaddps_avx(auVar201,auVar201);
              auVar179 = vhaddps_avx(auVar185,auVar185);
              local_aa0 = local_aa0 - auVar107._0_4_;
              auVar355 = ZEXT464((uint)local_aa0);
              local_ac0 = local_ac0 - auVar179._0_4_;
              auVar362 = ZEXT464((uint)local_ac0);
              auVar225._8_4_ = 0x7fffffff;
              auVar225._0_8_ = 0x7fffffff7fffffff;
              auVar225._12_4_ = 0x7fffffff;
              auVar282 = ZEXT1664(auVar225);
              auVar144 = vandps_avx(auVar144,auVar225);
              if (fVar196 <= auVar144._0_4_) {
LAB_01199345:
                bVar81 = false;
              }
              else {
                auVar144 = vandps_avx(auVar149,auVar225);
                if ((float)local_720._0_4_ * 1.9073486e-06 + auVar375._0_4_ + fVar196 <=
                    auVar144._0_4_) goto LAB_01199345;
                local_ac0 = local_ac0 + (float)local_7c0._0_4_;
                auVar362 = ZEXT464((uint)local_ac0);
                bVar81 = true;
                if (((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ac0) &&
                     (fVar196 = (ray->super_RayK<1>).tfar, local_ac0 <= fVar196)) &&
                    (0.0 <= local_aa0)) && (local_aa0 <= 1.0)) {
                  auVar144 = vrsqrtss_avx(auVar322,auVar322);
                  fVar210 = auVar144._0_4_;
                  pGVar13 = (context->scene->geometries).items[local_ac8].ptr;
                  if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar144 = ZEXT416((uint)(fVar210 * 1.5 +
                                             auVar322._0_4_ * -0.5 * fVar210 * fVar210 * fVar210));
                    auVar144 = vshufps_avx(auVar144,auVar144,0);
                    auVar150._0_4_ = auVar144._0_4_ * (float)local_a40._0_4_;
                    auVar150._4_4_ = auVar144._4_4_ * (float)local_a40._4_4_;
                    auVar150._8_4_ = auVar144._8_4_ * fStack_a38;
                    auVar150._12_4_ = auVar144._12_4_ * fStack_a34;
                    auVar113._0_4_ = local_9e0._0_4_ + auVar6._0_4_ * auVar150._0_4_;
                    auVar113._4_4_ = local_9e0._4_4_ + auVar6._4_4_ * auVar150._4_4_;
                    auVar113._8_4_ = local_9e0._8_4_ + auVar6._8_4_ * auVar150._8_4_;
                    auVar113._12_4_ = local_9e0._12_4_ + auVar6._12_4_ * auVar150._12_4_;
                    auVar144 = vshufps_avx(auVar150,auVar150,0xc9);
                    auVar107 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                    auVar151._0_4_ = auVar107._0_4_ * auVar150._0_4_;
                    auVar151._4_4_ = auVar107._4_4_ * auVar150._4_4_;
                    auVar151._8_4_ = auVar107._8_4_ * auVar150._8_4_;
                    auVar151._12_4_ = auVar107._12_4_ * auVar150._12_4_;
                    auVar186._0_4_ = local_9e0._0_4_ * auVar144._0_4_;
                    auVar186._4_4_ = local_9e0._4_4_ * auVar144._4_4_;
                    auVar186._8_4_ = local_9e0._8_4_ * auVar144._8_4_;
                    auVar186._12_4_ = local_9e0._12_4_ * auVar144._12_4_;
                    auVar179 = vsubps_avx(auVar186,auVar151);
                    auVar144 = vshufps_avx(auVar179,auVar179,0xc9);
                    auVar107 = vshufps_avx(auVar113,auVar113,0xc9);
                    auVar187._0_4_ = auVar107._0_4_ * auVar144._0_4_;
                    auVar187._4_4_ = auVar107._4_4_ * auVar144._4_4_;
                    auVar187._8_4_ = auVar107._8_4_ * auVar144._8_4_;
                    auVar187._12_4_ = auVar107._12_4_ * auVar144._12_4_;
                    auVar144 = vshufps_avx(auVar179,auVar179,0xd2);
                    auVar114._0_4_ = auVar113._0_4_ * auVar144._0_4_;
                    auVar114._4_4_ = auVar113._4_4_ * auVar144._4_4_;
                    auVar114._8_4_ = auVar113._8_4_ * auVar144._8_4_;
                    auVar114._12_4_ = auVar113._12_4_ * auVar144._12_4_;
                    auVar144 = vsubps_avx(auVar187,auVar114);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = local_ac0;
                      auVar107 = vshufps_avx(auVar144,auVar144,0xe9);
                      uVar2 = vmovlps_avx(auVar107);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                      (ray->Ng).field_0.field_0.z = auVar144._0_4_;
                      ray->u = local_aa0;
                      ray->v = 0.0;
                      ray->primID = (uint)local_a68;
                      ray->geomID = (uint)local_ac8;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      auVar107 = vshufps_avx(auVar144,auVar144,0xe9);
                      local_8f0 = vmovlps_avx(auVar107);
                      local_8e8 = auVar144._0_4_;
                      local_8e4 = local_aa0;
                      local_8e0 = 0;
                      local_8dc = (uint)local_a68;
                      local_8d8 = (uint)local_ac8;
                      local_8d4 = context->user->instID[0];
                      local_8d0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = local_ac0;
                      local_acc = -1;
                      local_a10.valid = &local_acc;
                      local_a10.geometryUserPtr = pGVar13->userPtr;
                      local_a10.context = context->user;
                      local_a10.ray = (RTCRayN *)ray;
                      local_a10.hit = (RTCHitN *)&local_8f0;
                      local_a10.N = 1;
                      fStack_a9c = 0.0;
                      fStack_a98 = 0.0;
                      fStack_a94 = 0.0;
                      fStack_abc = 0.0;
                      fStack_ab8 = 0.0;
                      fStack_ab4 = 0.0;
                      local_a60 = fVar196;
                      if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0119947d:
                        p_Var14 = context->args->filter;
                        if (p_Var14 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar13->field_8).field_0x2 & 0x40) != 0)) {
                            auVar348 = ZEXT1664(auVar348._0_16_);
                            auVar375 = ZEXT1664(auVar375._0_16_);
                            (*p_Var14)(&local_a10);
                            auVar362 = ZEXT1664(CONCAT412(fStack_ab4,
                                                          CONCAT48(fStack_ab8,
                                                                   CONCAT44(fStack_abc,local_ac0))))
                            ;
                            auVar355 = ZEXT1664(CONCAT412(fStack_a94,
                                                          CONCAT48(fStack_a98,
                                                                   CONCAT44(fStack_a9c,local_aa0))))
                            ;
                            auVar282 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          if (*local_a10.valid == 0) goto LAB_01199532;
                        }
                        (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).components[0] =
                             *(float *)local_a10.hit;
                        (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_a10.hit + 4);
                        (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_a10.hit + 8);
                        *(float *)((long)local_a10.ray + 0x3c) = *(float *)(local_a10.hit + 0xc);
                        *(float *)((long)local_a10.ray + 0x40) = *(float *)(local_a10.hit + 0x10);
                        *(float *)((long)local_a10.ray + 0x44) = *(float *)(local_a10.hit + 0x14);
                        *(float *)((long)local_a10.ray + 0x48) = *(float *)(local_a10.hit + 0x18);
                        *(float *)((long)local_a10.ray + 0x4c) = *(float *)(local_a10.hit + 0x1c);
                        *(float *)((long)local_a10.ray + 0x50) = *(float *)(local_a10.hit + 0x20);
                      }
                      else {
                        auVar348 = ZEXT1664(local_9e0._0_16_);
                        auVar375 = ZEXT1664(auVar375._0_16_);
                        (*pGVar13->intersectionFilterN)(&local_a10);
                        auVar362 = ZEXT1664(CONCAT412(fStack_ab4,
                                                      CONCAT48(fStack_ab8,
                                                               CONCAT44(fStack_abc,local_ac0))));
                        auVar355 = ZEXT1664(CONCAT412(fStack_a94,
                                                      CONCAT48(fStack_a98,
                                                               CONCAT44(fStack_a9c,local_aa0))));
                        auVar282 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if (*local_a10.valid != 0) goto LAB_0119947d;
LAB_01199532:
                        (ray->super_RayK<1>).tfar = local_a60;
                      }
                    }
                  }
                }
              }
              auVar121 = local_600;
              bVar101 = lVar99 != 0;
              lVar99 = lVar99 + -1;
            } while ((!bVar81) && (bVar101));
            fVar196 = (ray->super_RayK<1>).tfar;
            auVar124._4_4_ = fVar196;
            auVar124._0_4_ = fVar196;
            auVar124._8_4_ = fVar196;
            auVar124._12_4_ = fVar196;
            auVar124._16_4_ = fVar196;
            auVar124._20_4_ = fVar196;
            auVar124._24_4_ = fVar196;
            auVar124._28_4_ = fVar196;
            auVar157 = vcmpps_avx(_local_760,auVar124,2);
            local_600 = vandps_avx(auVar157,local_600);
            auVar121 = auVar121 & auVar157;
            uVar100 = local_640._0_8_;
          } while ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar121 >> 0x7f,0) != '\0') ||
                     (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar121 >> 0xbf,0) != '\0') ||
                   (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar121[0x1f] < '\0');
        }
        auVar121 = vandps_avx(local_6c0,local_580);
        auVar157 = vandps_avx(_local_7a0,_local_780);
        auVar282 = ZEXT3264(_local_820);
        auVar195._0_4_ = local_820._0_4_ + local_460._0_4_;
        auVar195._4_4_ = local_820._4_4_ + local_460._4_4_;
        auVar195._8_4_ = local_820._8_4_ + local_460._8_4_;
        auVar195._12_4_ = local_820._12_4_ + local_460._12_4_;
        auVar195._16_4_ = local_820._16_4_ + local_460._16_4_;
        auVar195._20_4_ = local_820._20_4_ + local_460._20_4_;
        auVar195._24_4_ = local_820._24_4_ + local_460._24_4_;
        auVar195._28_4_ = local_820._28_4_ + local_460._28_4_;
        fVar196 = (ray->super_RayK<1>).tfar;
        auVar230._4_4_ = fVar196;
        auVar230._0_4_ = fVar196;
        auVar230._8_4_ = fVar196;
        auVar230._12_4_ = fVar196;
        auVar230._16_4_ = fVar196;
        auVar230._20_4_ = fVar196;
        auVar230._24_4_ = fVar196;
        auVar230._28_4_ = fVar196;
        auVar16 = vcmpps_avx(auVar195,auVar230,2);
        auVar121 = vandps_avx(auVar16,auVar121);
        auVar260._0_4_ = local_820._0_4_ + local_4a0._0_4_;
        auVar260._4_4_ = local_820._4_4_ + local_4a0._4_4_;
        auVar260._8_4_ = local_820._8_4_ + local_4a0._8_4_;
        auVar260._12_4_ = local_820._12_4_ + local_4a0._12_4_;
        auVar260._16_4_ = local_820._16_4_ + local_4a0._16_4_;
        auVar260._20_4_ = local_820._20_4_ + local_4a0._20_4_;
        auVar260._24_4_ = local_820._24_4_ + local_4a0._24_4_;
        auVar260._28_4_ = local_820._28_4_ + local_4a0._28_4_;
        auVar16 = vcmpps_avx(auVar260,auVar230,2);
        auVar157 = vandps_avx(auVar16,auVar157);
        auVar157 = vorps_avx(auVar121,auVar157);
        if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar157 >> 0x7f,0) != '\0') ||
              (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar157 >> 0xbf,0) != '\0') ||
            (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar157[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar96 * 0x60) = auVar157;
          auVar121 = vblendvps_avx(_local_4a0,local_460,auVar121);
          *(undefined1 (*) [32])(auStack_160 + uVar96 * 0x60) = auVar121;
          auVar312 = ZEXT1664(local_900);
          *(long *)(afStack_140 + uVar96 * 0x18) = local_900._0_8_;
          auStack_138[uVar96 * 0x18] = (int)uVar100 + 1;
          uVar96 = (ulong)((int)uVar96 + 1);
          auVar262 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          goto LAB_01197d84;
        }
        auVar259._8_4_ = 0x3f800000;
        auVar259._0_8_ = &DAT_3f8000003f800000;
        auVar259._12_4_ = 0x3f800000;
        auVar259._16_4_ = 0x3f800000;
        auVar259._20_4_ = 0x3f800000;
        auVar259._24_4_ = 0x3f800000;
        auVar259._28_4_ = 0x3f800000;
      }
      auVar262 = ZEXT3264(auVar259);
      auVar312 = ZEXT1664(local_900);
    }
LAB_01197d84:
    fVar196 = (ray->super_RayK<1>).tfar;
    auVar119._4_4_ = fVar196;
    auVar119._0_4_ = fVar196;
    auVar119._8_4_ = fVar196;
    auVar119._12_4_ = fVar196;
    auVar119._16_4_ = fVar196;
    auVar119._20_4_ = fVar196;
    auVar119._24_4_ = fVar196;
    auVar119._28_4_ = fVar196;
    do {
      if ((int)uVar96 == 0) {
        fVar196 = (ray->super_RayK<1>).tfar;
        auVar127._4_4_ = fVar196;
        auVar127._0_4_ = fVar196;
        auVar127._8_4_ = fVar196;
        auVar127._12_4_ = fVar196;
        auVar127._16_4_ = fVar196;
        auVar127._20_4_ = fVar196;
        auVar127._24_4_ = fVar196;
        auVar127._28_4_ = fVar196;
        auVar121 = vcmpps_avx(local_2a0,auVar127,2);
        uVar95 = vmovmskps_avx(auVar121);
        uVar95 = (uint)local_7a8 & uVar95;
        if (uVar95 == 0) {
          return;
        }
        goto LAB_01196c69;
      }
      uVar97 = (ulong)((int)uVar96 - 1);
      lVar99 = uVar97 * 0x60;
      auVar121 = *(undefined1 (*) [32])(auStack_160 + lVar99);
      auVar162._0_4_ = auVar282._0_4_ + auVar121._0_4_;
      auVar162._4_4_ = auVar282._4_4_ + auVar121._4_4_;
      auVar162._8_4_ = auVar282._8_4_ + auVar121._8_4_;
      auVar162._12_4_ = auVar282._12_4_ + auVar121._12_4_;
      auVar162._16_4_ = auVar282._16_4_ + auVar121._16_4_;
      auVar162._20_4_ = auVar282._20_4_ + auVar121._20_4_;
      auVar162._24_4_ = auVar282._24_4_ + auVar121._24_4_;
      auVar162._28_4_ = auVar282._28_4_ + auVar121._28_4_;
      auVar16 = vcmpps_avx(auVar162,auVar119,2);
      auVar157 = vandps_avx(auVar16,*(undefined1 (*) [32])(auStack_180 + lVar99));
      local_460 = auVar157;
      auVar16 = *(undefined1 (*) [32])(auStack_180 + lVar99) & auVar16;
      bVar86 = (auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar87 = (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar85 = (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar84 = SUB321(auVar16 >> 0x7f,0) == '\0';
      bVar83 = (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar82 = SUB321(auVar16 >> 0xbf,0) == '\0';
      bVar101 = (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar81 = -1 < auVar16[0x1f];
      if (((((((!bVar86 || !bVar87) || !bVar85) || !bVar84) || !bVar83) || !bVar82) || !bVar101) ||
          !bVar81) {
        auVar209._8_4_ = 0x7f800000;
        auVar209._0_8_ = 0x7f8000007f800000;
        auVar209._12_4_ = 0x7f800000;
        auVar209._16_4_ = 0x7f800000;
        auVar209._20_4_ = 0x7f800000;
        auVar209._24_4_ = 0x7f800000;
        auVar209._28_4_ = 0x7f800000;
        auVar121 = vblendvps_avx(auVar209,auVar121,auVar157);
        auVar16 = vshufps_avx(auVar121,auVar121,0xb1);
        auVar16 = vminps_avx(auVar121,auVar16);
        auVar17 = vshufpd_avx(auVar16,auVar16,5);
        auVar16 = vminps_avx(auVar16,auVar17);
        auVar17 = vperm2f128_avx(auVar16,auVar16,1);
        auVar16 = vminps_avx(auVar16,auVar17);
        auVar121 = vcmpps_avx(auVar121,auVar16,0);
        auVar16 = auVar157 & auVar121;
        if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0x7f,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0xbf,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar16[0x1f] < '\0') {
          auVar157 = vandps_avx(auVar121,auVar157);
        }
        fVar196 = afStack_140[uVar97 * 0x18 + 1];
        uVar100 = (ulong)auStack_138[uVar97 * 0x18];
        uVar98 = vmovmskps_avx(auVar157);
        uVar95 = 0;
        if (uVar98 != 0) {
          for (; (uVar98 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
          }
        }
        fVar210 = afStack_140[uVar97 * 0x18];
        *(undefined4 *)(local_460 + (ulong)uVar95 * 4) = 0;
        if ((((((((local_460 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_460 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_460 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_460 >> 0x7f,0) != '\0') ||
              (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_460 >> 0xbf,0) != '\0') ||
            (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_460[0x1f] < '\0') {
          uVar97 = uVar96;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar99) = local_460;
        auVar144 = vshufps_avx(ZEXT416((uint)(fVar196 - fVar210)),ZEXT416((uint)(fVar196 - fVar210))
                               ,0);
        local_4a0._4_4_ = fVar210 + auVar144._4_4_ * 0.14285715;
        local_4a0._0_4_ = fVar210 + auVar144._0_4_ * 0.0;
        fStack_498 = fVar210 + auVar144._8_4_ * 0.2857143;
        fStack_494 = fVar210 + auVar144._12_4_ * 0.42857146;
        fStack_490 = fVar210 + auVar144._0_4_ * 0.5714286;
        fStack_48c = fVar210 + auVar144._4_4_ * 0.71428573;
        fStack_488 = fVar210 + auVar144._8_4_ * 0.8571429;
        fStack_484 = fVar210 + auVar144._12_4_;
        auVar312 = ZEXT864(*(ulong *)(local_4a0 + (ulong)uVar95 * 4));
      }
      uVar96 = uVar97;
    } while (((((((bVar86 && bVar87) && bVar85) && bVar84) && bVar83) && bVar82) && bVar101) &&
             bVar81);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }